

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  __int_type_conflict _Var22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [28];
  ulong uVar138;
  RTCIntersectArguments *pRVar139;
  uint uVar140;
  long lVar141;
  ulong uVar142;
  long lVar143;
  ulong uVar144;
  Geometry *pGVar145;
  undefined4 uVar146;
  undefined8 unaff_R13;
  long lVar147;
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar162;
  float fVar165;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar163;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  float fVar172;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar189;
  undefined1 auVar184 [32];
  undefined1 auVar175 [16];
  float fVar190;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [64];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar191;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar207;
  float fVar209;
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar211;
  undefined1 auVar205 [32];
  float fVar208;
  float fVar210;
  float fVar212;
  undefined1 auVar206 [32];
  float fVar213;
  undefined1 auVar214 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar219 [32];
  undefined1 auVar215 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar230;
  float fVar241;
  float fVar243;
  float fVar245;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar247;
  float fVar248;
  float fVar249;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar242;
  float fVar244;
  float fVar246;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar250;
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  float fVar251;
  float fVar262;
  undefined1 auVar252 [16];
  float fVar260;
  float fVar261;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar253 [32];
  float fVar266;
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar276;
  float fVar279;
  float fVar281;
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar270 [32];
  float fVar277;
  float fVar280;
  float fVar282;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  float fVar278;
  float fVar283;
  float fVar285;
  float fVar287;
  undefined1 auVar275 [32];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar294 [32];
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  float fVar304;
  undefined1 auVar297 [32];
  float fVar303;
  float fVar305;
  undefined1 auVar298 [32];
  float fVar306;
  float fVar314;
  undefined1 auVar315 [12];
  float fVar316;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar317;
  float fVar327;
  float fVar328;
  undefined1 auVar318 [16];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [64];
  float fVar329;
  float fVar336;
  float fVar337;
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  float fVar338;
  float fVar348;
  float fVar349;
  float fVar350;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [64];
  float fVar351;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  float fVar359;
  undefined1 auVar355 [32];
  float fVar360;
  float fVar365;
  float fVar366;
  float fVar367;
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar368;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_7c0 [16];
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  undefined8 uStack_738;
  undefined1 auStack_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined1 local_6f0 [8];
  undefined8 uStack_6e8;
  undefined1 (*local_6e0) [16];
  Precalculations *local_6d8;
  RTCFilterFunctionNArguments local_6d0;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 auStack_690 [8];
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  undefined1 auStack_650 [8];
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_610 [16];
  undefined1 local_600 [8];
  undefined8 uStack_5f8;
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  RTCHitN local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [8];
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [8];
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined1 local_80 [32];
  undefined1 auVar178 [24];
  undefined1 auVar293 [32];
  
  PVar18 = prim[1];
  uVar138 = (ulong)(byte)PVar18;
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 4 + 6)));
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 4 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 5 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 5 + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 6 + 6)));
  lVar141 = uVar138 * 0x25;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 6 + 10)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xf + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0xf + 10)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x11 + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x11 + 10)));
  fVar230 = *(float *)(prim + lVar141 + 0x12);
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar197 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar216 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar216 = vinsertps_avx(auVar216,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar197 = vsubps_avx(auVar197,*(undefined1 (*) [16])(prim + lVar141 + 6));
  local_5c0._4_4_ = fVar230 * auVar197._4_4_;
  local_5c0._0_4_ = fVar230 * auVar197._0_4_;
  fStack_5b8 = fVar230 * auVar197._8_4_;
  fStack_5b4 = fVar230 * auVar197._12_4_;
  auVar318._0_4_ = fVar230 * auVar216._0_4_;
  auVar318._4_4_ = fVar230 * auVar216._4_4_;
  auVar318._8_4_ = fVar230 * auVar216._8_4_;
  auVar318._12_4_ = fVar230 * auVar216._12_4_;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x1a + 6)));
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x1a + 10)));
  auVar200._16_16_ = auVar218;
  auVar200._0_16_ = auVar217;
  auVar217 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x1b + 6)));
  auVar201._16_16_ = auVar35;
  auVar201._0_16_ = auVar34;
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x1b + 10)));
  auVar153 = vcvtdq2ps_avx(auVar201);
  auVar179._16_16_ = auVar37;
  auVar179._0_16_ = auVar36;
  auVar26 = vcvtdq2ps_avx(auVar179);
  auVar253._16_16_ = auVar39;
  auVar253._0_16_ = auVar38;
  auVar180._16_16_ = auVar41;
  auVar180._0_16_ = auVar40;
  auVar27 = vcvtdq2ps_avx(auVar180);
  auVar290._16_16_ = auVar43;
  auVar290._0_16_ = auVar42;
  auVar28 = vcvtdq2ps_avx(auVar290);
  auVar330._16_16_ = auVar216;
  auVar330._0_16_ = auVar197;
  auVar339._16_16_ = auVar218;
  auVar339._0_16_ = auVar217;
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x1c + 6)));
  auVar216 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar138 * 0x1c + 10)));
  auVar361._16_16_ = auVar216;
  auVar361._0_16_ = auVar197;
  auVar197 = vshufps_avx(auVar318,auVar318,0x55);
  auVar216 = vshufps_avx(auVar318,auVar318,0xaa);
  fVar230 = auVar216._0_4_;
  fVar162 = auVar216._4_4_;
  fVar241 = auVar216._8_4_;
  fVar329 = auVar216._12_4_;
  fVar247 = auVar197._0_4_;
  fVar248 = auVar197._4_4_;
  fVar249 = auVar197._8_4_;
  fVar251 = auVar197._12_4_;
  auVar29 = vcvtdq2ps_avx(auVar200);
  auVar30 = vcvtdq2ps_avx(auVar253);
  auVar31 = vcvtdq2ps_avx(auVar330);
  auVar32 = vcvtdq2ps_avx(auVar339);
  auVar33 = vcvtdq2ps_avx(auVar361);
  auVar197 = vshufps_avx(auVar318,auVar318,0);
  fVar243 = auVar197._0_4_;
  fVar336 = auVar197._4_4_;
  fVar245 = auVar197._8_4_;
  fVar337 = auVar197._12_4_;
  auVar362._0_4_ = fVar243 * auVar29._0_4_ + fVar247 * auVar153._0_4_ + fVar230 * auVar26._0_4_;
  auVar362._4_4_ = fVar336 * auVar29._4_4_ + fVar248 * auVar153._4_4_ + fVar162 * auVar26._4_4_;
  auVar362._8_4_ = fVar245 * auVar29._8_4_ + fVar249 * auVar153._8_4_ + fVar241 * auVar26._8_4_;
  auVar362._12_4_ = fVar337 * auVar29._12_4_ + fVar251 * auVar153._12_4_ + fVar329 * auVar26._12_4_;
  auVar362._16_4_ = fVar243 * auVar29._16_4_ + fVar247 * auVar153._16_4_ + fVar230 * auVar26._16_4_;
  auVar362._20_4_ = fVar336 * auVar29._20_4_ + fVar248 * auVar153._20_4_ + fVar162 * auVar26._20_4_;
  auVar362._24_4_ = fVar245 * auVar29._24_4_ + fVar249 * auVar153._24_4_ + fVar241 * auVar26._24_4_;
  auVar362._28_4_ = fVar251 + 0.0;
  auVar352._0_4_ = fVar243 * auVar30._0_4_ + fVar230 * auVar28._0_4_ + fVar247 * auVar27._0_4_;
  auVar352._4_4_ = fVar336 * auVar30._4_4_ + fVar162 * auVar28._4_4_ + fVar248 * auVar27._4_4_;
  auVar352._8_4_ = fVar245 * auVar30._8_4_ + fVar241 * auVar28._8_4_ + fVar249 * auVar27._8_4_;
  auVar352._12_4_ = fVar337 * auVar30._12_4_ + fVar329 * auVar28._12_4_ + fVar251 * auVar27._12_4_;
  auVar352._16_4_ = fVar243 * auVar30._16_4_ + fVar230 * auVar28._16_4_ + fVar247 * auVar27._16_4_;
  auVar352._20_4_ = fVar336 * auVar30._20_4_ + fVar162 * auVar28._20_4_ + fVar248 * auVar27._20_4_;
  auVar352._24_4_ = fVar245 * auVar30._24_4_ + fVar241 * auVar28._24_4_ + fVar249 * auVar27._24_4_;
  auVar352._28_4_ = 0;
  auVar270._0_4_ = fVar243 * auVar31._0_4_ + fVar247 * auVar32._0_4_ + auVar33._0_4_ * fVar230;
  auVar270._4_4_ = fVar336 * auVar31._4_4_ + fVar248 * auVar32._4_4_ + auVar33._4_4_ * fVar162;
  auVar270._8_4_ = fVar245 * auVar31._8_4_ + fVar249 * auVar32._8_4_ + auVar33._8_4_ * fVar241;
  auVar270._12_4_ = fVar337 * auVar31._12_4_ + fVar251 * auVar32._12_4_ + auVar33._12_4_ * fVar329;
  auVar270._16_4_ = fVar243 * auVar31._16_4_ + fVar247 * auVar32._16_4_ + auVar33._16_4_ * fVar230;
  auVar270._20_4_ = fVar336 * auVar31._20_4_ + fVar248 * auVar32._20_4_ + auVar33._20_4_ * fVar162;
  auVar270._24_4_ = fVar245 * auVar31._24_4_ + fVar249 * auVar32._24_4_ + auVar33._24_4_ * fVar241;
  auVar270._28_4_ = fVar251 + fVar329 + 0.0;
  auVar197 = vshufps_avx(_local_5c0,_local_5c0,0x55);
  auVar216 = vshufps_avx(_local_5c0,_local_5c0,0xaa);
  fVar247 = auVar216._0_4_;
  fVar248 = auVar216._4_4_;
  fVar249 = auVar216._8_4_;
  fVar251 = auVar216._12_4_;
  fVar230 = auVar197._0_4_;
  fVar241 = auVar197._4_4_;
  fVar243 = auVar197._8_4_;
  fVar245 = auVar197._12_4_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar138 * 7 + 6);
  auVar197 = vpmovsxwd_avx(auVar197);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar138 * 7 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar216);
  auVar217._8_8_ = 0;
  auVar217._0_8_ = *(ulong *)(prim + uVar138 * 0xb + 6);
  auVar217 = vpmovsxwd_avx(auVar217);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar138 * 0xb + 0xe);
  auVar218 = vpmovsxwd_avx(auVar218);
  auVar34 = vshufps_avx(_local_5c0,_local_5c0,0);
  fVar162 = auVar34._0_4_;
  fVar329 = auVar34._4_4_;
  fVar336 = auVar34._8_4_;
  fVar337 = auVar34._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar138 * 9 + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar369._0_4_ = auVar153._0_4_ * fVar230 + fVar247 * auVar26._0_4_ + auVar29._0_4_ * fVar162;
  auVar369._4_4_ = auVar153._4_4_ * fVar241 + fVar248 * auVar26._4_4_ + auVar29._4_4_ * fVar329;
  auVar369._8_4_ = auVar153._8_4_ * fVar243 + fVar249 * auVar26._8_4_ + auVar29._8_4_ * fVar336;
  auVar369._12_4_ = auVar153._12_4_ * fVar245 + fVar251 * auVar26._12_4_ + auVar29._12_4_ * fVar337;
  auVar369._16_4_ = auVar153._16_4_ * fVar230 + fVar247 * auVar26._16_4_ + auVar29._16_4_ * fVar162;
  auVar369._20_4_ = auVar153._20_4_ * fVar241 + fVar248 * auVar26._20_4_ + auVar29._20_4_ * fVar329;
  auVar369._24_4_ = auVar153._24_4_ * fVar243 + fVar249 * auVar26._24_4_ + auVar29._24_4_ * fVar336;
  auVar369._28_4_ = auVar153._28_4_ + auVar26._28_4_ + fVar245;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar138 * 9 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar202._0_4_ = fVar162 * auVar30._0_4_ + fVar230 * auVar27._0_4_ + fVar247 * auVar28._0_4_;
  auVar202._4_4_ = fVar329 * auVar30._4_4_ + fVar241 * auVar27._4_4_ + fVar248 * auVar28._4_4_;
  auVar202._8_4_ = fVar336 * auVar30._8_4_ + fVar243 * auVar27._8_4_ + fVar249 * auVar28._8_4_;
  auVar202._12_4_ = fVar337 * auVar30._12_4_ + fVar245 * auVar27._12_4_ + fVar251 * auVar28._12_4_;
  auVar202._16_4_ = fVar162 * auVar30._16_4_ + fVar230 * auVar27._16_4_ + fVar247 * auVar28._16_4_;
  auVar202._20_4_ = fVar329 * auVar30._20_4_ + fVar241 * auVar27._20_4_ + fVar248 * auVar28._20_4_;
  auVar202._24_4_ = fVar336 * auVar30._24_4_ + fVar243 * auVar27._24_4_ + fVar249 * auVar28._24_4_;
  auVar202._28_4_ = auVar30._28_4_ + auVar26._28_4_ + auVar28._28_4_;
  auVar181._0_4_ = fVar162 * auVar31._0_4_ + auVar32._0_4_ * fVar230 + auVar33._0_4_ * fVar247;
  auVar181._4_4_ = fVar329 * auVar31._4_4_ + auVar32._4_4_ * fVar241 + auVar33._4_4_ * fVar248;
  auVar181._8_4_ = fVar336 * auVar31._8_4_ + auVar32._8_4_ * fVar243 + auVar33._8_4_ * fVar249;
  auVar181._12_4_ = fVar337 * auVar31._12_4_ + auVar32._12_4_ * fVar245 + auVar33._12_4_ * fVar251;
  auVar181._16_4_ = fVar162 * auVar31._16_4_ + auVar32._16_4_ * fVar230 + auVar33._16_4_ * fVar247;
  auVar181._20_4_ = fVar329 * auVar31._20_4_ + auVar32._20_4_ * fVar241 + auVar33._20_4_ * fVar248;
  auVar181._24_4_ = fVar336 * auVar31._24_4_ + auVar32._24_4_ * fVar243 + auVar33._24_4_ * fVar249;
  auVar181._28_4_ = fVar337 + fVar245 + fVar251;
  auVar151._8_4_ = 0x7fffffff;
  auVar151._0_8_ = 0x7fffffff7fffffff;
  auVar151._12_4_ = 0x7fffffff;
  auVar151._16_4_ = 0x7fffffff;
  auVar151._20_4_ = 0x7fffffff;
  auVar151._24_4_ = 0x7fffffff;
  auVar151._28_4_ = 0x7fffffff;
  auVar219._8_4_ = 0x219392ef;
  auVar219._0_8_ = 0x219392ef219392ef;
  auVar219._12_4_ = 0x219392ef;
  auVar219._16_4_ = 0x219392ef;
  auVar219._20_4_ = 0x219392ef;
  auVar219._24_4_ = 0x219392ef;
  auVar219._28_4_ = 0x219392ef;
  auVar153 = vandps_avx(auVar362,auVar151);
  auVar153 = vcmpps_avx(auVar153,auVar219,1);
  auVar26 = vblendvps_avx(auVar362,auVar219,auVar153);
  auVar153 = vandps_avx(auVar352,auVar151);
  auVar153 = vcmpps_avx(auVar153,auVar219,1);
  auVar27 = vblendvps_avx(auVar352,auVar219,auVar153);
  auVar153 = vandps_avx(auVar270,auVar151);
  auVar153 = vcmpps_avx(auVar153,auVar219,1);
  auVar153 = vblendvps_avx(auVar270,auVar219,auVar153);
  auVar28 = vrcpps_avx(auVar26);
  fVar230 = auVar28._0_4_;
  fVar241 = auVar28._4_4_;
  auVar29._4_4_ = auVar26._4_4_ * fVar241;
  auVar29._0_4_ = auVar26._0_4_ * fVar230;
  fVar243 = auVar28._8_4_;
  auVar29._8_4_ = auVar26._8_4_ * fVar243;
  fVar245 = auVar28._12_4_;
  auVar29._12_4_ = auVar26._12_4_ * fVar245;
  fVar247 = auVar28._16_4_;
  auVar29._16_4_ = auVar26._16_4_ * fVar247;
  fVar248 = auVar28._20_4_;
  auVar29._20_4_ = auVar26._20_4_ * fVar248;
  fVar249 = auVar28._24_4_;
  auVar29._24_4_ = auVar26._24_4_ * fVar249;
  auVar29._28_4_ = auVar26._28_4_;
  auVar152._8_4_ = 0x3f800000;
  auVar152._0_8_ = 0x3f8000003f800000;
  auVar152._12_4_ = 0x3f800000;
  auVar152._16_4_ = 0x3f800000;
  auVar152._20_4_ = 0x3f800000;
  auVar152._24_4_ = 0x3f800000;
  auVar152._28_4_ = 0x3f800000;
  auVar30 = vsubps_avx(auVar152,auVar29);
  fVar230 = fVar230 + fVar230 * auVar30._0_4_;
  fVar241 = fVar241 + fVar241 * auVar30._4_4_;
  fVar243 = fVar243 + fVar243 * auVar30._8_4_;
  fVar245 = fVar245 + fVar245 * auVar30._12_4_;
  fVar247 = fVar247 + fVar247 * auVar30._16_4_;
  fVar248 = fVar248 + fVar248 * auVar30._20_4_;
  fVar249 = fVar249 + fVar249 * auVar30._24_4_;
  auVar29 = vrcpps_avx(auVar27);
  fVar251 = auVar29._0_4_;
  fVar260 = auVar29._4_4_;
  auVar26._4_4_ = fVar260 * auVar27._4_4_;
  auVar26._0_4_ = fVar251 * auVar27._0_4_;
  fVar261 = auVar29._8_4_;
  auVar26._8_4_ = fVar261 * auVar27._8_4_;
  fVar262 = auVar29._12_4_;
  auVar26._12_4_ = fVar262 * auVar27._12_4_;
  fVar263 = auVar29._16_4_;
  auVar26._16_4_ = fVar263 * auVar27._16_4_;
  fVar264 = auVar29._20_4_;
  auVar26._20_4_ = fVar264 * auVar27._20_4_;
  fVar265 = auVar29._24_4_;
  auVar26._24_4_ = fVar265 * auVar27._24_4_;
  auVar26._28_4_ = auVar27._28_4_;
  auVar27 = vsubps_avx(auVar152,auVar26);
  fVar251 = fVar251 + fVar251 * auVar27._0_4_;
  fVar260 = fVar260 + fVar260 * auVar27._4_4_;
  fVar261 = fVar261 + fVar261 * auVar27._8_4_;
  fVar262 = fVar262 + fVar262 * auVar27._12_4_;
  fVar263 = fVar263 + fVar263 * auVar27._16_4_;
  fVar264 = fVar264 + fVar264 * auVar27._20_4_;
  fVar265 = fVar265 + fVar265 * auVar27._24_4_;
  auVar26 = vrcpps_avx(auVar153);
  fVar267 = auVar26._0_4_;
  fVar276 = auVar26._4_4_;
  auVar31._4_4_ = fVar276 * auVar153._4_4_;
  auVar31._0_4_ = fVar267 * auVar153._0_4_;
  fVar279 = auVar26._8_4_;
  auVar31._8_4_ = fVar279 * auVar153._8_4_;
  fVar281 = auVar26._12_4_;
  auVar31._12_4_ = fVar281 * auVar153._12_4_;
  fVar284 = auVar26._16_4_;
  auVar31._16_4_ = fVar284 * auVar153._16_4_;
  fVar286 = auVar26._20_4_;
  auVar31._20_4_ = fVar286 * auVar153._20_4_;
  fVar288 = auVar26._24_4_;
  auVar31._24_4_ = fVar288 * auVar153._24_4_;
  auVar31._28_4_ = auVar153._28_4_;
  auVar153 = vsubps_avx(auVar152,auVar31);
  fVar267 = fVar267 + fVar267 * auVar153._0_4_;
  fVar276 = fVar276 + fVar276 * auVar153._4_4_;
  fVar279 = fVar279 + fVar279 * auVar153._8_4_;
  fVar281 = fVar281 + fVar281 * auVar153._12_4_;
  fVar284 = fVar284 + fVar284 * auVar153._16_4_;
  fVar286 = fVar286 + fVar286 * auVar153._20_4_;
  fVar288 = fVar288 + fVar288 * auVar153._24_4_;
  auVar36 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar141 + 0x16)) *
                                        *(float *)(prim + lVar141 + 0x1a))),0);
  auVar291._16_16_ = auVar216;
  auVar291._0_16_ = auVar197;
  auVar153 = vcvtdq2ps_avx(auVar291);
  auVar319._16_16_ = auVar218;
  auVar319._0_16_ = auVar217;
  auVar26 = vcvtdq2ps_avx(auVar319);
  auVar26 = vsubps_avx(auVar26,auVar153);
  fVar162 = auVar36._0_4_;
  fVar329 = auVar36._4_4_;
  fVar336 = auVar36._8_4_;
  fVar337 = auVar36._12_4_;
  auVar292._0_4_ = auVar26._0_4_ * fVar162 + auVar153._0_4_;
  auVar292._4_4_ = auVar26._4_4_ * fVar329 + auVar153._4_4_;
  auVar292._8_4_ = auVar26._8_4_ * fVar336 + auVar153._8_4_;
  auVar292._12_4_ = auVar26._12_4_ * fVar337 + auVar153._12_4_;
  auVar292._16_4_ = auVar26._16_4_ * fVar162 + auVar153._16_4_;
  auVar292._20_4_ = auVar26._20_4_ * fVar329 + auVar153._20_4_;
  auVar292._24_4_ = auVar26._24_4_ * fVar336 + auVar153._24_4_;
  auVar292._28_4_ = auVar26._28_4_ + auVar153._28_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar138 * 0xd + 6);
  auVar197 = vpmovsxwd_avx(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar138 * 0xd + 0xe);
  auVar216 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar138 * 0x12 + 6);
  auVar217 = vpmovsxwd_avx(auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar138 * 0x12 + 0xe);
  auVar218 = vpmovsxwd_avx(auVar39);
  auVar295._16_16_ = auVar35;
  auVar295._0_16_ = auVar34;
  auVar153 = vcvtdq2ps_avx(auVar295);
  auVar307._16_16_ = auVar216;
  auVar307._0_16_ = auVar197;
  auVar26 = vcvtdq2ps_avx(auVar307);
  auVar26 = vsubps_avx(auVar26,auVar153);
  auVar296._0_4_ = auVar153._0_4_ + auVar26._0_4_ * fVar162;
  auVar296._4_4_ = auVar153._4_4_ + auVar26._4_4_ * fVar329;
  auVar296._8_4_ = auVar153._8_4_ + auVar26._8_4_ * fVar336;
  auVar296._12_4_ = auVar153._12_4_ + auVar26._12_4_ * fVar337;
  auVar296._16_4_ = auVar153._16_4_ + auVar26._16_4_ * fVar162;
  auVar296._20_4_ = auVar153._20_4_ + auVar26._20_4_ * fVar329;
  auVar296._24_4_ = auVar153._24_4_ + auVar26._24_4_ * fVar336;
  auVar296._28_4_ = auVar153._28_4_ + auVar26._28_4_;
  auVar308._16_16_ = auVar218;
  auVar308._0_16_ = auVar217;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar138 * 0x16 + 6);
  auVar197 = vpmovsxwd_avx(auVar40);
  auVar153 = vcvtdq2ps_avx(auVar308);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar138 * 0x16 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar41);
  auVar320._16_16_ = auVar216;
  auVar320._0_16_ = auVar197;
  auVar26 = vcvtdq2ps_avx(auVar320);
  auVar26 = vsubps_avx(auVar26,auVar153);
  auVar309._0_4_ = auVar153._0_4_ + auVar26._0_4_ * fVar162;
  auVar309._4_4_ = auVar153._4_4_ + auVar26._4_4_ * fVar329;
  auVar309._8_4_ = auVar153._8_4_ + auVar26._8_4_ * fVar336;
  auVar309._12_4_ = auVar153._12_4_ + auVar26._12_4_ * fVar337;
  auVar309._16_4_ = auVar153._16_4_ + auVar26._16_4_ * fVar162;
  auVar309._20_4_ = auVar153._20_4_ + auVar26._20_4_ * fVar329;
  auVar309._24_4_ = auVar153._24_4_ + auVar26._24_4_ * fVar336;
  auVar309._28_4_ = auVar153._28_4_ + auVar26._28_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar138 * 0x14 + 6);
  auVar197 = vpmovsxwd_avx(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar138 * 0x14 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar43);
  auVar321._16_16_ = auVar216;
  auVar321._0_16_ = auVar197;
  auVar153 = vcvtdq2ps_avx(auVar321);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar138 * 0x18 + 6);
  auVar197 = vpmovsxwd_avx(auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar138 * 0x18 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar9);
  auVar331._16_16_ = auVar216;
  auVar331._0_16_ = auVar197;
  auVar26 = vcvtdq2ps_avx(auVar331);
  auVar26 = vsubps_avx(auVar26,auVar153);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar138 * 0x1d + 6);
  auVar197 = vpmovsxwd_avx(auVar10);
  auVar322._0_4_ = auVar153._0_4_ + auVar26._0_4_ * fVar162;
  auVar322._4_4_ = auVar153._4_4_ + auVar26._4_4_ * fVar329;
  auVar322._8_4_ = auVar153._8_4_ + auVar26._8_4_ * fVar336;
  auVar322._12_4_ = auVar153._12_4_ + auVar26._12_4_ * fVar337;
  auVar322._16_4_ = auVar153._16_4_ + auVar26._16_4_ * fVar162;
  auVar322._20_4_ = auVar153._20_4_ + auVar26._20_4_ * fVar329;
  auVar322._24_4_ = auVar153._24_4_ + auVar26._24_4_ * fVar336;
  auVar322._28_4_ = auVar153._28_4_ + auVar26._28_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar138 * 0x1d + 0xe);
  auVar216 = vpmovsxwd_avx(auVar11);
  auVar332._16_16_ = auVar216;
  auVar332._0_16_ = auVar197;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar138 * 0x21 + 6);
  auVar197 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar138 * 0x21 + 0xe);
  auVar216 = vpmovsxwd_avx(auVar13);
  auVar153 = vcvtdq2ps_avx(auVar332);
  auVar340._16_16_ = auVar216;
  auVar340._0_16_ = auVar197;
  auVar26 = vcvtdq2ps_avx(auVar340);
  auVar26 = vsubps_avx(auVar26,auVar153);
  auVar333._0_4_ = auVar153._0_4_ + auVar26._0_4_ * fVar162;
  auVar333._4_4_ = auVar153._4_4_ + auVar26._4_4_ * fVar329;
  auVar333._8_4_ = auVar153._8_4_ + auVar26._8_4_ * fVar336;
  auVar333._12_4_ = auVar153._12_4_ + auVar26._12_4_ * fVar337;
  auVar333._16_4_ = auVar153._16_4_ + auVar26._16_4_ * fVar162;
  auVar333._20_4_ = auVar153._20_4_ + auVar26._20_4_ * fVar329;
  auVar333._24_4_ = auVar153._24_4_ + auVar26._24_4_ * fVar336;
  auVar333._28_4_ = auVar153._28_4_ + auVar26._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar138 * 0x1f + 6);
  auVar197 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar138 * 0x1f + 0xe);
  auVar216 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar138 * 0x23 + 6);
  auVar217 = vpmovsxwd_avx(auVar16);
  auVar341._16_16_ = auVar216;
  auVar341._0_16_ = auVar197;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar138 * 0x23 + 0xe);
  auVar197 = vpmovsxwd_avx(auVar17);
  auVar353._16_16_ = auVar197;
  auVar353._0_16_ = auVar217;
  auVar153 = vcvtdq2ps_avx(auVar341);
  auVar26 = vcvtdq2ps_avx(auVar353);
  auVar26 = vsubps_avx(auVar26,auVar153);
  auVar342._0_4_ = auVar153._0_4_ + auVar26._0_4_ * fVar162;
  auVar342._4_4_ = auVar153._4_4_ + auVar26._4_4_ * fVar329;
  auVar342._8_4_ = auVar153._8_4_ + auVar26._8_4_ * fVar336;
  auVar342._12_4_ = auVar153._12_4_ + auVar26._12_4_ * fVar337;
  auVar342._16_4_ = auVar153._16_4_ + auVar26._16_4_ * fVar162;
  auVar342._20_4_ = auVar153._20_4_ + auVar26._20_4_ * fVar329;
  auVar342._24_4_ = auVar153._24_4_ + auVar26._24_4_ * fVar336;
  auVar342._28_4_ = auVar153._28_4_ + fVar337;
  auVar153 = vsubps_avx(auVar292,auVar369);
  auVar214._0_4_ = fVar230 * auVar153._0_4_;
  auVar214._4_4_ = fVar241 * auVar153._4_4_;
  auVar214._8_4_ = fVar243 * auVar153._8_4_;
  auVar214._12_4_ = fVar245 * auVar153._12_4_;
  auVar32._16_4_ = fVar247 * auVar153._16_4_;
  auVar32._0_16_ = auVar214;
  auVar32._20_4_ = fVar248 * auVar153._20_4_;
  auVar32._24_4_ = fVar249 * auVar153._24_4_;
  auVar32._28_4_ = auVar153._28_4_;
  auVar153 = vsubps_avx(auVar296,auVar369);
  auVar231._0_4_ = fVar230 * auVar153._0_4_;
  auVar231._4_4_ = fVar241 * auVar153._4_4_;
  auVar231._8_4_ = fVar243 * auVar153._8_4_;
  auVar231._12_4_ = fVar245 * auVar153._12_4_;
  auVar33._16_4_ = fVar247 * auVar153._16_4_;
  auVar33._0_16_ = auVar231;
  auVar33._20_4_ = fVar248 * auVar153._20_4_;
  auVar33._24_4_ = fVar249 * auVar153._24_4_;
  auVar33._28_4_ = auVar28._28_4_ + auVar30._28_4_;
  auVar153 = vsubps_avx(auVar309,auVar202);
  auVar149._0_4_ = fVar251 * auVar153._0_4_;
  auVar149._4_4_ = fVar260 * auVar153._4_4_;
  auVar149._8_4_ = fVar261 * auVar153._8_4_;
  auVar149._12_4_ = fVar262 * auVar153._12_4_;
  auVar28._16_4_ = fVar263 * auVar153._16_4_;
  auVar28._0_16_ = auVar149;
  auVar28._20_4_ = fVar264 * auVar153._20_4_;
  auVar28._24_4_ = fVar265 * auVar153._24_4_;
  auVar28._28_4_ = auVar153._28_4_;
  auVar153 = vsubps_avx(auVar322,auVar202);
  auVar252._0_4_ = fVar251 * auVar153._0_4_;
  auVar252._4_4_ = fVar260 * auVar153._4_4_;
  auVar252._8_4_ = fVar261 * auVar153._8_4_;
  auVar252._12_4_ = fVar262 * auVar153._12_4_;
  auVar30._16_4_ = fVar263 * auVar153._16_4_;
  auVar30._0_16_ = auVar252;
  auVar30._20_4_ = fVar264 * auVar153._20_4_;
  auVar30._24_4_ = fVar265 * auVar153._24_4_;
  auVar30._28_4_ = auVar29._28_4_ + auVar27._28_4_;
  auVar153 = vsubps_avx(auVar333,auVar181);
  auVar192._0_4_ = fVar267 * auVar153._0_4_;
  auVar192._4_4_ = fVar276 * auVar153._4_4_;
  auVar192._8_4_ = fVar279 * auVar153._8_4_;
  auVar192._12_4_ = fVar281 * auVar153._12_4_;
  auVar27._16_4_ = fVar284 * auVar153._16_4_;
  auVar27._0_16_ = auVar192;
  auVar27._20_4_ = fVar286 * auVar153._20_4_;
  auVar27._24_4_ = fVar288 * auVar153._24_4_;
  auVar27._28_4_ = auVar153._28_4_;
  auVar153 = vsubps_avx(auVar342,auVar181);
  auVar173._0_4_ = fVar267 * auVar153._0_4_;
  auVar173._4_4_ = fVar276 * auVar153._4_4_;
  auVar173._8_4_ = fVar279 * auVar153._8_4_;
  auVar173._12_4_ = fVar281 * auVar153._12_4_;
  auVar44._16_4_ = fVar284 * auVar153._16_4_;
  auVar44._0_16_ = auVar173;
  auVar44._20_4_ = fVar286 * auVar153._20_4_;
  auVar44._24_4_ = fVar288 * auVar153._24_4_;
  auVar44._28_4_ = auVar153._28_4_;
  auVar197 = vpminsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar216 = vpminsd_avx(auVar214,auVar231);
  auVar323._16_16_ = auVar197;
  auVar323._0_16_ = auVar216;
  auVar197 = vpminsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar216 = vpminsd_avx(auVar149,auVar252);
  auVar334._16_16_ = auVar197;
  auVar334._0_16_ = auVar216;
  auVar153 = vmaxps_avx(auVar323,auVar334);
  auVar197 = vpminsd_avx(auVar27._16_16_,auVar44._16_16_);
  auVar216 = vpminsd_avx(auVar192,auVar173);
  auVar354._16_16_ = auVar197;
  auVar354._0_16_ = auVar216;
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar363._4_4_ = uVar146;
  auVar363._0_4_ = uVar146;
  auVar363._8_4_ = uVar146;
  auVar363._12_4_ = uVar146;
  auVar363._16_4_ = uVar146;
  auVar363._20_4_ = uVar146;
  auVar363._24_4_ = uVar146;
  auVar363._28_4_ = uVar146;
  auVar26 = vmaxps_avx(auVar354,auVar363);
  auVar153 = vmaxps_avx(auVar153,auVar26);
  local_80._4_4_ = auVar153._4_4_ * 0.99999964;
  local_80._0_4_ = auVar153._0_4_ * 0.99999964;
  local_80._8_4_ = auVar153._8_4_ * 0.99999964;
  local_80._12_4_ = auVar153._12_4_ * 0.99999964;
  local_80._16_4_ = auVar153._16_4_ * 0.99999964;
  local_80._20_4_ = auVar153._20_4_ * 0.99999964;
  local_80._24_4_ = auVar153._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar197 = vpmaxsd_avx(auVar32._16_16_,auVar33._16_16_);
  auVar216 = vpmaxsd_avx(auVar214,auVar231);
  auVar220._16_16_ = auVar197;
  auVar220._0_16_ = auVar216;
  auVar197 = vpmaxsd_avx(auVar28._16_16_,auVar30._16_16_);
  auVar216 = vpmaxsd_avx(auVar149,auVar252);
  auVar153._16_16_ = auVar197;
  auVar153._0_16_ = auVar216;
  auVar153 = vminps_avx(auVar220,auVar153);
  auVar197 = vpmaxsd_avx(auVar27._16_16_,auVar44._16_16_);
  auVar216 = vpmaxsd_avx(auVar192,auVar173);
  uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar203._4_4_ = uVar146;
  auVar203._0_4_ = uVar146;
  auVar203._8_4_ = uVar146;
  auVar203._12_4_ = uVar146;
  auVar203._16_4_ = uVar146;
  auVar203._20_4_ = uVar146;
  auVar203._24_4_ = uVar146;
  auVar203._28_4_ = uVar146;
  auVar182._16_16_ = auVar197;
  auVar182._0_16_ = auVar216;
  auVar26 = vminps_avx(auVar182,auVar203);
  auVar153 = vminps_avx(auVar153,auVar26);
  auVar25._4_4_ = auVar153._4_4_ * 1.0000004;
  auVar25._0_4_ = auVar153._0_4_ * 1.0000004;
  auVar25._8_4_ = auVar153._8_4_ * 1.0000004;
  auVar25._12_4_ = auVar153._12_4_ * 1.0000004;
  auVar25._16_4_ = auVar153._16_4_ * 1.0000004;
  auVar25._20_4_ = auVar153._20_4_ * 1.0000004;
  auVar25._24_4_ = auVar153._24_4_ * 1.0000004;
  auVar25._28_4_ = auVar153._28_4_;
  auVar153 = vcmpps_avx(local_80,auVar25,2);
  auVar197 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar183._16_16_ = auVar197;
  auVar183._0_16_ = auVar197;
  auVar26 = vcvtdq2ps_avx(auVar183);
  auVar26 = vcmpps_avx(_DAT_01f7b060,auVar26,1);
  auVar153 = vandps_avx(auVar153,auVar26);
  uVar146 = vmovmskps_avx(auVar153);
  local_530 = pre->ray_space + k;
  local_520 = mm_lookupmask_ps._16_8_;
  uStack_518 = mm_lookupmask_ps._24_8_;
  uStack_510 = mm_lookupmask_ps._16_8_;
  uStack_508 = mm_lookupmask_ps._24_8_;
  local_6e0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_6d8 = pre;
  local_528 = prim;
  for (uVar138 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar146); uVar138 != 0;
      uVar138 = (ulong)((uint)uVar138 & (uint)uVar138 + 0xff & uVar140)) {
    lVar141 = 0;
    if (uVar138 != 0) {
      for (; (uVar138 >> lVar141 & 1) == 0; lVar141 = lVar141 + 1) {
      }
    }
    uVar19 = *(uint *)(local_528 + 2);
    local_7a8 = (ulong)uVar19;
    uVar20 = *(uint *)(local_528 + lVar141 * 4 + 6);
    pGVar145 = (context->scene->geometries).items[local_7a8].ptr;
    uVar142 = (ulong)*(uint *)(*(long *)&pGVar145->field_0x58 +
                              (ulong)uVar20 *
                              pGVar145[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar230 = (pGVar145->time_range).lower;
    fVar230 = pGVar145->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar230) / ((pGVar145->time_range).upper - fVar230)
              );
    auVar197 = vroundss_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),9);
    auVar197 = vminss_avx(auVar197,ZEXT416((uint)(pGVar145->fnumTimeSegments + -1.0)));
    auVar197 = vmaxss_avx(ZEXT816(0) << 0x20,auVar197);
    fVar230 = fVar230 - auVar197._0_4_;
    _Var22 = pGVar145[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar143 = (long)(int)auVar197._0_4_ * 0x38;
    lVar141 = *(long *)(_Var22 + 0x10 + lVar143);
    lVar147 = *(long *)(_Var22 + 0x38 + lVar143);
    lVar23 = *(long *)(_Var22 + 0x48 + lVar143);
    auVar197 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
    pfVar1 = (float *)(lVar147 + uVar142 * lVar23);
    fVar243 = auVar197._0_4_;
    fVar336 = auVar197._4_4_;
    fVar245 = auVar197._8_4_;
    fVar337 = auVar197._12_4_;
    pfVar2 = (float *)(lVar147 + (uVar142 + 1) * lVar23);
    uVar144 = (uVar142 + 2) * lVar23;
    pfVar3 = (float *)(lVar147 + uVar144);
    pfVar4 = (float *)(lVar147 + lVar23 * (uVar142 + 3));
    lVar147 = *(long *)(_Var22 + lVar143);
    auVar197 = vshufps_avx(ZEXT416((uint)(1.0 - fVar230)),ZEXT416((uint)(1.0 - fVar230)),0);
    pfVar5 = (float *)(lVar147 + lVar141 * uVar142);
    fVar230 = auVar197._0_4_;
    fVar162 = auVar197._4_4_;
    fVar241 = auVar197._8_4_;
    fVar329 = auVar197._12_4_;
    pfVar6 = (float *)(lVar147 + lVar141 * (uVar142 + 1));
    local_6f0 = (undefined1  [8])
                CONCAT44(fVar336 * pfVar1[1] + fVar162 * pfVar5[1],
                         fVar243 * *pfVar1 + fVar230 * *pfVar5);
    uStack_6e8._0_4_ = fVar245 * pfVar1[2] + fVar241 * pfVar5[2];
    uStack_6e8._4_4_ = fVar337 * pfVar1[3] + fVar329 * pfVar5[3];
    pfVar1 = (float *)(lVar147 + lVar141 * (uVar142 + 2));
    local_700 = (undefined1  [8])
                CONCAT44(fVar162 * pfVar6[1] + fVar336 * pfVar2[1],
                         fVar230 * *pfVar6 + fVar243 * *pfVar2);
    uStack_6f8._0_4_ = fVar241 * pfVar6[2] + fVar245 * pfVar2[2];
    uStack_6f8._4_4_ = fVar329 * pfVar6[3] + fVar337 * pfVar2[3];
    local_5f0 = (undefined1  [8])
                CONCAT44(fVar162 * pfVar1[1] + fVar336 * pfVar3[1],
                         fVar230 * *pfVar1 + fVar243 * *pfVar3);
    uStack_5e8._0_4_ = fVar241 * pfVar1[2] + fVar245 * pfVar3[2];
    uStack_5e8._4_4_ = fVar329 * pfVar1[3] + fVar337 * pfVar3[3];
    pfVar1 = (float *)(lVar147 + lVar141 * (uVar142 + 3));
    local_600 = (undefined1  [8])
                CONCAT44(fVar162 * pfVar1[1] + fVar336 * pfVar4[1],
                         fVar230 * *pfVar1 + fVar243 * *pfVar4);
    uStack_5f8._0_4_ = fVar241 * pfVar1[2] + fVar245 * pfVar4[2];
    uStack_5f8._4_4_ = fVar329 * pfVar1[3] + fVar337 * pfVar4[3];
    auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    uVar21 = (uint)pGVar145[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar218 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar217 = vsubps_avx(_local_6f0,auVar218);
    auVar197 = vshufps_avx(auVar217,auVar217,0);
    auVar216 = vshufps_avx(auVar217,auVar217,0x55);
    auVar217 = vshufps_avx(auVar217,auVar217,0xaa);
    fVar230 = (local_530->vx).field_0.m128[0];
    fVar162 = (local_530->vx).field_0.m128[1];
    fVar241 = (local_530->vx).field_0.m128[2];
    fVar329 = (local_530->vx).field_0.m128[3];
    fVar243 = (local_530->vy).field_0.m128[0];
    fVar336 = (local_530->vy).field_0.m128[1];
    fVar245 = (local_530->vy).field_0.m128[2];
    fVar337 = (local_530->vy).field_0.m128[3];
    fVar247 = (local_530->vz).field_0.m128[0];
    fVar248 = (local_530->vz).field_0.m128[1];
    fVar249 = (local_530->vz).field_0.m128[2];
    fVar251 = (local_530->vz).field_0.m128[3];
    auVar232._0_4_ = auVar197._0_4_ * fVar230 + auVar216._0_4_ * fVar243 + fVar247 * auVar217._0_4_;
    auVar232._4_4_ = auVar197._4_4_ * fVar162 + auVar216._4_4_ * fVar336 + fVar248 * auVar217._4_4_;
    auVar232._8_4_ = auVar197._8_4_ * fVar241 + auVar216._8_4_ * fVar245 + fVar249 * auVar217._8_4_;
    auVar232._12_4_ =
         auVar197._12_4_ * fVar329 + auVar216._12_4_ * fVar337 + fVar251 * auVar217._12_4_;
    auVar197 = vblendps_avx(auVar232,_local_6f0,8);
    auVar34 = vsubps_avx(_local_700,auVar218);
    auVar216 = vshufps_avx(auVar34,auVar34,0);
    auVar217 = vshufps_avx(auVar34,auVar34,0x55);
    auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
    auVar233._0_4_ = auVar216._0_4_ * fVar230 + auVar217._0_4_ * fVar243 + fVar247 * auVar34._0_4_;
    auVar233._4_4_ = auVar216._4_4_ * fVar162 + auVar217._4_4_ * fVar336 + fVar248 * auVar34._4_4_;
    auVar233._8_4_ = auVar216._8_4_ * fVar241 + auVar217._8_4_ * fVar245 + fVar249 * auVar34._8_4_;
    auVar233._12_4_ =
         auVar216._12_4_ * fVar329 + auVar217._12_4_ * fVar337 + fVar251 * auVar34._12_4_;
    auVar216 = vblendps_avx(auVar233,_local_700,8);
    auVar35 = vsubps_avx(_local_5f0,auVar218);
    auVar217 = vshufps_avx(auVar35,auVar35,0);
    auVar34 = vshufps_avx(auVar35,auVar35,0x55);
    auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
    auVar234._0_4_ = auVar217._0_4_ * fVar230 + auVar34._0_4_ * fVar243 + fVar247 * auVar35._0_4_;
    auVar234._4_4_ = auVar217._4_4_ * fVar162 + auVar34._4_4_ * fVar336 + fVar248 * auVar35._4_4_;
    auVar234._8_4_ = auVar217._8_4_ * fVar241 + auVar34._8_4_ * fVar245 + fVar249 * auVar35._8_4_;
    auVar234._12_4_ =
         auVar217._12_4_ * fVar329 + auVar34._12_4_ * fVar337 + fVar251 * auVar35._12_4_;
    auVar217 = vblendps_avx(auVar234,_local_5f0,8);
    auVar35 = vsubps_avx(_local_600,auVar218);
    auVar218 = vshufps_avx(auVar35,auVar35,0);
    auVar34 = vshufps_avx(auVar35,auVar35,0x55);
    auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
    auVar174._0_4_ = auVar218._0_4_ * fVar230 + auVar34._0_4_ * fVar243 + fVar247 * auVar35._0_4_;
    auVar174._4_4_ = auVar218._4_4_ * fVar162 + auVar34._4_4_ * fVar336 + fVar248 * auVar35._4_4_;
    auVar174._8_4_ = auVar218._8_4_ * fVar241 + auVar34._8_4_ * fVar245 + fVar249 * auVar35._8_4_;
    auVar174._12_4_ =
         auVar218._12_4_ * fVar329 + auVar34._12_4_ * fVar337 + fVar251 * auVar35._12_4_;
    auVar218 = vblendps_avx(auVar174,_local_600,8);
    auVar215._8_4_ = 0x7fffffff;
    auVar215._0_8_ = 0x7fffffff7fffffff;
    auVar215._12_4_ = 0x7fffffff;
    auVar197 = vandps_avx(auVar197,auVar215);
    auVar216 = vandps_avx(auVar216,auVar215);
    auVar34 = vmaxps_avx(auVar197,auVar216);
    auVar197 = vandps_avx(auVar217,auVar215);
    auVar216 = vandps_avx(auVar218,auVar215);
    auVar197 = vmaxps_avx(auVar197,auVar216);
    auVar197 = vmaxps_avx(auVar34,auVar197);
    auVar216 = vmovshdup_avx(auVar197);
    auVar216 = vmaxss_avx(auVar216,auVar197);
    auVar197 = vshufpd_avx(auVar197,auVar197,1);
    auVar197 = vmaxss_avx(auVar197,auVar216);
    lVar141 = (long)(int)uVar21 * 0x44;
    fVar337 = *(float *)(catmullrom_basis0 + lVar141 + 0x908);
    fVar247 = *(float *)(catmullrom_basis0 + lVar141 + 0x90c);
    fVar248 = *(float *)(catmullrom_basis0 + lVar141 + 0x910);
    fVar249 = *(float *)(catmullrom_basis0 + lVar141 + 0x914);
    fStack_4b0 = *(float *)(catmullrom_basis0 + lVar141 + 0x918);
    fStack_4ac = *(float *)(catmullrom_basis0 + lVar141 + 0x91c);
    fStack_4a8 = *(float *)(catmullrom_basis0 + lVar141 + 0x920);
    fStack_4a4 = *(float *)(catmullrom_basis0 + lVar141 + 0x924);
    local_780._0_16_ = auVar234;
    auVar216 = vshufps_avx(auVar234,auVar234,0);
    register0x000012d0 = auVar216;
    _local_640 = auVar216;
    auVar217 = vshufps_avx(auVar234,auVar234,0x55);
    auVar204._16_16_ = auVar217;
    auVar204._0_16_ = auVar217;
    fVar230 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar141 + 0xd8c);
    fVar162 = *(float *)(catmullrom_basis0 + lVar141 + 0xd90);
    fVar241 = *(float *)(catmullrom_basis0 + lVar141 + 0xd94);
    fVar329 = *(float *)(catmullrom_basis0 + lVar141 + 0xd98);
    fVar243 = *(float *)(catmullrom_basis0 + lVar141 + 0xd9c);
    fVar336 = *(float *)(catmullrom_basis0 + lVar141 + 0xda0);
    fVar245 = *(float *)(catmullrom_basis0 + lVar141 + 0xda4);
    auVar134 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar141 + 0xd8c);
    auVar218 = vshufps_avx(auVar174,auVar174,0);
    register0x00001550 = auVar218;
    _local_460 = auVar218;
    fVar351 = auVar218._0_4_;
    fVar356 = auVar218._4_4_;
    fVar357 = auVar218._8_4_;
    fVar358 = auVar218._12_4_;
    fVar213 = auVar216._0_4_;
    fVar226 = auVar216._4_4_;
    fVar227 = auVar216._8_4_;
    fVar287 = auVar216._12_4_;
    auVar216 = vshufps_avx(auVar174,auVar174,0x55);
    fVar338 = auVar216._0_4_;
    fVar348 = auVar216._4_4_;
    fVar349 = auVar216._8_4_;
    fVar350 = auVar216._12_4_;
    fVar305 = auVar217._0_4_;
    fVar207 = auVar217._4_4_;
    fVar209 = auVar217._8_4_;
    fVar211 = auVar217._12_4_;
    auVar216 = vshufps_avx(_local_5f0,_local_5f0,0xff);
    register0x00001490 = auVar216;
    _local_180 = auVar216;
    auVar217 = vshufps_avx(_local_600,_local_600,0xff);
    register0x00001410 = auVar217;
    _local_a0 = auVar217;
    fVar242 = auVar217._0_4_;
    fVar244 = auVar217._4_4_;
    fVar246 = auVar217._8_4_;
    fVar299 = auVar217._12_4_;
    fVar317 = auVar216._0_4_;
    fVar327 = auVar216._4_4_;
    fVar328 = auVar216._8_4_;
    auVar217 = vshufps_avx(auVar233,auVar233,0);
    register0x000015d0 = auVar217;
    _local_480 = auVar217;
    fVar251 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar141 + 0x484);
    fVar260 = *(float *)(catmullrom_basis0 + lVar141 + 0x488);
    fVar261 = *(float *)(catmullrom_basis0 + lVar141 + 0x48c);
    fVar262 = *(float *)(catmullrom_basis0 + lVar141 + 0x490);
    fVar263 = *(float *)(catmullrom_basis0 + lVar141 + 0x494);
    fVar264 = *(float *)(catmullrom_basis0 + lVar141 + 0x498);
    fVar265 = *(float *)(catmullrom_basis0 + lVar141 + 0x49c);
    auVar135 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar141 + 0x484);
    fVar368 = auVar217._0_4_;
    fVar372 = auVar217._4_4_;
    fVar373 = auVar217._8_4_;
    fVar374 = auVar217._12_4_;
    auVar217 = vshufps_avx(auVar233,auVar233,0x55);
    register0x00001210 = auVar217;
    _local_720 = auVar217;
    fVar148 = auVar217._0_4_;
    fVar163 = auVar217._4_4_;
    fVar165 = auVar217._8_4_;
    fVar167 = auVar217._12_4_;
    auVar217 = vpermilps_avx(_local_700,0xff);
    register0x00001590 = auVar217;
    _local_c0 = auVar217;
    fVar359 = auVar217._0_4_;
    fVar360 = auVar217._4_4_;
    fVar365 = auVar217._8_4_;
    fVar366 = auVar217._12_4_;
    fVar266 = fVar287 + 0.0 + 0.0;
    auVar217 = vshufps_avx(auVar232,auVar232,0);
    register0x00001390 = auVar217;
    _local_160 = auVar217;
    fVar267 = *(float *)(catmullrom_basis0 + lVar141);
    fVar276 = *(float *)(catmullrom_basis0 + lVar141 + 4);
    fVar279 = *(float *)(catmullrom_basis0 + lVar141 + 8);
    fVar281 = *(float *)(catmullrom_basis0 + lVar141 + 0xc);
    fVar284 = *(float *)(catmullrom_basis0 + lVar141 + 0x10);
    fVar286 = *(float *)(catmullrom_basis0 + lVar141 + 0x14);
    fVar288 = *(float *)(catmullrom_basis0 + lVar141 + 0x18);
    fVar268 = auVar217._0_4_;
    fVar277 = auVar217._4_4_;
    fVar280 = auVar217._8_4_;
    fVar282 = auVar217._12_4_;
    auVar289._0_4_ = fVar268 * fVar267 + fVar368 * fVar251 + fVar213 * fVar337 + fVar351 * fVar230;
    auVar289._4_4_ = fVar277 * fVar276 + fVar372 * fVar260 + fVar226 * fVar247 + fVar356 * fVar162;
    auVar289._8_4_ = fVar280 * fVar279 + fVar373 * fVar261 + fVar227 * fVar248 + fVar357 * fVar241;
    auVar289._12_4_ = fVar282 * fVar281 + fVar374 * fVar262 + fVar287 * fVar249 + fVar358 * fVar329;
    auVar293._16_4_ =
         fVar268 * fVar284 + fVar368 * fVar263 + fVar213 * fStack_4b0 + fVar351 * fVar243;
    auVar293._0_16_ = auVar289;
    auVar293._20_4_ =
         fVar277 * fVar286 + fVar372 * fVar264 + fVar226 * fStack_4ac + fVar356 * fVar336;
    auVar293._24_4_ =
         fVar280 * fVar288 + fVar373 * fVar265 + fVar227 * fStack_4a8 + fVar357 * fVar245;
    auVar293._28_4_ = fVar282 + 0.0;
    auVar217 = vshufps_avx(auVar232,auVar232,0x55);
    auVar205._16_16_ = auVar217;
    auVar205._0_16_ = auVar217;
    fVar191 = auVar217._0_4_;
    fVar208 = auVar217._4_4_;
    fVar210 = auVar217._8_4_;
    fVar212 = auVar217._12_4_;
    auVar335._0_4_ = fVar191 * fVar267 + fVar148 * fVar251 + fVar305 * fVar337 + fVar338 * fVar230;
    auVar335._4_4_ = fVar208 * fVar276 + fVar163 * fVar260 + fVar207 * fVar247 + fVar348 * fVar162;
    auVar335._8_4_ = fVar210 * fVar279 + fVar165 * fVar261 + fVar209 * fVar248 + fVar349 * fVar241;
    auVar335._12_4_ = fVar212 * fVar281 + fVar167 * fVar262 + fVar211 * fVar249 + fVar350 * fVar329;
    auVar335._16_4_ =
         fVar191 * fVar284 + fVar148 * fVar263 + fVar305 * fStack_4b0 + fVar338 * fVar243;
    auVar335._20_4_ =
         fVar208 * fVar286 + fVar163 * fVar264 + fVar207 * fStack_4ac + fVar348 * fVar336;
    auVar335._24_4_ =
         fVar210 * fVar288 + fVar165 * fVar265 + fVar209 * fStack_4a8 + fVar349 * fVar245;
    auVar335._28_4_ = fVar167 + fVar211 + 0.0 + 0.0;
    auVar217 = vpermilps_avx(_local_6f0,0xff);
    register0x00001450 = auVar217;
    _local_e0 = auVar217;
    fVar306 = auVar217._0_4_;
    fVar314 = auVar217._4_4_;
    fVar316 = auVar217._8_4_;
    local_860._0_4_ = fVar306 * fVar267 + fVar359 * fVar251 + fVar317 * fVar337 + fVar242 * fVar230;
    local_860._4_4_ = fVar314 * fVar276 + fVar360 * fVar260 + fVar327 * fVar247 + fVar244 * fVar162;
    fStack_858 = fVar316 * fVar279 + fVar365 * fVar261 + fVar328 * fVar248 + fVar246 * fVar241;
    fStack_854 = auVar217._12_4_ * fVar281 +
                 fVar366 * fVar262 + auVar216._12_4_ * fVar249 + fVar299 * fVar329;
    fStack_850 = fVar306 * fVar284 + fVar359 * fVar263 + fVar317 * fStack_4b0 + fVar242 * fVar243;
    fStack_84c = fVar314 * fVar286 + fVar360 * fVar264 + fVar327 * fStack_4ac + fVar244 * fVar336;
    fStack_848 = fVar316 * fVar288 + fVar365 * fVar265 + fVar328 * fStack_4a8 + fVar246 * fVar245;
    fStack_844 = fVar266 + 0.0;
    fVar251 = *(float *)(catmullrom_basis1 + lVar141 + 0x908);
    fVar260 = *(float *)(catmullrom_basis1 + lVar141 + 0x90c);
    fVar261 = *(float *)(catmullrom_basis1 + lVar141 + 0x910);
    fVar262 = *(float *)(catmullrom_basis1 + lVar141 + 0x914);
    fVar263 = *(float *)(catmullrom_basis1 + lVar141 + 0x918);
    fVar264 = *(float *)(catmullrom_basis1 + lVar141 + 0x91c);
    fVar265 = *(float *)(catmullrom_basis1 + lVar141 + 0x920);
    fVar300 = *(float *)(catmullrom_basis1 + lVar141 + 0xd8c);
    fVar228 = *(float *)(catmullrom_basis1 + lVar141 + 0xd90);
    fVar302 = *(float *)(catmullrom_basis1 + lVar141 + 0xd94);
    fVar301 = *(float *)(catmullrom_basis1 + lVar141 + 0xd98);
    fVar303 = *(float *)(catmullrom_basis1 + lVar141 + 0xd9c);
    fVar229 = *(float *)(catmullrom_basis1 + lVar141 + 0xda0);
    fVar189 = *(float *)(catmullrom_basis1 + lVar141 + 0xda4);
    fVar304 = *(float *)(catmullrom_basis1 + lVar141 + 0x484);
    fVar164 = *(float *)(catmullrom_basis1 + lVar141 + 0x488);
    fVar166 = *(float *)(catmullrom_basis1 + lVar141 + 0x48c);
    fVar168 = *(float *)(catmullrom_basis1 + lVar141 + 0x490);
    fVar169 = *(float *)(catmullrom_basis1 + lVar141 + 0x494);
    fVar170 = *(float *)(catmullrom_basis1 + lVar141 + 0x498);
    fVar171 = *(float *)(catmullrom_basis1 + lVar141 + 0x49c);
    fVar172 = *(float *)(catmullrom_basis1 + lVar141);
    fVar190 = *(float *)(catmullrom_basis1 + lVar141 + 4);
    fVar269 = *(float *)(catmullrom_basis1 + lVar141 + 8);
    fVar278 = *(float *)(catmullrom_basis1 + lVar141 + 0xc);
    fVar250 = *(float *)(catmullrom_basis1 + lVar141 + 0x10);
    fVar283 = *(float *)(catmullrom_basis1 + lVar141 + 0x14);
    fVar285 = *(float *)(catmullrom_basis1 + lVar141 + 0x18);
    auVar235._0_4_ = fVar268 * fVar172 + fVar368 * fVar304 + fVar213 * fVar251 + fVar351 * fVar300;
    auVar235._4_4_ = fVar277 * fVar190 + fVar372 * fVar164 + fVar226 * fVar260 + fVar356 * fVar228;
    auVar235._8_4_ = fVar280 * fVar269 + fVar373 * fVar166 + fVar227 * fVar261 + fVar357 * fVar302;
    auVar235._12_4_ = fVar282 * fVar278 + fVar374 * fVar168 + fVar287 * fVar262 + fVar358 * fVar301;
    auVar235._16_4_ = fVar268 * fVar250 + fVar368 * fVar169 + fVar213 * fVar263 + fVar351 * fVar303;
    auVar235._20_4_ = fVar277 * fVar283 + fVar372 * fVar170 + fVar226 * fVar264 + fVar356 * fVar229;
    auVar235._24_4_ = fVar280 * fVar285 + fVar373 * fVar171 + fVar227 * fVar265 + fVar357 * fVar189;
    auVar235._28_4_ = fVar366 + fVar358 + fVar266 + 0.0;
    local_4a0._0_4_ = fVar172 * fVar191 + fVar148 * fVar304 + fVar251 * fVar305 + fVar338 * fVar300;
    local_4a0._4_4_ = fVar190 * fVar208 + fVar163 * fVar164 + fVar260 * fVar207 + fVar348 * fVar228;
    fStack_498 = fVar269 * fVar210 + fVar165 * fVar166 + fVar261 * fVar209 + fVar349 * fVar302;
    fStack_494 = fVar278 * fVar212 + fVar167 * fVar168 + fVar262 * fVar211 + fVar350 * fVar301;
    fStack_490 = fVar250 * fVar191 + fVar148 * fVar169 + fVar263 * fVar305 + fVar338 * fVar303;
    fStack_48c = fVar283 * fVar208 + fVar163 * fVar170 + fVar264 * fVar207 + fVar348 * fVar229;
    fStack_488 = fVar285 * fVar210 + fVar165 * fVar171 + fVar265 * fVar209 + fVar349 * fVar189;
    fStack_484 = fVar212 + fVar358 + fVar282 + 0.0;
    local_7a0._0_4_ = fVar359 * fVar304 + fVar317 * fVar251 + fVar242 * fVar300 + fVar306 * fVar172;
    local_7a0._4_4_ = fVar360 * fVar164 + fVar327 * fVar260 + fVar244 * fVar228 + fVar314 * fVar190;
    local_7a0._8_4_ = fVar365 * fVar166 + fVar328 * fVar261 + fVar246 * fVar302 + fVar316 * fVar269;
    local_7a0._12_4_ =
         fVar366 * fVar168 + auVar216._12_4_ * fVar262 + fVar299 * fVar301 +
         auVar217._12_4_ * fVar278;
    local_7a0._16_4_ = fVar359 * fVar169 + fVar317 * fVar263 + fVar242 * fVar303 + fVar306 * fVar250
    ;
    local_7a0._20_4_ = fVar360 * fVar170 + fVar327 * fVar264 + fVar244 * fVar229 + fVar314 * fVar283
    ;
    local_7a0._24_4_ = fVar365 * fVar171 + fVar328 * fVar265 + fVar246 * fVar189 + fVar316 * fVar285
    ;
    local_7a0._28_4_ = fVar358 + fVar299 + fVar282 + fVar212;
    local_360 = vsubps_avx(auVar235,auVar293);
    auVar27 = vsubps_avx(_local_4a0,auVar335);
    fVar230 = local_360._0_4_;
    fVar162 = local_360._4_4_;
    auVar45._4_4_ = auVar335._4_4_ * fVar162;
    auVar45._0_4_ = auVar335._0_4_ * fVar230;
    fVar241 = local_360._8_4_;
    auVar45._8_4_ = auVar335._8_4_ * fVar241;
    fVar329 = local_360._12_4_;
    auVar45._12_4_ = auVar335._12_4_ * fVar329;
    fVar243 = local_360._16_4_;
    auVar45._16_4_ = auVar335._16_4_ * fVar243;
    fVar336 = local_360._20_4_;
    auVar45._20_4_ = auVar335._20_4_ * fVar336;
    fVar245 = local_360._24_4_;
    auVar45._24_4_ = auVar335._24_4_ * fVar245;
    auVar45._28_4_ = fVar212;
    fVar266 = auVar27._0_4_;
    fVar242 = auVar27._4_4_;
    auVar46._4_4_ = fVar242 * auVar289._4_4_;
    auVar46._0_4_ = fVar266 * auVar289._0_4_;
    fVar244 = auVar27._8_4_;
    auVar46._8_4_ = fVar244 * auVar289._8_4_;
    fVar246 = auVar27._12_4_;
    auVar46._12_4_ = fVar246 * auVar289._12_4_;
    fVar299 = auVar27._16_4_;
    auVar46._16_4_ = fVar299 * auVar293._16_4_;
    fVar306 = auVar27._20_4_;
    auVar46._20_4_ = fVar306 * auVar293._20_4_;
    fVar314 = auVar27._24_4_;
    auVar46._24_4_ = fVar314 * auVar293._24_4_;
    auVar46._28_4_ = fStack_484;
    auVar26 = vsubps_avx(auVar45,auVar46);
    auVar153 = vmaxps_avx(_local_860,local_7a0);
    auVar47._4_4_ = auVar153._4_4_ * auVar153._4_4_ * (fVar162 * fVar162 + fVar242 * fVar242);
    auVar47._0_4_ = auVar153._0_4_ * auVar153._0_4_ * (fVar230 * fVar230 + fVar266 * fVar266);
    auVar47._8_4_ = auVar153._8_4_ * auVar153._8_4_ * (fVar241 * fVar241 + fVar244 * fVar244);
    auVar47._12_4_ = auVar153._12_4_ * auVar153._12_4_ * (fVar329 * fVar329 + fVar246 * fVar246);
    auVar47._16_4_ = auVar153._16_4_ * auVar153._16_4_ * (fVar243 * fVar243 + fVar299 * fVar299);
    auVar47._20_4_ = auVar153._20_4_ * auVar153._20_4_ * (fVar336 * fVar336 + fVar306 * fVar306);
    auVar47._24_4_ = auVar153._24_4_ * auVar153._24_4_ * (fVar245 * fVar245 + fVar314 * fVar314);
    auVar47._28_4_ = auVar235._28_4_ + fStack_484;
    auVar48._4_4_ = auVar26._4_4_ * auVar26._4_4_;
    auVar48._0_4_ = auVar26._0_4_ * auVar26._0_4_;
    auVar48._8_4_ = auVar26._8_4_ * auVar26._8_4_;
    auVar48._12_4_ = auVar26._12_4_ * auVar26._12_4_;
    auVar48._16_4_ = auVar26._16_4_ * auVar26._16_4_;
    auVar48._20_4_ = auVar26._20_4_ * auVar26._20_4_;
    auVar48._24_4_ = auVar26._24_4_ * auVar26._24_4_;
    auVar48._28_4_ = auVar26._28_4_;
    local_610._0_4_ = (undefined4)(int)uVar21;
    local_610._4_12_ = auVar289._4_12_;
    auVar153 = vcmpps_avx(auVar48,auVar47,2);
    auVar216 = vshufps_avx(local_610,local_610,0);
    auVar221._16_16_ = auVar216;
    auVar221._0_16_ = auVar216;
    auVar26 = vcmpps_avx(_DAT_01f7b060,auVar221,1);
    auVar225 = ZEXT3264(auVar26);
    auVar216 = vpermilps_avx(auVar232,0xaa);
    register0x00001450 = auVar216;
    _local_5c0 = auVar216;
    auVar217 = vpermilps_avx(auVar233,0xaa);
    register0x00001550 = auVar217;
    _local_100 = auVar217;
    auVar218 = vpermilps_avx(auVar234,0xaa);
    register0x00001590 = auVar218;
    _local_120 = auVar218;
    auVar34 = vpermilps_avx(auVar174,0xaa);
    auVar236._16_16_ = auVar34;
    auVar236._0_16_ = auVar34;
    auVar28 = auVar26 & auVar153;
    local_680._0_16_ = ZEXT416(uVar20);
    uVar140 = *(uint *)(ray + k * 4 + 0x30);
    auVar197 = ZEXT416((uint)(auVar197._0_4_ * 4.7683716e-07));
    fVar230 = fVar148;
    fVar162 = fVar163;
    fVar241 = fVar165;
    if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar28 >> 0x7f,0) == '\0') &&
          (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar28 >> 0xbf,0) == '\0') &&
        (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar28[0x1f]) {
      uVar144 = 0;
      auVar188 = ZEXT1664(auVar197);
    }
    else {
      local_340 = vandps_avx(auVar153,auVar26);
      fVar299 = auVar216._0_4_;
      fVar306 = auVar216._4_4_;
      fVar314 = auVar216._8_4_;
      fVar316 = auVar216._12_4_;
      fVar317 = auVar217._0_4_;
      fVar327 = auVar217._4_4_;
      fVar328 = auVar217._8_4_;
      fVar359 = auVar217._12_4_;
      fVar360 = auVar218._0_4_;
      fVar365 = auVar218._4_4_;
      fVar366 = auVar218._8_4_;
      fVar367 = auVar218._12_4_;
      fVar266 = auVar34._0_4_;
      fVar242 = auVar34._4_4_;
      fVar244 = auVar34._8_4_;
      fVar246 = auVar34._12_4_;
      fVar329 = auVar26._28_4_ + *(float *)(catmullrom_basis1 + lVar141 + 0x924) + 0.0;
      local_500 = fVar299 * fVar172 + fVar317 * fVar304 + fVar360 * fVar251 + fVar266 * fVar300;
      fStack_4fc = fVar306 * fVar190 + fVar327 * fVar164 + fVar365 * fVar260 + fVar242 * fVar228;
      fStack_4f8 = fVar314 * fVar269 + fVar328 * fVar166 + fVar366 * fVar261 + fVar244 * fVar302;
      fStack_4f4 = fVar316 * fVar278 + fVar359 * fVar168 + fVar367 * fVar262 + fVar246 * fVar301;
      fStack_4f0 = fVar299 * fVar250 + fVar317 * fVar169 + fVar360 * fVar263 + fVar266 * fVar303;
      fStack_4ec = fVar306 * fVar283 + fVar327 * fVar170 + fVar365 * fVar264 + fVar242 * fVar229;
      fStack_4e8 = fVar314 * fVar285 + fVar328 * fVar171 + fVar366 * fVar265 + fVar244 * fVar189;
      fStack_4e4 = local_340._28_4_ + fVar329;
      local_5a0._0_4_ = auVar135._0_4_;
      local_5a0._4_4_ = auVar135._4_4_;
      fStack_598 = auVar135._8_4_;
      fStack_594 = auVar135._12_4_;
      fStack_590 = auVar135._16_4_;
      fStack_58c = auVar135._20_4_;
      fStack_588 = auVar135._24_4_;
      local_5e0._0_4_ = auVar134._0_4_;
      local_5e0._4_4_ = auVar134._4_4_;
      fStack_5d8 = auVar134._8_4_;
      fStack_5d4 = auVar134._12_4_;
      fStack_5d0 = auVar134._16_4_;
      fStack_5cc = auVar134._20_4_;
      fStack_5c8 = auVar134._24_4_;
      local_4c0 = fVar299 * fVar267 +
                  fVar317 * (float)local_5a0._0_4_ +
                  fVar360 * fVar337 + fVar266 * (float)local_5e0._0_4_;
      fStack_4bc = fVar306 * fVar276 +
                   fVar327 * (float)local_5a0._4_4_ +
                   fVar365 * fVar247 + fVar242 * (float)local_5e0._4_4_;
      fStack_4b8 = fVar314 * fVar279 +
                   fVar328 * fStack_598 + fVar366 * fVar248 + fVar244 * fStack_5d8;
      fStack_4b4 = fVar316 * fVar281 +
                   fVar359 * fStack_594 + fVar367 * fVar249 + fVar246 * fStack_5d4;
      fStack_4b0 = fVar299 * fVar284 +
                   fVar317 * fStack_590 + fVar360 * fStack_4b0 + fVar266 * fStack_5d0;
      fStack_4ac = fVar306 * fVar286 +
                   fVar327 * fStack_58c + fVar365 * fStack_4ac + fVar242 * fStack_5cc;
      fStack_4a8 = fVar314 * fVar288 +
                   fVar328 * fStack_588 + fVar366 * fStack_4a8 + fVar244 * fStack_5c8;
      fStack_4a4 = fStack_4e4 + fVar329 + local_340._28_4_ + auVar26._28_4_;
      fVar329 = *(float *)(catmullrom_basis0 + lVar141 + 0x1210);
      fVar243 = *(float *)(catmullrom_basis0 + lVar141 + 0x1214);
      fVar336 = *(float *)(catmullrom_basis0 + lVar141 + 0x1218);
      fVar245 = *(float *)(catmullrom_basis0 + lVar141 + 0x121c);
      fVar337 = *(float *)(catmullrom_basis0 + lVar141 + 0x1220);
      fVar247 = *(float *)(catmullrom_basis0 + lVar141 + 0x1224);
      fVar248 = *(float *)(catmullrom_basis0 + lVar141 + 0x1228);
      fVar249 = *(float *)(catmullrom_basis0 + lVar141 + 0x1694);
      fVar251 = *(float *)(catmullrom_basis0 + lVar141 + 0x1698);
      fVar260 = *(float *)(catmullrom_basis0 + lVar141 + 0x169c);
      fVar261 = *(float *)(catmullrom_basis0 + lVar141 + 0x16a0);
      fVar262 = *(float *)(catmullrom_basis0 + lVar141 + 0x16a4);
      fVar263 = *(float *)(catmullrom_basis0 + lVar141 + 0x16a8);
      fVar264 = *(float *)(catmullrom_basis0 + lVar141 + 0x16ac);
      fVar265 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b18);
      fVar267 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b1c);
      fVar276 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b20);
      fVar279 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b24);
      fVar281 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b28);
      fVar284 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b2c);
      fVar286 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b30);
      fVar288 = *(float *)(catmullrom_basis0 + lVar141 + 0x1f9c);
      fVar300 = *(float *)(catmullrom_basis0 + lVar141 + 0x1fa0);
      fVar228 = *(float *)(catmullrom_basis0 + lVar141 + 0x1fa4);
      fVar302 = *(float *)(catmullrom_basis0 + lVar141 + 0x1fa8);
      fVar301 = *(float *)(catmullrom_basis0 + lVar141 + 0x1fac);
      fVar303 = *(float *)(catmullrom_basis0 + lVar141 + 0x1fb0);
      fVar229 = *(float *)(catmullrom_basis0 + lVar141 + 0x1fb4);
      local_780._0_16_ = auVar197;
      fVar189 = *(float *)(catmullrom_basis0 + lVar141 + 0x1b34) +
                *(float *)(catmullrom_basis0 + lVar141 + 0x1fb8);
      fVar304 = *(float *)(catmullrom_basis0 + lVar141 + 0x16b0) + fVar189;
      local_5a0._4_4_ =
           fVar277 * fVar243 + fVar372 * fVar251 + fVar226 * fVar267 + fVar356 * fVar300;
      local_5a0._0_4_ =
           fVar268 * fVar329 + fVar368 * fVar249 + fVar213 * fVar265 + fVar351 * fVar288;
      fStack_598 = fVar280 * fVar336 + fVar373 * fVar260 + fVar227 * fVar276 + fVar357 * fVar228;
      fStack_594 = fVar282 * fVar245 + fVar374 * fVar261 + fVar287 * fVar279 + fVar358 * fVar302;
      fStack_590 = fVar268 * fVar337 + fVar368 * fVar262 + fVar213 * fVar281 + fVar351 * fVar301;
      fStack_58c = fVar277 * fVar247 + fVar372 * fVar263 + fVar226 * fVar284 + fVar356 * fVar303;
      fStack_588 = fVar280 * fVar248 + fVar373 * fVar264 + fVar227 * fVar286 + fVar357 * fVar229;
      fStack_584 = *(float *)(catmullrom_basis0 + lVar141 + 0x16b0) +
                   *(float *)(catmullrom_basis0 + lVar141 + 0x1fb8) +
                   fVar316 + *(float *)(catmullrom_basis1 + lVar141 + 0x4a0);
      auVar271._0_4_ = fVar191 * fVar329 + fVar305 * fVar265 + fVar338 * fVar288 + fVar148 * fVar249
      ;
      auVar271._4_4_ = fVar208 * fVar243 + fVar207 * fVar267 + fVar348 * fVar300 + fVar163 * fVar251
      ;
      auVar271._8_4_ = fVar210 * fVar336 + fVar209 * fVar276 + fVar349 * fVar228 + fVar165 * fVar260
      ;
      auVar271._12_4_ =
           fVar212 * fVar245 + fVar211 * fVar279 + fVar350 * fVar302 + fVar167 * fVar261;
      auVar271._16_4_ =
           fVar191 * fVar337 + fVar305 * fVar281 + fVar338 * fVar301 + fVar148 * fVar262;
      auVar271._20_4_ =
           fVar208 * fVar247 + fVar207 * fVar284 + fVar348 * fVar303 + fVar163 * fVar263;
      auVar271._24_4_ =
           fVar210 * fVar248 + fVar209 * fVar286 + fVar349 * fVar229 + fVar165 * fVar264;
      auVar271._28_4_ =
           fVar189 + fVar316 + *(float *)(catmullrom_basis1 + lVar141 + 0x1c) +
                     fVar316 + *(float *)(catmullrom_basis1 + lVar141 + 0x4a0);
      local_4e0 = fVar317 * fVar249 + fVar360 * fVar265 + fVar266 * fVar288 + fVar299 * fVar329;
      fStack_4dc = fVar327 * fVar251 + fVar365 * fVar267 + fVar242 * fVar300 + fVar306 * fVar243;
      fStack_4d8 = fVar328 * fVar260 + fVar366 * fVar276 + fVar244 * fVar228 + fVar314 * fVar336;
      fStack_4d4 = fVar359 * fVar261 + fVar367 * fVar279 + fVar246 * fVar302 + fVar316 * fVar245;
      fStack_4d0 = fVar317 * fVar262 + fVar360 * fVar281 + fVar266 * fVar301 + fVar299 * fVar337;
      fStack_4cc = fVar327 * fVar263 + fVar365 * fVar284 + fVar242 * fVar303 + fVar306 * fVar247;
      fStack_4c8 = fVar328 * fVar264 + fVar366 * fVar286 + fVar244 * fVar229 + fVar314 * fVar248;
      fStack_4c4 = fVar304 + *(float *)(catmullrom_basis0 + lVar141 + 0x122c);
      fVar329 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b18);
      fVar243 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b1c);
      fVar336 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b20);
      fVar245 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b24);
      fVar337 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b28);
      fVar247 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b2c);
      fVar248 = *(float *)(catmullrom_basis1 + lVar141 + 0x1b30);
      fVar249 = *(float *)(catmullrom_basis1 + lVar141 + 0x1f9c);
      fVar251 = *(float *)(catmullrom_basis1 + lVar141 + 0x1fa0);
      fVar260 = *(float *)(catmullrom_basis1 + lVar141 + 0x1fa4);
      fVar261 = *(float *)(catmullrom_basis1 + lVar141 + 0x1fa8);
      fVar262 = *(float *)(catmullrom_basis1 + lVar141 + 0x1fac);
      fVar263 = *(float *)(catmullrom_basis1 + lVar141 + 0x1fb0);
      fVar264 = *(float *)(catmullrom_basis1 + lVar141 + 0x1fb4);
      fVar265 = *(float *)(catmullrom_basis1 + lVar141 + 0x1694);
      fVar267 = *(float *)(catmullrom_basis1 + lVar141 + 0x1698);
      fVar276 = *(float *)(catmullrom_basis1 + lVar141 + 0x169c);
      fVar279 = *(float *)(catmullrom_basis1 + lVar141 + 0x16a0);
      fVar281 = *(float *)(catmullrom_basis1 + lVar141 + 0x16a4);
      fVar284 = *(float *)(catmullrom_basis1 + lVar141 + 0x16a8);
      fVar286 = *(float *)(catmullrom_basis1 + lVar141 + 0x16ac);
      fVar288 = *(float *)(catmullrom_basis1 + lVar141 + 0x1210);
      fVar300 = *(float *)(catmullrom_basis1 + lVar141 + 0x1214);
      fVar228 = *(float *)(catmullrom_basis1 + lVar141 + 0x1218);
      fVar302 = *(float *)(catmullrom_basis1 + lVar141 + 0x121c);
      fVar301 = *(float *)(catmullrom_basis1 + lVar141 + 0x1220);
      fVar303 = *(float *)(catmullrom_basis1 + lVar141 + 0x1224);
      fVar229 = *(float *)(catmullrom_basis1 + lVar141 + 0x1228);
      auVar297._0_4_ = fVar268 * fVar288 + fVar368 * fVar265 + fVar213 * fVar329 + fVar351 * fVar249
      ;
      auVar297._4_4_ = fVar277 * fVar300 + fVar372 * fVar267 + fVar226 * fVar243 + fVar356 * fVar251
      ;
      auVar297._8_4_ = fVar280 * fVar228 + fVar373 * fVar276 + fVar227 * fVar336 + fVar357 * fVar260
      ;
      auVar297._12_4_ =
           fVar282 * fVar302 + fVar374 * fVar279 + fVar287 * fVar245 + fVar358 * fVar261;
      auVar297._16_4_ =
           fVar268 * fVar301 + fVar368 * fVar281 + fVar213 * fVar337 + fVar351 * fVar262;
      auVar297._20_4_ =
           fVar277 * fVar303 + fVar372 * fVar284 + fVar226 * fVar247 + fVar356 * fVar263;
      auVar297._24_4_ =
           fVar280 * fVar229 + fVar373 * fVar286 + fVar227 * fVar248 + fVar357 * fVar264;
      auVar297._28_4_ = fVar211 + fVar211 + fVar316 + fVar304;
      auVar310._0_4_ = fVar191 * fVar288 + fVar148 * fVar265 + fVar305 * fVar329 + fVar338 * fVar249
      ;
      auVar310._4_4_ = fVar208 * fVar300 + fVar163 * fVar267 + fVar207 * fVar243 + fVar348 * fVar251
      ;
      auVar310._8_4_ = fVar210 * fVar228 + fVar165 * fVar276 + fVar209 * fVar336 + fVar349 * fVar260
      ;
      auVar310._12_4_ =
           fVar212 * fVar302 + fVar167 * fVar279 + fVar211 * fVar245 + fVar350 * fVar261;
      auVar310._16_4_ =
           fVar191 * fVar301 + fVar148 * fVar281 + fVar305 * fVar337 + fVar338 * fVar262;
      auVar310._20_4_ =
           fVar208 * fVar303 + fVar163 * fVar284 + fVar207 * fVar247 + fVar348 * fVar263;
      auVar310._24_4_ =
           fVar210 * fVar229 + fVar165 * fVar286 + fVar209 * fVar248 + fVar349 * fVar264;
      auVar310._28_4_ = fVar211 + fVar211 + fVar211 + fVar316;
      auVar206._0_4_ = fVar299 * fVar288 + fVar317 * fVar265 + fVar360 * fVar329 + fVar249 * fVar266
      ;
      auVar206._4_4_ = fVar306 * fVar300 + fVar327 * fVar267 + fVar365 * fVar243 + fVar251 * fVar242
      ;
      auVar206._8_4_ = fVar314 * fVar228 + fVar328 * fVar276 + fVar366 * fVar336 + fVar260 * fVar244
      ;
      auVar206._12_4_ =
           fVar316 * fVar302 + fVar359 * fVar279 + fVar367 * fVar245 + fVar261 * fVar246;
      auVar206._16_4_ =
           fVar299 * fVar301 + fVar317 * fVar281 + fVar360 * fVar337 + fVar262 * fVar266;
      auVar206._20_4_ =
           fVar306 * fVar303 + fVar327 * fVar284 + fVar365 * fVar247 + fVar263 * fVar242;
      auVar206._24_4_ =
           fVar314 * fVar229 + fVar328 * fVar286 + fVar366 * fVar248 + fVar264 * fVar244;
      auVar206._28_4_ =
           *(float *)(catmullrom_basis1 + lVar141 + 0x122c) +
           *(float *)(catmullrom_basis1 + lVar141 + 0x16b0) +
           *(float *)(catmullrom_basis1 + lVar141 + 0x1b34) +
           *(float *)(catmullrom_basis1 + lVar141 + 0x1fb8);
      auVar237._8_4_ = 0x7fffffff;
      auVar237._0_8_ = 0x7fffffff7fffffff;
      auVar237._12_4_ = 0x7fffffff;
      auVar237._16_4_ = 0x7fffffff;
      auVar237._20_4_ = 0x7fffffff;
      auVar237._24_4_ = 0x7fffffff;
      auVar237._28_4_ = 0x7fffffff;
      auVar153 = vandps_avx(_local_5a0,auVar237);
      auVar26 = vandps_avx(auVar271,auVar237);
      auVar26 = vmaxps_avx(auVar153,auVar26);
      auVar130._4_4_ = fStack_4dc;
      auVar130._0_4_ = local_4e0;
      auVar130._8_4_ = fStack_4d8;
      auVar130._12_4_ = fStack_4d4;
      auVar130._16_4_ = fStack_4d0;
      auVar130._20_4_ = fStack_4cc;
      auVar130._24_4_ = fStack_4c8;
      auVar130._28_4_ = fStack_4c4;
      auVar153 = vandps_avx(auVar237,auVar130);
      auVar153 = vmaxps_avx(auVar26,auVar153);
      auVar216 = vpermilps_avx(auVar197,0);
      auVar272._16_16_ = auVar216;
      auVar272._0_16_ = auVar216;
      auVar153 = vcmpps_avx(auVar153,auVar272,1);
      auVar28 = vblendvps_avx(_local_5a0,local_360,auVar153);
      auVar29 = vblendvps_avx(auVar271,auVar27,auVar153);
      auVar153 = vandps_avx(auVar297,auVar237);
      auVar26 = vandps_avx(auVar310,auVar237);
      auVar30 = vmaxps_avx(auVar153,auVar26);
      auVar153 = vandps_avx(auVar206,auVar237);
      auVar153 = vmaxps_avx(auVar30,auVar153);
      auVar30 = vcmpps_avx(auVar153,auVar272,1);
      auVar153 = vblendvps_avx(auVar297,local_360,auVar30);
      auVar27 = vblendvps_avx(auVar310,auVar27,auVar30);
      fVar304 = auVar28._0_4_;
      fVar164 = auVar28._4_4_;
      fVar166 = auVar28._8_4_;
      fVar168 = auVar28._12_4_;
      fVar169 = auVar28._16_4_;
      fVar170 = auVar28._20_4_;
      fVar171 = auVar28._24_4_;
      fVar172 = auVar153._0_4_;
      fVar190 = auVar153._4_4_;
      fVar269 = auVar153._8_4_;
      fVar278 = auVar153._12_4_;
      fVar250 = auVar153._16_4_;
      fVar283 = auVar153._20_4_;
      fVar285 = auVar153._24_4_;
      fVar305 = -auVar153._28_4_;
      fVar329 = auVar29._0_4_;
      fVar337 = auVar29._4_4_;
      fVar251 = auVar29._8_4_;
      fVar263 = auVar29._12_4_;
      fVar276 = auVar29._16_4_;
      fVar286 = auVar29._20_4_;
      fVar302 = auVar29._24_4_;
      auVar154._0_4_ = fVar329 * fVar329 + fVar304 * fVar304;
      auVar154._4_4_ = fVar337 * fVar337 + fVar164 * fVar164;
      auVar154._8_4_ = fVar251 * fVar251 + fVar166 * fVar166;
      auVar154._12_4_ = fVar263 * fVar263 + fVar168 * fVar168;
      auVar154._16_4_ = fVar276 * fVar276 + fVar169 * fVar169;
      auVar154._20_4_ = fVar286 * fVar286 + fVar170 * fVar170;
      auVar154._24_4_ = fVar302 * fVar302 + fVar171 * fVar171;
      auVar154._28_4_ = auVar310._28_4_ + auVar28._28_4_;
      auVar28 = vrsqrtps_avx(auVar154);
      fVar243 = auVar28._0_4_;
      fVar336 = auVar28._4_4_;
      auVar49._4_4_ = fVar336 * 1.5;
      auVar49._0_4_ = fVar243 * 1.5;
      fVar245 = auVar28._8_4_;
      auVar49._8_4_ = fVar245 * 1.5;
      fVar247 = auVar28._12_4_;
      auVar49._12_4_ = fVar247 * 1.5;
      fVar248 = auVar28._16_4_;
      auVar49._16_4_ = fVar248 * 1.5;
      fVar249 = auVar28._20_4_;
      auVar49._20_4_ = fVar249 * 1.5;
      fVar260 = auVar28._24_4_;
      fVar189 = auVar26._28_4_;
      auVar49._24_4_ = fVar260 * 1.5;
      auVar49._28_4_ = fVar189;
      auVar50._4_4_ = fVar336 * fVar336 * fVar336 * auVar154._4_4_ * 0.5;
      auVar50._0_4_ = fVar243 * fVar243 * fVar243 * auVar154._0_4_ * 0.5;
      auVar50._8_4_ = fVar245 * fVar245 * fVar245 * auVar154._8_4_ * 0.5;
      auVar50._12_4_ = fVar247 * fVar247 * fVar247 * auVar154._12_4_ * 0.5;
      auVar50._16_4_ = fVar248 * fVar248 * fVar248 * auVar154._16_4_ * 0.5;
      auVar50._20_4_ = fVar249 * fVar249 * fVar249 * auVar154._20_4_ * 0.5;
      auVar50._24_4_ = fVar260 * fVar260 * fVar260 * auVar154._24_4_ * 0.5;
      auVar50._28_4_ = auVar154._28_4_;
      auVar26 = vsubps_avx(auVar49,auVar50);
      fVar243 = auVar26._0_4_;
      fVar247 = auVar26._4_4_;
      fVar260 = auVar26._8_4_;
      fVar264 = auVar26._12_4_;
      fVar279 = auVar26._16_4_;
      fVar288 = auVar26._20_4_;
      fVar301 = auVar26._24_4_;
      fVar336 = auVar27._0_4_;
      fVar248 = auVar27._4_4_;
      fVar261 = auVar27._8_4_;
      fVar265 = auVar27._12_4_;
      fVar281 = auVar27._16_4_;
      fVar300 = auVar27._20_4_;
      fVar303 = auVar27._24_4_;
      auVar155._0_4_ = fVar336 * fVar336 + fVar172 * fVar172;
      auVar155._4_4_ = fVar248 * fVar248 + fVar190 * fVar190;
      auVar155._8_4_ = fVar261 * fVar261 + fVar269 * fVar269;
      auVar155._12_4_ = fVar265 * fVar265 + fVar278 * fVar278;
      auVar155._16_4_ = fVar281 * fVar281 + fVar250 * fVar250;
      auVar155._20_4_ = fVar300 * fVar300 + fVar283 * fVar283;
      auVar155._24_4_ = fVar303 * fVar303 + fVar285 * fVar285;
      auVar155._28_4_ = auVar153._28_4_ + auVar26._28_4_;
      auVar153 = vrsqrtps_avx(auVar155);
      fVar245 = auVar153._0_4_;
      fVar249 = auVar153._4_4_;
      auVar51._4_4_ = fVar249 * 1.5;
      auVar51._0_4_ = fVar245 * 1.5;
      fVar262 = auVar153._8_4_;
      auVar51._8_4_ = fVar262 * 1.5;
      fVar267 = auVar153._12_4_;
      auVar51._12_4_ = fVar267 * 1.5;
      fVar284 = auVar153._16_4_;
      auVar51._16_4_ = fVar284 * 1.5;
      fVar228 = auVar153._20_4_;
      auVar51._20_4_ = fVar228 * 1.5;
      fVar229 = auVar153._24_4_;
      auVar51._24_4_ = fVar229 * 1.5;
      auVar51._28_4_ = fVar189;
      auVar52._4_4_ = fVar249 * fVar249 * fVar249 * auVar155._4_4_ * 0.5;
      auVar52._0_4_ = fVar245 * fVar245 * fVar245 * auVar155._0_4_ * 0.5;
      auVar52._8_4_ = fVar262 * fVar262 * fVar262 * auVar155._8_4_ * 0.5;
      auVar52._12_4_ = fVar267 * fVar267 * fVar267 * auVar155._12_4_ * 0.5;
      auVar52._16_4_ = fVar284 * fVar284 * fVar284 * auVar155._16_4_ * 0.5;
      auVar52._20_4_ = fVar228 * fVar228 * fVar228 * auVar155._20_4_ * 0.5;
      auVar52._24_4_ = fVar229 * fVar229 * fVar229 * auVar155._24_4_ * 0.5;
      auVar52._28_4_ = auVar155._28_4_;
      auVar153 = vsubps_avx(auVar51,auVar52);
      fVar245 = auVar153._0_4_;
      fVar249 = auVar153._4_4_;
      fVar262 = auVar153._8_4_;
      fVar267 = auVar153._12_4_;
      fVar284 = auVar153._16_4_;
      fVar228 = auVar153._20_4_;
      fVar229 = auVar153._24_4_;
      fVar329 = (float)local_860._0_4_ * fVar329 * fVar243;
      fVar337 = (float)local_860._4_4_ * fVar337 * fVar247;
      auVar53._4_4_ = fVar337;
      auVar53._0_4_ = fVar329;
      fVar251 = fStack_858 * fVar251 * fVar260;
      auVar53._8_4_ = fVar251;
      fVar263 = fStack_854 * fVar263 * fVar264;
      auVar53._12_4_ = fVar263;
      fVar276 = fStack_850 * fVar276 * fVar279;
      auVar53._16_4_ = fVar276;
      fVar286 = fStack_84c * fVar286 * fVar288;
      auVar53._20_4_ = fVar286;
      fVar302 = fStack_848 * fVar302 * fVar301;
      auVar53._24_4_ = fVar302;
      auVar53._28_4_ = fVar305;
      local_5e0._4_4_ = fVar337 + auVar289._4_4_;
      local_5e0._0_4_ = fVar329 + auVar289._0_4_;
      fStack_5d8 = fVar251 + auVar289._8_4_;
      fStack_5d4 = fVar263 + auVar289._12_4_;
      fStack_5d0 = fVar276 + auVar293._16_4_;
      fStack_5cc = fVar286 + auVar293._20_4_;
      fStack_5c8 = fVar302 + auVar293._24_4_;
      fStack_5c4 = fVar305 + auVar293._28_4_;
      fVar329 = (float)local_860._0_4_ * fVar243 * -fVar304;
      fVar337 = (float)local_860._4_4_ * fVar247 * -fVar164;
      auVar54._4_4_ = fVar337;
      auVar54._0_4_ = fVar329;
      fVar251 = fStack_858 * fVar260 * -fVar166;
      auVar54._8_4_ = fVar251;
      fVar263 = fStack_854 * fVar264 * -fVar168;
      auVar54._12_4_ = fVar263;
      fVar276 = fStack_850 * fVar279 * -fVar169;
      auVar54._16_4_ = fVar276;
      fVar286 = fStack_84c * fVar288 * -fVar170;
      auVar54._20_4_ = fVar286;
      fVar302 = fStack_848 * fVar301 * -fVar171;
      auVar54._24_4_ = fVar302;
      auVar54._28_4_ = fVar189;
      local_5a0._4_4_ = fVar337 + auVar335._4_4_;
      local_5a0._0_4_ = fVar329 + auVar335._0_4_;
      fStack_598 = fVar251 + auVar335._8_4_;
      fStack_594 = fVar263 + auVar335._12_4_;
      fStack_590 = fVar276 + auVar335._16_4_;
      fStack_58c = fVar286 + auVar335._20_4_;
      fStack_588 = fVar302 + auVar335._24_4_;
      fStack_584 = fVar189 + auVar335._28_4_;
      fVar329 = fVar243 * 0.0 * (float)local_860._0_4_;
      fVar243 = fVar247 * 0.0 * (float)local_860._4_4_;
      auVar55._4_4_ = fVar243;
      auVar55._0_4_ = fVar329;
      fVar337 = fVar260 * 0.0 * fStack_858;
      auVar55._8_4_ = fVar337;
      fVar247 = fVar264 * 0.0 * fStack_854;
      auVar55._12_4_ = fVar247;
      fVar251 = fVar279 * 0.0 * fStack_850;
      auVar55._16_4_ = fVar251;
      fVar260 = fVar288 * 0.0 * fStack_84c;
      auVar55._20_4_ = fVar260;
      fVar263 = fVar301 * 0.0 * fStack_848;
      auVar55._24_4_ = fVar263;
      auVar55._28_4_ = fVar350;
      auVar133._4_4_ = fStack_4bc;
      auVar133._0_4_ = local_4c0;
      auVar133._8_4_ = fStack_4b8;
      auVar133._12_4_ = fStack_4b4;
      auVar133._16_4_ = fStack_4b0;
      auVar133._20_4_ = fStack_4ac;
      auVar133._24_4_ = fStack_4a8;
      auVar133._28_4_ = fStack_4a4;
      auVar273._0_4_ = fVar329 + local_4c0;
      auVar273._4_4_ = fVar243 + fStack_4bc;
      auVar273._8_4_ = fVar337 + fStack_4b8;
      auVar273._12_4_ = fVar247 + fStack_4b4;
      auVar273._16_4_ = fVar251 + fStack_4b0;
      auVar273._20_4_ = fVar260 + fStack_4ac;
      auVar273._24_4_ = fVar263 + fStack_4a8;
      auVar273._28_4_ = fVar350 + fStack_4a4;
      fVar329 = (float)local_7a0._0_4_ * fVar336 * fVar245;
      fVar243 = local_7a0._4_4_ * fVar248 * fVar249;
      auVar56._4_4_ = fVar243;
      auVar56._0_4_ = fVar329;
      fVar336 = local_7a0._8_4_ * fVar261 * fVar262;
      auVar56._8_4_ = fVar336;
      fVar337 = local_7a0._12_4_ * fVar265 * fVar267;
      auVar56._12_4_ = fVar337;
      fVar247 = local_7a0._16_4_ * fVar281 * fVar284;
      auVar56._16_4_ = fVar247;
      fVar248 = local_7a0._20_4_ * fVar300 * fVar228;
      auVar56._20_4_ = fVar248;
      fVar251 = local_7a0._24_4_ * fVar303 * fVar229;
      auVar56._24_4_ = fVar251;
      auVar56._28_4_ = auVar27._28_4_;
      auVar31 = vsubps_avx(auVar293,auVar53);
      auVar311._0_4_ = auVar235._0_4_ + fVar329;
      auVar311._4_4_ = auVar235._4_4_ + fVar243;
      auVar311._8_4_ = auVar235._8_4_ + fVar336;
      auVar311._12_4_ = auVar235._12_4_ + fVar337;
      auVar311._16_4_ = auVar235._16_4_ + fVar247;
      auVar311._20_4_ = auVar235._20_4_ + fVar248;
      auVar311._24_4_ = auVar235._24_4_ + fVar251;
      auVar311._28_4_ = auVar235._28_4_ + auVar27._28_4_;
      fVar329 = (float)local_7a0._0_4_ * -fVar172 * fVar245;
      fVar243 = local_7a0._4_4_ * -fVar190 * fVar249;
      auVar57._4_4_ = fVar243;
      auVar57._0_4_ = fVar329;
      fVar336 = local_7a0._8_4_ * -fVar269 * fVar262;
      auVar57._8_4_ = fVar336;
      fVar337 = local_7a0._12_4_ * -fVar278 * fVar267;
      auVar57._12_4_ = fVar337;
      fVar247 = local_7a0._16_4_ * -fVar250 * fVar284;
      auVar57._16_4_ = fVar247;
      fVar248 = local_7a0._20_4_ * -fVar283 * fVar228;
      auVar57._20_4_ = fVar248;
      fVar251 = local_7a0._24_4_ * -fVar285 * fVar229;
      auVar57._24_4_ = fVar251;
      auVar57._28_4_ = fVar359;
      auVar32 = vsubps_avx(auVar335,auVar54);
      auVar324._0_4_ = fVar329 + (float)local_4a0._0_4_;
      auVar324._4_4_ = fVar243 + (float)local_4a0._4_4_;
      auVar324._8_4_ = fVar336 + fStack_498;
      auVar324._12_4_ = fVar337 + fStack_494;
      auVar324._16_4_ = fVar247 + fStack_490;
      auVar324._20_4_ = fVar248 + fStack_48c;
      auVar324._24_4_ = fVar251 + fStack_488;
      auVar324._28_4_ = fVar359 + fStack_484;
      fVar329 = fVar245 * 0.0 * (float)local_7a0._0_4_;
      fVar243 = fVar249 * 0.0 * local_7a0._4_4_;
      auVar58._4_4_ = fVar243;
      auVar58._0_4_ = fVar329;
      fVar336 = fVar262 * 0.0 * local_7a0._8_4_;
      auVar58._8_4_ = fVar336;
      fVar245 = fVar267 * 0.0 * local_7a0._12_4_;
      auVar58._12_4_ = fVar245;
      fVar337 = fVar284 * 0.0 * local_7a0._16_4_;
      auVar58._16_4_ = fVar337;
      fVar247 = fVar228 * 0.0 * local_7a0._20_4_;
      auVar58._20_4_ = fVar247;
      fVar248 = fVar229 * 0.0 * local_7a0._24_4_;
      auVar58._24_4_ = fVar248;
      auVar58._28_4_ = 0x3f000000;
      auVar33 = vsubps_avx(auVar133,auVar55);
      auVar128._4_4_ = fStack_4fc;
      auVar128._0_4_ = local_500;
      auVar128._8_4_ = fStack_4f8;
      auVar128._12_4_ = fStack_4f4;
      auVar128._16_4_ = fStack_4f0;
      auVar128._20_4_ = fStack_4ec;
      auVar128._24_4_ = fStack_4e8;
      auVar128._28_4_ = fStack_4e4;
      auVar364._0_4_ = fVar329 + local_500;
      auVar364._4_4_ = fVar243 + fStack_4fc;
      auVar364._8_4_ = fVar336 + fStack_4f8;
      auVar364._12_4_ = fVar245 + fStack_4f4;
      auVar364._16_4_ = fVar337 + fStack_4f0;
      auVar364._20_4_ = fVar247 + fStack_4ec;
      auVar364._24_4_ = fVar248 + fStack_4e8;
      auVar364._28_4_ = fStack_4e4 + 0.5;
      auVar153 = vsubps_avx(auVar235,auVar56);
      auVar26 = vsubps_avx(_local_4a0,auVar57);
      auVar25 = vsubps_avx(auVar128,auVar58);
      auVar27 = vsubps_avx(auVar324,auVar32);
      auVar28 = vsubps_avx(auVar364,auVar33);
      auVar59._4_4_ = auVar33._4_4_ * auVar27._4_4_;
      auVar59._0_4_ = auVar33._0_4_ * auVar27._0_4_;
      auVar59._8_4_ = auVar33._8_4_ * auVar27._8_4_;
      auVar59._12_4_ = auVar33._12_4_ * auVar27._12_4_;
      auVar59._16_4_ = auVar33._16_4_ * auVar27._16_4_;
      auVar59._20_4_ = auVar33._20_4_ * auVar27._20_4_;
      auVar59._24_4_ = auVar33._24_4_ * auVar27._24_4_;
      auVar59._28_4_ = fVar167;
      auVar60._4_4_ = auVar32._4_4_ * auVar28._4_4_;
      auVar60._0_4_ = auVar32._0_4_ * auVar28._0_4_;
      auVar60._8_4_ = auVar32._8_4_ * auVar28._8_4_;
      auVar60._12_4_ = auVar32._12_4_ * auVar28._12_4_;
      auVar60._16_4_ = auVar32._16_4_ * auVar28._16_4_;
      auVar60._20_4_ = auVar32._20_4_ * auVar28._20_4_;
      auVar60._24_4_ = auVar32._24_4_ * auVar28._24_4_;
      auVar60._28_4_ = fStack_484;
      auVar29 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = auVar31._4_4_ * auVar28._4_4_;
      auVar61._0_4_ = auVar31._0_4_ * auVar28._0_4_;
      auVar61._8_4_ = auVar31._8_4_ * auVar28._8_4_;
      auVar61._12_4_ = auVar31._12_4_ * auVar28._12_4_;
      auVar61._16_4_ = auVar31._16_4_ * auVar28._16_4_;
      auVar61._20_4_ = auVar31._20_4_ * auVar28._20_4_;
      auVar61._24_4_ = auVar31._24_4_ * auVar28._24_4_;
      auVar61._28_4_ = auVar28._28_4_;
      auVar30 = vsubps_avx(auVar311,auVar31);
      auVar62._4_4_ = auVar30._4_4_ * auVar33._4_4_;
      auVar62._0_4_ = auVar30._0_4_ * auVar33._0_4_;
      auVar62._8_4_ = auVar30._8_4_ * auVar33._8_4_;
      auVar62._12_4_ = auVar30._12_4_ * auVar33._12_4_;
      auVar62._16_4_ = auVar30._16_4_ * auVar33._16_4_;
      auVar62._20_4_ = auVar30._20_4_ * auVar33._20_4_;
      auVar62._24_4_ = auVar30._24_4_ * auVar33._24_4_;
      auVar62._28_4_ = auVar235._28_4_;
      auVar44 = vsubps_avx(auVar62,auVar61);
      auVar63._4_4_ = auVar30._4_4_ * auVar32._4_4_;
      auVar63._0_4_ = auVar30._0_4_ * auVar32._0_4_;
      auVar63._8_4_ = auVar30._8_4_ * auVar32._8_4_;
      auVar63._12_4_ = auVar30._12_4_ * auVar32._12_4_;
      auVar63._16_4_ = auVar30._16_4_ * auVar32._16_4_;
      auVar63._20_4_ = auVar30._20_4_ * auVar32._20_4_;
      auVar63._24_4_ = auVar30._24_4_ * auVar32._24_4_;
      auVar63._28_4_ = auVar28._28_4_;
      auVar64._4_4_ = auVar31._4_4_ * auVar27._4_4_;
      auVar64._0_4_ = auVar31._0_4_ * auVar27._0_4_;
      auVar64._8_4_ = auVar31._8_4_ * auVar27._8_4_;
      auVar64._12_4_ = auVar31._12_4_ * auVar27._12_4_;
      auVar64._16_4_ = auVar31._16_4_ * auVar27._16_4_;
      auVar64._20_4_ = auVar31._20_4_ * auVar27._20_4_;
      auVar64._24_4_ = auVar31._24_4_ * auVar27._24_4_;
      auVar64._28_4_ = auVar27._28_4_;
      auVar27 = vsubps_avx(auVar64,auVar63);
      auVar156._0_4_ = auVar29._0_4_ * 0.0 + auVar27._0_4_ + auVar44._0_4_ * 0.0;
      auVar156._4_4_ = auVar29._4_4_ * 0.0 + auVar27._4_4_ + auVar44._4_4_ * 0.0;
      auVar156._8_4_ = auVar29._8_4_ * 0.0 + auVar27._8_4_ + auVar44._8_4_ * 0.0;
      auVar156._12_4_ = auVar29._12_4_ * 0.0 + auVar27._12_4_ + auVar44._12_4_ * 0.0;
      auVar156._16_4_ = auVar29._16_4_ * 0.0 + auVar27._16_4_ + auVar44._16_4_ * 0.0;
      auVar156._20_4_ = auVar29._20_4_ * 0.0 + auVar27._20_4_ + auVar44._20_4_ * 0.0;
      auVar156._24_4_ = auVar29._24_4_ * 0.0 + auVar27._24_4_ + auVar44._24_4_ * 0.0;
      auVar156._28_4_ = auVar27._28_4_ + auVar27._28_4_ + auVar44._28_4_;
      auVar44 = vcmpps_avx(auVar156,ZEXT432(0) << 0x20,2);
      auVar153 = vblendvps_avx(auVar153,_local_5e0,auVar44);
      auVar26 = vblendvps_avx(auVar26,_local_5a0,auVar44);
      auVar27 = vblendvps_avx(auVar25,auVar273,auVar44);
      auVar28 = vblendvps_avx(auVar31,auVar311,auVar44);
      auVar29 = vblendvps_avx(auVar32,auVar324,auVar44);
      auVar30 = vblendvps_avx(auVar33,auVar364,auVar44);
      auVar31 = vblendvps_avx(auVar311,auVar31,auVar44);
      auVar32 = vblendvps_avx(auVar324,auVar32,auVar44);
      _local_6a0 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
      _auStack_690 = auVar293._16_16_;
      auVar33 = vblendvps_avx(auVar364,auVar33,auVar44);
      auVar31 = vsubps_avx(auVar31,auVar153);
      auVar151 = vsubps_avx(auVar32,auVar26);
      auVar33 = vsubps_avx(auVar33,auVar27);
      auVar152 = vsubps_avx(auVar26,auVar29);
      fVar329 = auVar151._0_4_;
      fVar171 = auVar27._0_4_;
      fVar247 = auVar151._4_4_;
      fVar172 = auVar27._4_4_;
      auVar65._4_4_ = fVar172 * fVar247;
      auVar65._0_4_ = fVar171 * fVar329;
      fVar261 = auVar151._8_4_;
      fVar190 = auVar27._8_4_;
      auVar65._8_4_ = fVar190 * fVar261;
      fVar267 = auVar151._12_4_;
      fVar269 = auVar27._12_4_;
      auVar65._12_4_ = fVar269 * fVar267;
      fVar286 = auVar151._16_4_;
      fVar278 = auVar27._16_4_;
      auVar65._16_4_ = fVar278 * fVar286;
      fVar301 = auVar151._20_4_;
      fVar250 = auVar27._20_4_;
      auVar65._20_4_ = fVar250 * fVar301;
      fVar164 = auVar151._24_4_;
      fVar283 = auVar27._24_4_;
      auVar65._24_4_ = fVar283 * fVar164;
      auVar65._28_4_ = auVar32._28_4_;
      fVar243 = auVar26._0_4_;
      fVar227 = auVar33._0_4_;
      fVar248 = auVar26._4_4_;
      fVar287 = auVar33._4_4_;
      auVar66._4_4_ = fVar287 * fVar248;
      auVar66._0_4_ = fVar227 * fVar243;
      fVar262 = auVar26._8_4_;
      fVar266 = auVar33._8_4_;
      auVar66._8_4_ = fVar266 * fVar262;
      fVar276 = auVar26._12_4_;
      fVar268 = auVar33._12_4_;
      auVar66._12_4_ = fVar268 * fVar276;
      fVar288 = auVar26._16_4_;
      fVar277 = auVar33._16_4_;
      auVar66._16_4_ = fVar277 * fVar288;
      fVar303 = auVar26._20_4_;
      fVar280 = auVar33._20_4_;
      auVar66._20_4_ = fVar280 * fVar303;
      fVar166 = auVar26._24_4_;
      fVar282 = auVar33._24_4_;
      uVar146 = auVar25._28_4_;
      auVar66._24_4_ = fVar282 * fVar166;
      auVar66._28_4_ = uVar146;
      auVar32 = vsubps_avx(auVar66,auVar65);
      fVar336 = auVar153._0_4_;
      fVar249 = auVar153._4_4_;
      auVar67._4_4_ = fVar287 * fVar249;
      auVar67._0_4_ = fVar227 * fVar336;
      fVar263 = auVar153._8_4_;
      auVar67._8_4_ = fVar266 * fVar263;
      fVar279 = auVar153._12_4_;
      auVar67._12_4_ = fVar268 * fVar279;
      fVar300 = auVar153._16_4_;
      auVar67._16_4_ = fVar277 * fVar300;
      fVar229 = auVar153._20_4_;
      auVar67._20_4_ = fVar280 * fVar229;
      fVar168 = auVar153._24_4_;
      auVar67._24_4_ = fVar282 * fVar168;
      auVar67._28_4_ = uVar146;
      fVar245 = auVar31._0_4_;
      fVar251 = auVar31._4_4_;
      auVar68._4_4_ = fVar172 * fVar251;
      auVar68._0_4_ = fVar171 * fVar245;
      fVar264 = auVar31._8_4_;
      auVar68._8_4_ = fVar190 * fVar264;
      fVar281 = auVar31._12_4_;
      auVar68._12_4_ = fVar269 * fVar281;
      fVar228 = auVar31._16_4_;
      auVar68._16_4_ = fVar278 * fVar228;
      fVar189 = auVar31._20_4_;
      auVar68._20_4_ = fVar250 * fVar189;
      fVar169 = auVar31._24_4_;
      auVar68._24_4_ = fVar283 * fVar169;
      auVar68._28_4_ = auVar364._28_4_;
      auVar25 = vsubps_avx(auVar68,auVar67);
      auVar69._4_4_ = fVar248 * fVar251;
      auVar69._0_4_ = fVar243 * fVar245;
      auVar69._8_4_ = fVar262 * fVar264;
      auVar69._12_4_ = fVar276 * fVar281;
      auVar69._16_4_ = fVar288 * fVar228;
      auVar69._20_4_ = fVar303 * fVar189;
      auVar69._24_4_ = fVar166 * fVar169;
      auVar69._28_4_ = uVar146;
      auVar370._0_4_ = fVar336 * fVar329;
      auVar370._4_4_ = fVar249 * fVar247;
      auVar370._8_4_ = fVar263 * fVar261;
      auVar370._12_4_ = fVar279 * fVar267;
      auVar370._16_4_ = fVar300 * fVar286;
      auVar370._20_4_ = fVar229 * fVar301;
      auVar370._24_4_ = fVar168 * fVar164;
      auVar370._28_4_ = 0;
      auVar179 = vsubps_avx(auVar370,auVar69);
      auVar180 = vsubps_avx(auVar27,auVar30);
      fVar337 = auVar179._28_4_ + auVar25._28_4_;
      auVar184._0_4_ = auVar179._0_4_ + auVar25._0_4_ * 0.0 + auVar32._0_4_ * 0.0;
      auVar184._4_4_ = auVar179._4_4_ + auVar25._4_4_ * 0.0 + auVar32._4_4_ * 0.0;
      auVar184._8_4_ = auVar179._8_4_ + auVar25._8_4_ * 0.0 + auVar32._8_4_ * 0.0;
      auVar184._12_4_ = auVar179._12_4_ + auVar25._12_4_ * 0.0 + auVar32._12_4_ * 0.0;
      auVar184._16_4_ = auVar179._16_4_ + auVar25._16_4_ * 0.0 + auVar32._16_4_ * 0.0;
      auVar184._20_4_ = auVar179._20_4_ + auVar25._20_4_ * 0.0 + auVar32._20_4_ * 0.0;
      auVar184._24_4_ = auVar179._24_4_ + auVar25._24_4_ * 0.0 + auVar32._24_4_ * 0.0;
      auVar184._28_4_ = fVar337 + auVar32._28_4_;
      fVar285 = auVar152._0_4_;
      fVar305 = auVar152._4_4_;
      auVar70._4_4_ = fVar305 * auVar30._4_4_;
      auVar70._0_4_ = fVar285 * auVar30._0_4_;
      fVar207 = auVar152._8_4_;
      auVar70._8_4_ = fVar207 * auVar30._8_4_;
      fVar209 = auVar152._12_4_;
      auVar70._12_4_ = fVar209 * auVar30._12_4_;
      fVar211 = auVar152._16_4_;
      auVar70._16_4_ = fVar211 * auVar30._16_4_;
      fVar213 = auVar152._20_4_;
      auVar70._20_4_ = fVar213 * auVar30._20_4_;
      fVar226 = auVar152._24_4_;
      auVar70._24_4_ = fVar226 * auVar30._24_4_;
      auVar70._28_4_ = fVar337;
      fVar337 = auVar180._0_4_;
      fVar260 = auVar180._4_4_;
      auVar71._4_4_ = auVar29._4_4_ * fVar260;
      auVar71._0_4_ = auVar29._0_4_ * fVar337;
      fVar265 = auVar180._8_4_;
      auVar71._8_4_ = auVar29._8_4_ * fVar265;
      fVar284 = auVar180._12_4_;
      auVar71._12_4_ = auVar29._12_4_ * fVar284;
      fVar302 = auVar180._16_4_;
      auVar71._16_4_ = auVar29._16_4_ * fVar302;
      fVar304 = auVar180._20_4_;
      auVar71._20_4_ = auVar29._20_4_ * fVar304;
      fVar170 = auVar180._24_4_;
      auVar71._24_4_ = auVar29._24_4_ * fVar170;
      auVar71._28_4_ = auVar179._28_4_;
      auVar25 = vsubps_avx(auVar71,auVar70);
      auVar152 = vsubps_avx(auVar153,auVar28);
      fVar242 = auVar152._0_4_;
      fVar244 = auVar152._4_4_;
      auVar72._4_4_ = fVar244 * auVar30._4_4_;
      auVar72._0_4_ = fVar242 * auVar30._0_4_;
      fVar246 = auVar152._8_4_;
      auVar72._8_4_ = fVar246 * auVar30._8_4_;
      fVar299 = auVar152._12_4_;
      auVar72._12_4_ = fVar299 * auVar30._12_4_;
      fVar306 = auVar152._16_4_;
      auVar72._16_4_ = fVar306 * auVar30._16_4_;
      fVar314 = auVar152._20_4_;
      auVar72._20_4_ = fVar314 * auVar30._20_4_;
      fVar316 = auVar152._24_4_;
      auVar72._24_4_ = fVar316 * auVar30._24_4_;
      auVar72._28_4_ = auVar30._28_4_;
      auVar73._4_4_ = auVar28._4_4_ * fVar260;
      auVar73._0_4_ = auVar28._0_4_ * fVar337;
      auVar73._8_4_ = auVar28._8_4_ * fVar265;
      auVar73._12_4_ = auVar28._12_4_ * fVar284;
      auVar73._16_4_ = auVar28._16_4_ * fVar302;
      auVar73._20_4_ = auVar28._20_4_ * fVar304;
      auVar73._24_4_ = auVar28._24_4_ * fVar170;
      auVar73._28_4_ = auVar32._28_4_;
      auVar32 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar29._4_4_ * fVar244;
      auVar74._0_4_ = auVar29._0_4_ * fVar242;
      auVar74._8_4_ = auVar29._8_4_ * fVar246;
      auVar74._12_4_ = auVar29._12_4_ * fVar299;
      auVar74._16_4_ = auVar29._16_4_ * fVar306;
      auVar74._20_4_ = auVar29._20_4_ * fVar314;
      auVar74._24_4_ = auVar29._24_4_ * fVar316;
      auVar74._28_4_ = auVar30._28_4_;
      auVar75._4_4_ = auVar28._4_4_ * fVar305;
      auVar75._0_4_ = auVar28._0_4_ * fVar285;
      auVar75._8_4_ = auVar28._8_4_ * fVar207;
      auVar75._12_4_ = auVar28._12_4_ * fVar209;
      auVar75._16_4_ = auVar28._16_4_ * fVar211;
      auVar75._20_4_ = auVar28._20_4_ * fVar213;
      auVar75._24_4_ = auVar28._24_4_ * fVar226;
      auVar75._28_4_ = auVar28._28_4_;
      auVar28 = vsubps_avx(auVar75,auVar74);
      auVar238._0_4_ = auVar25._0_4_ * 0.0 + auVar28._0_4_ + auVar32._0_4_ * 0.0;
      auVar238._4_4_ = auVar25._4_4_ * 0.0 + auVar28._4_4_ + auVar32._4_4_ * 0.0;
      auVar238._8_4_ = auVar25._8_4_ * 0.0 + auVar28._8_4_ + auVar32._8_4_ * 0.0;
      auVar238._12_4_ = auVar25._12_4_ * 0.0 + auVar28._12_4_ + auVar32._12_4_ * 0.0;
      auVar238._16_4_ = auVar25._16_4_ * 0.0 + auVar28._16_4_ + auVar32._16_4_ * 0.0;
      auVar238._20_4_ = auVar25._20_4_ * 0.0 + auVar28._20_4_ + auVar32._20_4_ * 0.0;
      auVar238._24_4_ = auVar25._24_4_ * 0.0 + auVar28._24_4_ + auVar32._24_4_ * 0.0;
      auVar238._28_4_ = auVar28._28_4_ + auVar28._28_4_ + auVar32._28_4_;
      auVar28 = vmaxps_avx(auVar184,auVar238);
      auVar28 = vcmpps_avx(auVar28,ZEXT832(0) << 0x20,2);
      auVar216 = vpackssdw_avx(auVar28._0_16_,auVar28._16_16_);
      auVar216 = vpand_avx(auVar216,_local_6a0);
      auVar217 = vpmovsxwd_avx(auVar216);
      auVar218 = vpunpckhwd_avx(auVar216,auVar216);
      auVar222._16_16_ = auVar218;
      auVar222._0_16_ = auVar217;
      if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar222 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar222 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar222 >> 0x7f,0) == '\0') &&
            (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar218 >> 0x3f,0) == '\0') &&
          (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar218[0xf]
         ) {
LAB_00b49d89:
        auVar256._8_8_ = uStack_518;
        auVar256._0_8_ = local_520;
        auVar256._16_8_ = uStack_510;
        auVar256._24_8_ = uStack_508;
        auVar225 = ZEXT3264(auVar222);
        auVar188 = ZEXT3264(local_560);
        auVar259 = ZEXT3264(local_580);
      }
      else {
        auVar76._4_4_ = fVar260 * fVar247;
        auVar76._0_4_ = fVar337 * fVar329;
        auVar76._8_4_ = fVar265 * fVar261;
        auVar76._12_4_ = fVar284 * fVar267;
        auVar76._16_4_ = fVar302 * fVar286;
        auVar76._20_4_ = fVar304 * fVar301;
        auVar76._24_4_ = fVar170 * fVar164;
        auVar76._28_4_ = auVar218._12_4_;
        auVar343._0_4_ = fVar285 * fVar227;
        auVar343._4_4_ = fVar305 * fVar287;
        auVar343._8_4_ = fVar207 * fVar266;
        auVar343._12_4_ = fVar209 * fVar268;
        auVar343._16_4_ = fVar211 * fVar277;
        auVar343._20_4_ = fVar213 * fVar280;
        auVar343._24_4_ = fVar226 * fVar282;
        auVar343._28_4_ = 0;
        auVar28 = vsubps_avx(auVar343,auVar76);
        auVar77._4_4_ = fVar244 * fVar287;
        auVar77._0_4_ = fVar242 * fVar227;
        auVar77._8_4_ = fVar246 * fVar266;
        auVar77._12_4_ = fVar299 * fVar268;
        auVar77._16_4_ = fVar306 * fVar277;
        auVar77._20_4_ = fVar314 * fVar280;
        auVar77._24_4_ = fVar316 * fVar282;
        auVar77._28_4_ = auVar33._28_4_;
        auVar78._4_4_ = fVar260 * fVar251;
        auVar78._0_4_ = fVar337 * fVar245;
        auVar78._8_4_ = fVar265 * fVar264;
        auVar78._12_4_ = fVar284 * fVar281;
        auVar78._16_4_ = fVar302 * fVar228;
        auVar78._20_4_ = fVar304 * fVar189;
        auVar78._24_4_ = fVar170 * fVar169;
        auVar78._28_4_ = auVar180._28_4_;
        auVar30 = vsubps_avx(auVar78,auVar77);
        auVar79._4_4_ = fVar305 * fVar251;
        auVar79._0_4_ = fVar285 * fVar245;
        auVar79._8_4_ = fVar207 * fVar264;
        auVar79._12_4_ = fVar209 * fVar281;
        auVar79._16_4_ = fVar211 * fVar228;
        auVar79._20_4_ = fVar213 * fVar189;
        auVar79._24_4_ = fVar226 * fVar169;
        auVar79._28_4_ = auVar184._28_4_;
        auVar80._4_4_ = fVar244 * fVar247;
        auVar80._0_4_ = fVar242 * fVar329;
        auVar80._8_4_ = fVar246 * fVar261;
        auVar80._12_4_ = fVar299 * fVar267;
        auVar80._16_4_ = fVar306 * fVar286;
        auVar80._20_4_ = fVar314 * fVar301;
        auVar80._24_4_ = fVar316 * fVar164;
        auVar80._28_4_ = auVar151._28_4_;
        auVar32 = vsubps_avx(auVar80,auVar79);
        auVar294._0_4_ = auVar28._0_4_ * 0.0 + auVar32._0_4_ + auVar30._0_4_ * 0.0;
        auVar294._4_4_ = auVar28._4_4_ * 0.0 + auVar32._4_4_ + auVar30._4_4_ * 0.0;
        auVar294._8_4_ = auVar28._8_4_ * 0.0 + auVar32._8_4_ + auVar30._8_4_ * 0.0;
        auVar294._12_4_ = auVar28._12_4_ * 0.0 + auVar32._12_4_ + auVar30._12_4_ * 0.0;
        auVar294._16_4_ = auVar28._16_4_ * 0.0 + auVar32._16_4_ + auVar30._16_4_ * 0.0;
        auVar294._20_4_ = auVar28._20_4_ * 0.0 + auVar32._20_4_ + auVar30._20_4_ * 0.0;
        auVar294._24_4_ = auVar28._24_4_ * 0.0 + auVar32._24_4_ + auVar30._24_4_ * 0.0;
        auVar294._28_4_ = auVar151._28_4_ + auVar32._28_4_ + auVar184._28_4_;
        auVar29 = vrcpps_avx(auVar294);
        fVar329 = auVar29._0_4_;
        fVar245 = auVar29._4_4_;
        auVar81._4_4_ = auVar294._4_4_ * fVar245;
        auVar81._0_4_ = auVar294._0_4_ * fVar329;
        fVar337 = auVar29._8_4_;
        auVar81._8_4_ = auVar294._8_4_ * fVar337;
        fVar247 = auVar29._12_4_;
        auVar81._12_4_ = auVar294._12_4_ * fVar247;
        fVar251 = auVar29._16_4_;
        auVar81._16_4_ = auVar294._16_4_ * fVar251;
        fVar260 = auVar29._20_4_;
        auVar81._20_4_ = auVar294._20_4_ * fVar260;
        fVar261 = auVar29._24_4_;
        auVar81._24_4_ = auVar294._24_4_ * fVar261;
        auVar81._28_4_ = auVar180._28_4_;
        auVar344._8_4_ = 0x3f800000;
        auVar344._0_8_ = 0x3f8000003f800000;
        auVar344._12_4_ = 0x3f800000;
        auVar344._16_4_ = 0x3f800000;
        auVar344._20_4_ = 0x3f800000;
        auVar344._24_4_ = 0x3f800000;
        auVar344._28_4_ = 0x3f800000;
        auVar33 = vsubps_avx(auVar344,auVar81);
        fVar329 = auVar33._0_4_ * fVar329 + fVar329;
        fVar245 = auVar33._4_4_ * fVar245 + fVar245;
        fVar337 = auVar33._8_4_ * fVar337 + fVar337;
        fVar247 = auVar33._12_4_ * fVar247 + fVar247;
        fVar251 = auVar33._16_4_ * fVar251 + fVar251;
        fVar260 = auVar33._20_4_ * fVar260 + fVar260;
        fVar261 = auVar33._24_4_ * fVar261 + fVar261;
        auVar82._4_4_ =
             (auVar28._4_4_ * fVar249 + auVar30._4_4_ * fVar248 + auVar32._4_4_ * fVar172) * fVar245
        ;
        auVar82._0_4_ =
             (auVar28._0_4_ * fVar336 + auVar30._0_4_ * fVar243 + auVar32._0_4_ * fVar171) * fVar329
        ;
        auVar82._8_4_ =
             (auVar28._8_4_ * fVar263 + auVar30._8_4_ * fVar262 + auVar32._8_4_ * fVar190) * fVar337
        ;
        auVar82._12_4_ =
             (auVar28._12_4_ * fVar279 + auVar30._12_4_ * fVar276 + auVar32._12_4_ * fVar269) *
             fVar247;
        auVar82._16_4_ =
             (auVar28._16_4_ * fVar300 + auVar30._16_4_ * fVar288 + auVar32._16_4_ * fVar278) *
             fVar251;
        auVar82._20_4_ =
             (auVar28._20_4_ * fVar229 + auVar30._20_4_ * fVar303 + auVar32._20_4_ * fVar250) *
             fVar260;
        auVar82._24_4_ =
             (auVar28._24_4_ * fVar168 + auVar30._24_4_ * fVar166 + auVar32._24_4_ * fVar283) *
             fVar261;
        auVar82._28_4_ = auVar153._28_4_ + auVar31._28_4_ + auVar27._28_4_;
        auVar217 = vpermilps_avx(ZEXT416(uVar140),0);
        auVar223._16_16_ = auVar217;
        auVar223._0_16_ = auVar217;
        auVar27 = vcmpps_avx(auVar223,auVar82,2);
        uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar254._4_4_ = uVar146;
        auVar254._0_4_ = uVar146;
        auVar254._8_4_ = uVar146;
        auVar254._12_4_ = uVar146;
        auVar254._16_4_ = uVar146;
        auVar254._20_4_ = uVar146;
        auVar254._24_4_ = uVar146;
        auVar254._28_4_ = uVar146;
        auVar28 = vcmpps_avx(auVar82,auVar254,2);
        auVar27 = vandps_avx(auVar28,auVar27);
        auVar217 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
        auVar216 = vpand_avx(auVar216,auVar217);
        auVar217 = vpmovsxwd_avx(auVar216);
        auVar218 = vpshufd_avx(auVar216,0xee);
        auVar218 = vpmovsxwd_avx(auVar218);
        auVar222._16_16_ = auVar218;
        auVar222._0_16_ = auVar217;
        if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar222 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar222 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar222 >> 0x7f,0) == '\0') &&
              (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar218 >> 0x3f,0) == '\0') &&
            (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar218[0xf]) goto LAB_00b49d89;
        auVar27 = vcmpps_avx(ZEXT832(0) << 0x20,auVar294,4);
        auVar217 = vpackssdw_avx(auVar27._0_16_,auVar27._16_16_);
        auVar216 = vpand_avx(auVar216,auVar217);
        auVar217 = vpmovsxwd_avx(auVar216);
        auVar216 = vpunpckhwd_avx(auVar216,auVar216);
        auVar225 = ZEXT1664(auVar216);
        auVar274._16_16_ = auVar216;
        auVar274._0_16_ = auVar217;
        auVar256._8_8_ = uStack_518;
        auVar256._0_8_ = local_520;
        auVar256._16_8_ = uStack_510;
        auVar256._24_8_ = uStack_508;
        auVar188 = ZEXT3264(local_560);
        auVar259 = ZEXT3264(local_580);
        if ((((((((auVar274 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar274 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar274 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar274 >> 0x7f,0) != '\0') ||
              (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar216 >> 0x3f,0) != '\0') ||
            (auVar274 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar216[0xf] < '\0') {
          auVar224._0_4_ = auVar184._0_4_ * fVar329;
          auVar224._4_4_ = auVar184._4_4_ * fVar245;
          auVar224._8_4_ = auVar184._8_4_ * fVar337;
          auVar224._12_4_ = auVar184._12_4_ * fVar247;
          auVar224._16_4_ = auVar184._16_4_ * fVar251;
          auVar224._20_4_ = auVar184._20_4_ * fVar260;
          auVar224._24_4_ = auVar184._24_4_ * fVar261;
          auVar224._28_4_ = 0;
          auVar83._4_4_ = auVar238._4_4_ * fVar245;
          auVar83._0_4_ = auVar238._0_4_ * fVar329;
          auVar83._8_4_ = auVar238._8_4_ * fVar337;
          auVar83._12_4_ = auVar238._12_4_ * fVar247;
          auVar83._16_4_ = auVar238._16_4_ * fVar251;
          auVar83._20_4_ = auVar238._20_4_ * fVar260;
          auVar83._24_4_ = auVar238._24_4_ * fVar261;
          auVar83._28_4_ = auVar33._28_4_ + auVar29._28_4_;
          auVar255._8_4_ = 0x3f800000;
          auVar255._0_8_ = 0x3f8000003f800000;
          auVar255._12_4_ = 0x3f800000;
          auVar255._16_4_ = 0x3f800000;
          auVar255._20_4_ = 0x3f800000;
          auVar255._24_4_ = 0x3f800000;
          auVar255._28_4_ = 0x3f800000;
          auVar27 = vsubps_avx(auVar255,auVar224);
          auVar27 = vblendvps_avx(auVar27,auVar224,auVar44);
          auVar188 = ZEXT3264(auVar27);
          auVar27 = vsubps_avx(auVar255,auVar83);
          auVar225 = ZEXT3264(auVar27);
          _local_380 = vblendvps_avx(auVar27,auVar83,auVar44);
          auVar259 = ZEXT3264(auVar82);
          auVar256 = auVar274;
        }
      }
      local_580 = auVar259._0_32_;
      local_560 = auVar188._0_32_;
      if ((((((((auVar256 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar256 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar256 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar256 >> 0x7f,0) != '\0') ||
            (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar256 >> 0xbf,0) != '\0') ||
          (auVar256 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar256[0x1f] < '\0') {
        auVar27 = vsubps_avx(local_7a0,_local_860);
        local_860._0_4_ = (float)local_860._0_4_ + auVar188._0_4_ * auVar27._0_4_;
        local_860._4_4_ = (float)local_860._4_4_ + auVar188._4_4_ * auVar27._4_4_;
        fStack_858 = fStack_858 + auVar188._8_4_ * auVar27._8_4_;
        fStack_854 = fStack_854 + auVar188._12_4_ * auVar27._12_4_;
        fStack_850 = fStack_850 + auVar188._16_4_ * auVar27._16_4_;
        fStack_84c = fStack_84c + auVar188._20_4_ * auVar27._20_4_;
        fStack_848 = fStack_848 + auVar188._24_4_ * auVar27._24_4_;
        fStack_844 = fStack_844 + auVar27._28_4_;
        fVar329 = *(float *)((long)local_6d8->ray_space + k * 4 + -0x10);
        auVar84._4_4_ = ((float)local_860._4_4_ + (float)local_860._4_4_) * fVar329;
        auVar84._0_4_ = ((float)local_860._0_4_ + (float)local_860._0_4_) * fVar329;
        auVar84._8_4_ = (fStack_858 + fStack_858) * fVar329;
        auVar84._12_4_ = (fStack_854 + fStack_854) * fVar329;
        auVar84._16_4_ = (fStack_850 + fStack_850) * fVar329;
        auVar84._20_4_ = (fStack_84c + fStack_84c) * fVar329;
        auVar84._24_4_ = (fStack_848 + fStack_848) * fVar329;
        auVar84._28_4_ = fStack_844 + fStack_844;
        auVar27 = vcmpps_avx(local_580,auVar84,6);
        auVar28 = auVar256 & auVar27;
        auVar347 = ZEXT3264(auVar236);
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0x7f,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar28 >> 0xbf,0) != '\0') ||
            (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar28[0x1f] < '\0') {
          local_240 = vandps_avx(auVar27,auVar256);
          local_2e0._0_4_ = (float)local_380._0_4_ + (float)local_380._0_4_ + -1.0;
          local_2e0._4_4_ = (float)local_380._4_4_ + (float)local_380._4_4_ + -1.0;
          fStack_2d8 = (float)uStack_378 + (float)uStack_378 + -1.0;
          fStack_2d4 = uStack_378._4_4_ + uStack_378._4_4_ + -1.0;
          fStack_2d0 = (float)uStack_370 + (float)uStack_370 + -1.0;
          fStack_2cc = uStack_370._4_4_ + uStack_370._4_4_ + -1.0;
          fStack_2c8 = (float)uStack_368 + (float)uStack_368 + -1.0;
          fStack_2c4 = uStack_368._4_4_ + uStack_368._4_4_ + -1.0;
          local_2a0 = 0;
          uStack_288 = uStack_6e8;
          uStack_278 = uStack_6f8;
          uStack_268 = uStack_5e8;
          uStack_258 = uStack_5f8;
          local_380._4_4_ = local_2e0._4_4_;
          local_380._0_4_ = local_2e0._0_4_;
          uStack_378._0_4_ = fStack_2d8;
          uStack_378._4_4_ = fStack_2d4;
          uStack_370._0_4_ = fStack_2d0;
          uStack_370._4_4_ = fStack_2cc;
          auVar178 = _local_380;
          uStack_368._0_4_ = fStack_2c8;
          uStack_368._4_4_ = fStack_2c4;
          auVar27 = _local_380;
          if ((pGVar145->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            uVar144 = 0;
          }
          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                  (uVar144 = CONCAT71((int7)(uVar144 >> 8),1),
                  pGVar145->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar193._0_4_ = 1.0 / (float)local_610._0_4_;
            auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar197 = vshufps_avx(auVar193,auVar193,0);
            local_220[0] = auVar197._0_4_ * (auVar188._0_4_ + 0.0);
            local_220[1] = auVar197._4_4_ * (auVar188._4_4_ + 1.0);
            local_220[2] = auVar197._8_4_ * (auVar188._8_4_ + 2.0);
            local_220[3] = auVar197._12_4_ * (auVar188._12_4_ + 3.0);
            fStack_210 = auVar197._0_4_ * (auVar188._16_4_ + 4.0);
            fStack_20c = auVar197._4_4_ * (auVar188._20_4_ + 5.0);
            fStack_208 = auVar197._8_4_ * (auVar188._24_4_ + 6.0);
            fStack_204 = auVar188._28_4_ + 7.0;
            uStack_370 = auVar178._16_8_;
            uStack_368 = auVar27._24_8_;
            local_200 = local_380;
            uStack_1f8 = uStack_378;
            uStack_1f0 = uStack_370;
            uStack_1e8 = uStack_368;
            local_1e0 = local_580;
            uVar146 = vmovmskps_avx(local_240);
            uVar144 = CONCAT44((int)(uVar144 >> 0x20),uVar146);
            uVar142 = 0;
            if (uVar144 != 0) {
              for (; (uVar144 >> uVar142 & 1) == 0; uVar142 = uVar142 + 1) {
              }
            }
            _local_660 = vshufps_avx(ZEXT416(uVar19),ZEXT416(uVar19),0);
            _auStack_650 = auVar153._16_16_;
            _local_740 = vpermilps_avx(ZEXT416(uVar20),0);
            _auStack_730 = auVar26._16_16_;
            _local_760 = auVar236;
            _local_380 = auVar27;
            local_300 = local_560;
            local_2c0 = local_580;
            local_29c = uVar21;
            local_290 = local_6f0;
            local_280 = local_700;
            local_270 = local_5f0;
            local_260 = local_600;
            while( true ) {
              auVar236 = auVar347._0_32_;
              if (uVar144 == 0) break;
              uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
              local_400 = local_220[uVar142];
              local_3f0 = *(undefined4 *)((long)&local_200 + uVar142 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar142 * 4);
              fVar243 = 1.0 - local_400;
              fVar329 = local_400 * 3.0;
              auVar197 = ZEXT416((uint)((fVar243 * -2.0 * local_400 + local_400 * local_400) * 0.5))
              ;
              auVar197 = vshufps_avx(auVar197,auVar197,0);
              auVar216 = ZEXT416((uint)(((fVar243 + fVar243) * (fVar329 + 2.0) +
                                        fVar243 * fVar243 * -3.0) * 0.5));
              auVar216 = vshufps_avx(auVar216,auVar216,0);
              auVar217 = ZEXT416((uint)(((local_400 + local_400) * (fVar329 + -5.0) +
                                        local_400 * fVar329) * 0.5));
              auVar217 = vshufps_avx(auVar217,auVar217,0);
              local_6d0.context = context->user;
              auVar218 = ZEXT416((uint)((local_400 * (fVar243 + fVar243) - fVar243 * fVar243) * 0.5)
                                );
              auVar218 = vshufps_avx(auVar218,auVar218,0);
              auVar194._0_4_ =
                   auVar218._0_4_ * (float)local_6f0._0_4_ +
                   auVar217._0_4_ * (float)local_700._0_4_ +
                   auVar197._0_4_ * (float)local_600._0_4_ + auVar216._0_4_ * (float)local_5f0._0_4_
              ;
              auVar194._4_4_ =
                   auVar218._4_4_ * (float)local_6f0._4_4_ +
                   auVar217._4_4_ * (float)local_700._4_4_ +
                   auVar197._4_4_ * (float)local_600._4_4_ + auVar216._4_4_ * (float)local_5f0._4_4_
              ;
              auVar194._8_4_ =
                   auVar218._8_4_ * (float)uStack_6e8 +
                   auVar217._8_4_ * (float)uStack_6f8 +
                   auVar197._8_4_ * (float)uStack_5f8 + auVar216._8_4_ * (float)uStack_5e8;
              auVar194._12_4_ =
                   auVar218._12_4_ * uStack_6e8._4_4_ +
                   auVar217._12_4_ * uStack_6f8._4_4_ +
                   auVar197._12_4_ * uStack_5f8._4_4_ + auVar216._12_4_ * uStack_5e8._4_4_;
              local_430 = (RTCHitN  [16])vshufps_avx(auVar194,auVar194,0);
              local_420 = vshufps_avx(auVar194,auVar194,0x55);
              auVar225 = ZEXT1664(local_420);
              local_410 = vshufps_avx(auVar194,auVar194,0xaa);
              local_3e0 = local_740;
              uStack_3d8 = uStack_738;
              local_3d0 = _local_660;
              vcmpps_avx(ZEXT1632(_local_660),ZEXT1632(_local_660),0xf);
              uStack_3bc = (local_6d0.context)->instID[0];
              local_3c0 = uStack_3bc;
              uStack_3b8 = uStack_3bc;
              uStack_3b4 = uStack_3bc;
              uStack_3b0 = (local_6d0.context)->instPrimID[0];
              uStack_3ac = uStack_3b0;
              uStack_3a8 = uStack_3b0;
              uStack_3a4 = uStack_3b0;
              local_7c0 = *local_6e0;
              local_6d0.valid = (int *)local_7c0;
              local_6d0.geometryUserPtr = pGVar145->userPtr;
              local_6d0.hit = local_430;
              local_6d0.N = 4;
              local_7a0._0_8_ = uVar142;
              local_6a0._0_4_ = uVar146;
              local_6d0.ray = (RTCRayN *)ray;
              fStack_3fc = local_400;
              fStack_3f8 = local_400;
              fStack_3f4 = local_400;
              uStack_3ec = local_3f0;
              uStack_3e8 = local_3f0;
              uStack_3e4 = local_3f0;
              if (pGVar145->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar225 = ZEXT1664(local_420);
                (*pGVar145->occlusionFilterN)(&local_6d0);
                auVar259 = ZEXT3264(local_580);
                auVar188 = ZEXT3264(local_560);
                uVar142 = local_7a0._0_8_;
                uVar146 = local_6a0._0_4_;
                fVar148 = (float)local_720._0_4_;
                fVar163 = (float)local_720._4_4_;
                fVar165 = fStack_718;
                fVar167 = fStack_714;
                fVar230 = fStack_710;
                fVar162 = fStack_70c;
                fVar241 = fStack_708;
              }
              if (local_7c0 == (undefined1  [16])0x0) {
                auVar197 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                auVar197 = auVar197 ^ _DAT_01f46b70;
                auVar347 = ZEXT3264(_local_760);
              }
              else {
                p_Var24 = context->args->filter;
                if (p_Var24 == (RTCFilterFunctionN)0x0) {
                  auVar347 = ZEXT3264(_local_760);
                }
                else {
                  auVar347 = ZEXT3264(_local_760);
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((pGVar145->field_8).field_0x2 & 0x40) != 0)) {
                    auVar225 = ZEXT1664(auVar225._0_16_);
                    (*p_Var24)(&local_6d0);
                    auVar347 = ZEXT3264(_local_760);
                    auVar259 = ZEXT3264(local_580);
                    auVar188 = ZEXT3264(local_560);
                    uVar142 = local_7a0._0_8_;
                    uVar146 = local_6a0._0_4_;
                    fVar148 = (float)local_720._0_4_;
                    fVar163 = (float)local_720._4_4_;
                    fVar165 = fStack_718;
                    fVar167 = fStack_714;
                    fVar230 = fStack_710;
                    fVar162 = fStack_70c;
                    fVar241 = fStack_708;
                  }
                }
                auVar216 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                auVar197 = auVar216 ^ _DAT_01f46b70;
                auVar195._8_4_ = 0xff800000;
                auVar195._0_8_ = 0xff800000ff800000;
                auVar195._12_4_ = 0xff800000;
                auVar216 = vblendvps_avx(auVar195,*(undefined1 (*) [16])(local_6d0.ray + 0x80),
                                         auVar216);
                *(undefined1 (*) [16])(local_6d0.ray + 0x80) = auVar216;
              }
              auVar236 = auVar347._0_32_;
              auVar175._8_8_ = 0x100000001;
              auVar175._0_8_ = 0x100000001;
              if ((auVar175 & auVar197) != (undefined1  [16])0x0) {
                uVar144 = CONCAT71((int7)(uVar144 >> 8),1);
                local_560 = auVar188._0_32_;
                local_580 = auVar259._0_32_;
                goto LAB_00b48f03;
              }
              *(undefined4 *)(ray + k * 4 + 0x80) = uVar146;
              uVar144 = uVar144 ^ 1L << (uVar142 & 0x3f);
              uVar142 = 0;
              if (uVar144 != 0) {
                for (; (uVar144 >> uVar142 & 1) == 0; uVar142 = uVar142 + 1) {
                }
              }
            }
            uVar144 = 0;
            local_560 = auVar188._0_32_;
            local_580 = auVar259._0_32_;
          }
LAB_00b48f03:
          auVar188 = ZEXT1664(local_780._0_16_);
          goto LAB_00b48933;
        }
      }
      uVar144 = 0;
      auVar188 = ZEXT1664(auVar197);
    }
LAB_00b48933:
    auVar347 = ZEXT3264(auVar204);
    auVar259 = ZEXT3264(auVar205);
    if (8 < (int)uVar21) {
      auVar197 = vpshufd_avx(ZEXT416(uVar21),0);
      local_4c0 = auVar197._0_4_;
      fStack_4bc = auVar197._4_4_;
      fStack_4b8 = auVar197._8_4_;
      fStack_4b4 = auVar197._12_4_;
      auVar197 = vshufps_avx(auVar188._0_16_,auVar188._0_16_,0);
      local_340._16_16_ = auVar197;
      local_340._0_16_ = auVar197;
      auVar197 = vpermilps_avx(ZEXT416(uVar140),0);
      local_360._16_16_ = auVar197;
      local_360._0_16_ = auVar197;
      auVar150._0_4_ = 1.0 / (float)local_610._0_4_;
      auVar150._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar197 = vshufps_avx(auVar150,auVar150,0);
      register0x00001210 = auVar197;
      _local_140 = auVar197;
      local_610 = vshufps_avx(ZEXT416((uint)local_7a8),ZEXT416((uint)local_7a8),0);
      local_310 = vpermilps_avx(local_680._0_16_,0);
      auVar161 = ZEXT1664(local_310);
      auVar326 = ZEXT3264(_local_640);
      _local_760 = auVar236;
      for (lVar147 = 8; lVar147 < (int)uVar21; lVar147 = lVar147 + 8) {
        pauVar7 = (undefined1 (*) [28])(catmullrom_basis0 + lVar147 * 4 + lVar141);
        fVar329 = *(float *)*pauVar7;
        fVar336 = *(float *)(*pauVar7 + 4);
        fVar245 = *(float *)(*pauVar7 + 8);
        fVar247 = *(float *)(*pauVar7 + 0xc);
        fVar248 = *(float *)(*pauVar7 + 0x10);
        fVar251 = *(float *)(*pauVar7 + 0x14);
        fVar260 = *(float *)(*pauVar7 + 0x18);
        auVar137 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar141 + 0x22047f0 + lVar147 * 4);
        fVar262 = *(float *)*pauVar7;
        fVar263 = *(float *)(*pauVar7 + 4);
        fVar264 = *(float *)(*pauVar7 + 8);
        fVar267 = *(float *)(*pauVar7 + 0xc);
        fVar276 = *(float *)(*pauVar7 + 0x10);
        fVar279 = *(float *)(*pauVar7 + 0x14);
        fVar284 = *(float *)(*pauVar7 + 0x18);
        auVar136 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar141 + 0x2204c74 + lVar147 * 4);
        fVar286 = *(float *)*pauVar7;
        fVar288 = *(float *)(*pauVar7 + 4);
        fVar228 = *(float *)(*pauVar7 + 8);
        fVar302 = *(float *)(*pauVar7 + 0xc);
        fVar301 = *(float *)(*pauVar7 + 0x10);
        fVar303 = *(float *)(*pauVar7 + 0x14);
        fVar229 = *(float *)(*pauVar7 + 0x18);
        auVar135 = *pauVar7;
        pauVar7 = (undefined1 (*) [28])(lVar141 + 0x22050f8 + lVar147 * 4);
        fVar189 = *(float *)*pauVar7;
        fVar304 = *(float *)(*pauVar7 + 4);
        fVar164 = *(float *)(*pauVar7 + 8);
        fVar166 = *(float *)(*pauVar7 + 0xc);
        fVar168 = *(float *)(*pauVar7 + 0x10);
        fVar169 = *(float *)(*pauVar7 + 0x14);
        fVar170 = *(float *)(*pauVar7 + 0x18);
        auVar134 = *pauVar7;
        fVar171 = auVar225._28_4_;
        fVar305 = auVar347._0_4_;
        fVar207 = auVar347._4_4_;
        fVar209 = auVar347._8_4_;
        fVar211 = auVar347._12_4_;
        fVar213 = auVar347._16_4_;
        fVar226 = auVar347._20_4_;
        fVar227 = auVar347._24_4_;
        fStack_844 = fVar171 + *(float *)pauVar7[1];
        fVar250 = fVar171 + fStack_844;
        local_860._0_4_ =
             (float)local_160._0_4_ * fVar329 +
             fVar262 * (float)local_480._0_4_ +
             auVar326._0_4_ * fVar286 + (float)local_460._0_4_ * fVar189;
        local_860._4_4_ =
             (float)local_160._4_4_ * fVar336 +
             fVar263 * (float)local_480._4_4_ +
             auVar326._4_4_ * fVar288 + (float)local_460._4_4_ * fVar304;
        fStack_858 = fStack_158 * fVar245 +
                     fVar264 * fStack_478 + auVar326._8_4_ * fVar228 + fStack_458 * fVar164;
        fStack_854 = fStack_154 * fVar247 +
                     fVar267 * fStack_474 + auVar326._12_4_ * fVar302 + fStack_454 * fVar166;
        fStack_850 = fStack_150 * fVar248 +
                     fVar276 * fStack_470 + auVar326._16_4_ * fVar301 + fStack_450 * fVar168;
        fStack_84c = fStack_14c * fVar251 +
                     fVar279 * fStack_46c + auVar326._20_4_ * fVar303 + fStack_44c * fVar169;
        fStack_848 = fStack_148 * fVar260 +
                     fVar284 * fStack_468 + auVar326._24_4_ * fVar229 + fStack_448 * fVar170;
        fStack_844 = fStack_844 + fVar171 + fVar171 + auVar161._28_4_;
        fVar243 = auVar259._0_4_;
        fVar337 = auVar259._4_4_;
        fVar249 = auVar259._8_4_;
        fVar261 = auVar259._12_4_;
        fVar265 = auVar259._16_4_;
        fVar281 = auVar259._20_4_;
        fVar300 = auVar259._24_4_;
        local_780._0_4_ =
             fVar329 * fVar243 + fVar148 * fVar262 + fVar305 * fVar286 + fVar338 * fVar189;
        local_780._4_4_ =
             fVar336 * fVar337 + fVar163 * fVar263 + fVar207 * fVar288 + fVar348 * fVar304;
        local_780._8_4_ =
             fVar245 * fVar249 + fVar165 * fVar264 + fVar209 * fVar228 + fVar349 * fVar164;
        local_780._12_4_ =
             fVar247 * fVar261 + fVar167 * fVar267 + fVar211 * fVar302 + fVar350 * fVar166;
        local_780._16_4_ =
             fVar248 * fVar265 + fVar230 * fVar276 + fVar213 * fVar301 + fVar338 * fVar168;
        local_780._20_4_ =
             fVar251 * fVar281 + fVar162 * fVar279 + fVar226 * fVar303 + fVar348 * fVar169;
        local_780._24_4_ =
             fVar260 * fVar300 + fVar241 * fVar284 + fVar227 * fVar229 + fVar349 * fVar170;
        local_780._28_4_ = fStack_844 + fVar171 + fVar171 + auVar188._28_4_;
        auVar225 = ZEXT3264(local_780);
        local_840._0_4_ =
             fVar329 * (float)local_e0._0_4_ +
             (float)local_c0._0_4_ * fVar262 +
             fVar286 * (float)local_180._0_4_ + (float)local_a0._0_4_ * fVar189;
        local_840._4_4_ =
             fVar336 * (float)local_e0._4_4_ +
             (float)local_c0._4_4_ * fVar263 +
             fVar288 * (float)local_180._4_4_ + (float)local_a0._4_4_ * fVar304;
        fStack_838 = fVar245 * fStack_d8 +
                     fStack_b8 * fVar264 + fVar228 * fStack_178 + fStack_98 * fVar164;
        fStack_834 = fVar247 * fStack_d4 +
                     fStack_b4 * fVar267 + fVar302 * fStack_174 + fStack_94 * fVar166;
        fStack_830 = fVar248 * fStack_d0 +
                     fStack_b0 * fVar276 + fVar301 * fStack_170 + fStack_90 * fVar168;
        fStack_82c = fVar251 * fStack_cc +
                     fStack_ac * fVar279 + fVar303 * fStack_16c + fStack_8c * fVar169;
        fStack_828 = fVar260 * fStack_c8 +
                     fStack_a8 * fVar284 + fVar229 * fStack_168 + fStack_88 * fVar170;
        fStack_824 = fStack_844 + fVar250;
        pfVar1 = (float *)(catmullrom_basis1 + lVar147 * 4 + lVar141);
        fVar303 = *pfVar1;
        fVar229 = pfVar1[1];
        fVar189 = pfVar1[2];
        fVar304 = pfVar1[3];
        fVar164 = pfVar1[4];
        fVar166 = pfVar1[5];
        fVar168 = pfVar1[6];
        pfVar2 = (float *)(lVar141 + 0x2206c10 + lVar147 * 4);
        fVar169 = *pfVar2;
        fVar170 = pfVar2[1];
        fVar171 = pfVar2[2];
        fVar172 = pfVar2[3];
        fVar190 = pfVar2[4];
        fVar269 = pfVar2[5];
        fVar278 = pfVar2[6];
        auVar153 = *(undefined1 (*) [32])(lVar141 + 0x2207094 + lVar147 * 4);
        auVar161 = ZEXT3264(auVar153);
        auVar26 = *(undefined1 (*) [32])(lVar141 + 0x2207518 + lVar147 * 4);
        auVar188 = ZEXT3264(auVar26);
        fVar336 = auVar26._0_4_;
        fVar247 = auVar26._4_4_;
        fVar251 = auVar26._8_4_;
        fVar262 = auVar26._12_4_;
        fVar267 = auVar26._16_4_;
        fVar284 = auVar26._20_4_;
        fVar228 = auVar26._24_4_;
        fVar245 = auVar153._0_4_;
        fVar248 = auVar153._4_4_;
        fVar260 = auVar153._8_4_;
        fVar263 = auVar153._12_4_;
        fVar276 = auVar153._16_4_;
        fVar286 = auVar153._20_4_;
        fVar302 = auVar153._24_4_;
        fVar329 = auVar259._28_4_;
        fVar250 = fVar350 + fVar350 + fVar250;
        local_680._0_4_ =
             (float)local_160._0_4_ * fVar303 +
             fVar169 * (float)local_480._0_4_ +
             auVar326._0_4_ * fVar245 + (float)local_460._0_4_ * fVar336;
        local_680._4_4_ =
             (float)local_160._4_4_ * fVar229 +
             fVar170 * (float)local_480._4_4_ +
             auVar326._4_4_ * fVar248 + (float)local_460._4_4_ * fVar247;
        local_680._8_4_ =
             fStack_158 * fVar189 +
             fVar171 * fStack_478 + auVar326._8_4_ * fVar260 + fStack_458 * fVar251;
        local_680._12_4_ =
             fStack_154 * fVar304 +
             fVar172 * fStack_474 + auVar326._12_4_ * fVar263 + fStack_454 * fVar262;
        local_680._16_4_ =
             fStack_150 * fVar164 +
             fVar190 * fStack_470 + auVar326._16_4_ * fVar276 + fStack_450 * fVar267;
        local_680._20_4_ =
             fStack_14c * fVar166 +
             fVar269 * fStack_46c + auVar326._20_4_ * fVar286 + fStack_44c * fVar284;
        local_680._24_4_ =
             fStack_148 * fVar168 +
             fVar278 * fStack_468 + auVar326._24_4_ * fVar302 + fStack_448 * fVar228;
        local_680._28_4_ = fVar350 + fStack_84 + fVar250;
        auVar257._0_4_ =
             fVar243 * fVar303 + fVar148 * fVar169 + fVar305 * fVar245 + fVar338 * fVar336;
        auVar257._4_4_ =
             fVar337 * fVar229 + fVar163 * fVar170 + fVar207 * fVar248 + fVar348 * fVar247;
        auVar257._8_4_ =
             fVar249 * fVar189 + fVar165 * fVar171 + fVar209 * fVar260 + fVar349 * fVar251;
        auVar257._12_4_ =
             fVar261 * fVar304 + fVar167 * fVar172 + fVar211 * fVar263 + fVar350 * fVar262;
        auVar257._16_4_ =
             fVar265 * fVar164 + fVar230 * fVar190 + fVar213 * fVar276 + fVar338 * fVar267;
        auVar257._20_4_ =
             fVar281 * fVar166 + fVar162 * fVar269 + fVar226 * fVar286 + fVar348 * fVar284;
        auVar257._24_4_ =
             fVar300 * fVar168 + fVar241 * fVar278 + fVar227 * fVar302 + fVar349 * fVar228;
        auVar257._28_4_ = fVar250 + fVar350 + fVar350 + fVar329;
        local_5e0._0_4_ =
             (float)local_c0._0_4_ * fVar169 +
             fVar245 * (float)local_180._0_4_ + (float)local_a0._0_4_ * fVar336 +
             fVar303 * (float)local_e0._0_4_;
        local_5e0._4_4_ =
             (float)local_c0._4_4_ * fVar170 +
             fVar248 * (float)local_180._4_4_ + (float)local_a0._4_4_ * fVar247 +
             fVar229 * (float)local_e0._4_4_;
        fStack_5d8 = fStack_b8 * fVar171 + fVar260 * fStack_178 + fStack_98 * fVar251 +
                     fVar189 * fStack_d8;
        fStack_5d4 = fStack_b4 * fVar172 + fVar263 * fStack_174 + fStack_94 * fVar262 +
                     fVar304 * fStack_d4;
        fStack_5d0 = fStack_b0 * fVar190 + fVar276 * fStack_170 + fStack_90 * fVar267 +
                     fVar164 * fStack_d0;
        fStack_5cc = fStack_ac * fVar269 + fVar286 * fStack_16c + fStack_8c * fVar284 +
                     fVar166 * fStack_cc;
        fStack_5c8 = fStack_a8 * fVar278 + fVar302 * fStack_168 + fStack_88 * fVar228 +
                     fVar168 * fStack_c8;
        fStack_5c4 = fVar350 + fVar350 + fStack_84 + fVar250;
        auVar28 = vsubps_avx(local_680,_local_860);
        auVar29 = vsubps_avx(auVar257,local_780);
        fVar230 = auVar28._0_4_;
        fVar162 = auVar28._4_4_;
        auVar85._4_4_ = local_780._4_4_ * fVar162;
        auVar85._0_4_ = (float)local_780._0_4_ * fVar230;
        fVar241 = auVar28._8_4_;
        auVar85._8_4_ = local_780._8_4_ * fVar241;
        fVar264 = auVar28._12_4_;
        auVar85._12_4_ = local_780._12_4_ * fVar264;
        fVar279 = auVar28._16_4_;
        auVar85._16_4_ = local_780._16_4_ * fVar279;
        fVar288 = auVar28._20_4_;
        auVar85._20_4_ = local_780._20_4_ * fVar288;
        fVar301 = auVar28._24_4_;
        auVar85._24_4_ = local_780._24_4_ * fVar301;
        auVar85._28_4_ = fVar250;
        fVar250 = auVar29._0_4_;
        fVar283 = auVar29._4_4_;
        auVar86._4_4_ = fVar283 * (float)local_860._4_4_;
        auVar86._0_4_ = fVar250 * (float)local_860._0_4_;
        fVar285 = auVar29._8_4_;
        auVar86._8_4_ = fVar285 * fStack_858;
        fVar148 = auVar29._12_4_;
        auVar86._12_4_ = fVar148 * fStack_854;
        fVar163 = auVar29._16_4_;
        auVar86._16_4_ = fVar163 * fStack_850;
        fVar165 = auVar29._20_4_;
        auVar86._20_4_ = fVar165 * fStack_84c;
        fVar167 = auVar29._24_4_;
        auVar86._24_4_ = fVar167 * fStack_848;
        auVar86._28_4_ = auVar257._28_4_;
        auVar30 = vsubps_avx(auVar85,auVar86);
        auVar27 = vmaxps_avx(_local_840,_local_5e0);
        auVar87._4_4_ = auVar27._4_4_ * auVar27._4_4_ * (fVar162 * fVar162 + fVar283 * fVar283);
        auVar87._0_4_ = auVar27._0_4_ * auVar27._0_4_ * (fVar230 * fVar230 + fVar250 * fVar250);
        auVar87._8_4_ = auVar27._8_4_ * auVar27._8_4_ * (fVar241 * fVar241 + fVar285 * fVar285);
        auVar87._12_4_ = auVar27._12_4_ * auVar27._12_4_ * (fVar264 * fVar264 + fVar148 * fVar148);
        auVar87._16_4_ = auVar27._16_4_ * auVar27._16_4_ * (fVar279 * fVar279 + fVar163 * fVar163);
        auVar87._20_4_ = auVar27._20_4_ * auVar27._20_4_ * (fVar288 * fVar288 + fVar165 * fVar165);
        auVar87._24_4_ = auVar27._24_4_ * auVar27._24_4_ * (fVar301 * fVar301 + fVar167 * fVar167);
        auVar87._28_4_ = local_680._28_4_ + auVar257._28_4_;
        auVar88._4_4_ = auVar30._4_4_ * auVar30._4_4_;
        auVar88._0_4_ = auVar30._0_4_ * auVar30._0_4_;
        auVar88._8_4_ = auVar30._8_4_ * auVar30._8_4_;
        auVar88._12_4_ = auVar30._12_4_ * auVar30._12_4_;
        auVar88._16_4_ = auVar30._16_4_ * auVar30._16_4_;
        auVar88._20_4_ = auVar30._20_4_ * auVar30._20_4_;
        auVar88._24_4_ = auVar30._24_4_ * auVar30._24_4_;
        auVar88._28_4_ = auVar30._28_4_;
        auVar27 = vcmpps_avx(auVar88,auVar87,2);
        local_2a0 = (uint)lVar147;
        auVar216 = vpshufd_avx(ZEXT416(local_2a0),0);
        auVar197 = vpor_avx(auVar216,_DAT_01f4ad30);
        auVar216 = vpor_avx(auVar216,_DAT_01f7afa0);
        auVar132._4_4_ = fStack_4bc;
        auVar132._0_4_ = local_4c0;
        auVar132._8_4_ = fStack_4b8;
        auVar132._12_4_ = fStack_4b4;
        auVar197 = vpcmpgtd_avx(auVar132,auVar197);
        auVar216 = vpcmpgtd_avx(auVar132,auVar216);
        register0x00001290 = auVar216;
        _local_5a0 = auVar197;
        auVar30 = _local_5a0 & auVar27;
        fVar148 = (float)local_720._0_4_;
        fVar163 = (float)local_720._4_4_;
        fVar165 = fStack_718;
        fVar167 = fStack_714;
        fVar230 = fStack_710;
        fVar162 = fStack_70c;
        fVar241 = fStack_708;
        if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar30 >> 0x7f,0) == '\0') &&
              (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar30 >> 0xbf,0) == '\0') &&
            (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar30[0x1f]) {
          auVar326 = ZEXT3264(_local_640);
          auVar347 = ZEXT3264(auVar347._0_32_);
          auVar259 = ZEXT3264(auVar259._0_32_);
        }
        else {
          local_4e0 = fVar303 * (float)local_5c0._0_4_ +
                      fVar169 * (float)local_100._0_4_ +
                      (float)local_120._0_4_ * fVar245 + (float)local_760._0_4_ * fVar336;
          fStack_4dc = fVar229 * (float)local_5c0._4_4_ +
                       fVar170 * (float)local_100._4_4_ +
                       (float)local_120._4_4_ * fVar248 + (float)local_760._4_4_ * fVar247;
          fStack_4d8 = fVar189 * fStack_5b8 +
                       fVar171 * fStack_f8 + fStack_118 * fVar260 + fStack_758 * fVar251;
          fStack_4d4 = fVar304 * fStack_5b4 +
                       fVar172 * fStack_f4 + fStack_114 * fVar263 + fStack_754 * fVar262;
          fStack_4d0 = fVar164 * fStack_5b0 +
                       fVar190 * fStack_f0 + fStack_110 * fVar276 + fStack_750 * fVar267;
          fStack_4cc = fVar166 * fStack_5ac +
                       fVar269 * fStack_ec + fStack_10c * fVar286 + fStack_74c * fVar284;
          fStack_4c8 = fVar168 * fStack_5a8 +
                       fVar278 * fStack_e8 + fStack_108 * fVar302 + fStack_748 * fVar228;
          fStack_4c4 = pfVar1[7] + auVar153._28_4_ + auVar26._28_4_ + 0.0;
          local_660._0_4_ = auVar136._0_4_;
          local_660._4_4_ = auVar136._4_4_;
          fStack_658 = auVar136._8_4_;
          fStack_654 = auVar136._12_4_;
          auStack_650._0_4_ = auVar136._16_4_;
          auStack_650._4_4_ = auVar136._20_4_;
          fStack_648 = auVar136._24_4_;
          local_740._0_4_ = auVar135._0_4_;
          local_740._4_4_ = auVar135._4_4_;
          uStack_738._0_4_ = auVar135._8_4_;
          uStack_738._4_4_ = auVar135._12_4_;
          auStack_730._0_4_ = auVar135._16_4_;
          auStack_730._4_4_ = auVar135._20_4_;
          fStack_728 = auVar135._24_4_;
          local_4a0._0_4_ = auVar134._0_4_;
          local_4a0._4_4_ = auVar134._4_4_;
          fStack_498 = auVar134._8_4_;
          fStack_494 = auVar134._12_4_;
          fStack_490 = auVar134._16_4_;
          fStack_48c = auVar134._20_4_;
          fStack_488 = auVar134._24_4_;
          fVar269 = (float)local_760._0_4_ * (float)local_4a0._0_4_;
          fVar278 = (float)local_760._4_4_ * (float)local_4a0._4_4_;
          fVar250 = fStack_758 * fStack_498;
          fVar283 = fStack_754 * fStack_494;
          fVar285 = fStack_750 * fStack_490;
          fVar287 = fStack_74c * fStack_48c;
          fVar266 = fStack_748 * fStack_488;
          pfVar1 = (float *)(lVar141 + 0x2205e84 + lVar147 * 4);
          fVar336 = *pfVar1;
          fVar245 = pfVar1[1];
          fVar247 = pfVar1[2];
          fVar248 = pfVar1[3];
          fVar251 = pfVar1[4];
          fVar260 = pfVar1[5];
          fVar262 = pfVar1[6];
          pfVar2 = (float *)(lVar141 + 0x2206308 + lVar147 * 4);
          fVar263 = *pfVar2;
          fVar264 = pfVar2[1];
          fVar267 = pfVar2[2];
          fVar276 = pfVar2[3];
          fVar279 = pfVar2[4];
          fVar284 = pfVar2[5];
          fVar286 = pfVar2[6];
          pfVar3 = (float *)(lVar141 + 0x2205a00 + lVar147 * 4);
          fVar288 = *pfVar3;
          fVar228 = pfVar3[1];
          fVar302 = pfVar3[2];
          fVar301 = pfVar3[3];
          fVar303 = pfVar3[4];
          fVar229 = pfVar3[5];
          fVar189 = pfVar3[6];
          fVar172 = pfVar1[7] + pfVar2[7];
          fVar190 = pfVar2[7] + fVar329 + 0.0;
          fStack_4e4 = fVar329 + 0.0 + fVar329 + auVar27._28_4_;
          pfVar1 = (float *)(lVar141 + 0x220557c + lVar147 * 4);
          fVar304 = *pfVar1;
          fVar164 = pfVar1[1];
          fVar166 = pfVar1[2];
          fVar168 = pfVar1[3];
          fVar169 = pfVar1[4];
          fVar170 = pfVar1[5];
          fVar171 = pfVar1[6];
          local_4a0._4_4_ =
               (float)local_160._4_4_ * fVar164 +
               fVar228 * (float)local_480._4_4_ +
               (float)local_640._4_4_ * fVar245 + (float)local_460._4_4_ * fVar264;
          local_4a0._0_4_ =
               (float)local_160._0_4_ * fVar304 +
               fVar288 * (float)local_480._0_4_ +
               (float)local_640._0_4_ * fVar336 + (float)local_460._0_4_ * fVar263;
          fStack_498 = fStack_158 * fVar166 +
                       fVar302 * fStack_478 + fStack_638 * fVar247 + fStack_458 * fVar267;
          fStack_494 = fStack_154 * fVar168 +
                       fVar301 * fStack_474 + fStack_634 * fVar248 + fStack_454 * fVar276;
          fStack_490 = fStack_150 * fVar169 +
                       fVar303 * fStack_470 + fStack_630 * fVar251 + fStack_450 * fVar279;
          fStack_48c = fStack_14c * fVar170 +
                       fVar229 * fStack_46c + fStack_62c * fVar260 + fStack_44c * fVar284;
          fStack_488 = fStack_148 * fVar171 +
                       fVar189 * fStack_468 + fStack_628 * fVar262 + fStack_448 * fVar286;
          fStack_484 = fVar172 + fVar190;
          auVar185._0_4_ =
               fVar243 * fVar304 +
               fVar288 * (float)local_720._0_4_ + fVar305 * fVar336 + fVar338 * fVar263;
          auVar185._4_4_ =
               fVar337 * fVar164 +
               fVar228 * (float)local_720._4_4_ + fVar207 * fVar245 + fVar348 * fVar264;
          auVar185._8_4_ =
               fVar249 * fVar166 + fVar302 * fStack_718 + fVar209 * fVar247 + fVar349 * fVar267;
          auVar185._12_4_ =
               fVar261 * fVar168 + fVar301 * fStack_714 + fVar211 * fVar248 + fVar350 * fVar276;
          auVar185._16_4_ =
               fVar265 * fVar169 + fVar303 * fStack_710 + fVar213 * fVar251 + fVar338 * fVar279;
          auVar185._20_4_ =
               fVar281 * fVar170 + fVar229 * fStack_70c + fVar226 * fVar260 + fVar348 * fVar284;
          auVar185._24_4_ =
               fVar300 * fVar171 + fVar189 * fStack_708 + fVar227 * fVar262 + fVar349 * fVar286;
          auVar185._28_4_ = fVar190 + fStack_4e4;
          local_500 = fVar288 * (float)local_100._0_4_ +
                      (float)local_120._0_4_ * fVar336 + (float)local_760._0_4_ * fVar263 +
                      (float)local_5c0._0_4_ * fVar304;
          fStack_4fc = fVar228 * (float)local_100._4_4_ +
                       (float)local_120._4_4_ * fVar245 + (float)local_760._4_4_ * fVar264 +
                       (float)local_5c0._4_4_ * fVar164;
          fStack_4f8 = fVar302 * fStack_f8 + fStack_118 * fVar247 + fStack_758 * fVar267 +
                       fStack_5b8 * fVar166;
          fStack_4f4 = fVar301 * fStack_f4 + fStack_114 * fVar248 + fStack_754 * fVar276 +
                       fStack_5b4 * fVar168;
          fStack_4f0 = fVar303 * fStack_f0 + fStack_110 * fVar251 + fStack_750 * fVar279 +
                       fStack_5b0 * fVar169;
          fStack_4ec = fVar229 * fStack_ec + fStack_10c * fVar260 + fStack_74c * fVar284 +
                       fStack_5ac * fVar170;
          fStack_4e8 = fVar189 * fStack_e8 + fStack_108 * fVar262 + fStack_748 * fVar286 +
                       fStack_5a8 * fVar171;
          fStack_4e4 = pfVar3[7] + fVar172 + fStack_4e4;
          pfVar1 = (float *)(lVar141 + 0x22082a4 + lVar147 * 4);
          fVar243 = *pfVar1;
          fVar336 = pfVar1[1];
          fVar245 = pfVar1[2];
          fVar337 = pfVar1[3];
          fVar247 = pfVar1[4];
          fVar248 = pfVar1[5];
          fVar249 = pfVar1[6];
          pfVar2 = (float *)(lVar141 + 0x2208728 + lVar147 * 4);
          fVar251 = *pfVar2;
          fVar260 = pfVar2[1];
          fVar261 = pfVar2[2];
          fVar262 = pfVar2[3];
          fVar263 = pfVar2[4];
          fVar264 = pfVar2[5];
          fVar265 = pfVar2[6];
          pfVar3 = (float *)(lVar141 + 0x2207e20 + lVar147 * 4);
          fVar267 = *pfVar3;
          fVar276 = pfVar3[1];
          fVar279 = pfVar3[2];
          fVar281 = pfVar3[3];
          fVar284 = pfVar3[4];
          fVar286 = pfVar3[5];
          fVar288 = pfVar3[6];
          pfVar4 = (float *)(lVar141 + 0x220799c + lVar147 * 4);
          fVar300 = *pfVar4;
          fVar228 = pfVar4[1];
          fVar302 = pfVar4[2];
          fVar301 = pfVar4[3];
          fVar303 = pfVar4[4];
          fVar229 = pfVar4[5];
          fVar189 = pfVar4[6];
          auVar312._0_4_ =
               (float)local_160._0_4_ * fVar300 +
               fVar267 * (float)local_480._0_4_ +
               (float)local_640._0_4_ * fVar243 + (float)local_460._0_4_ * fVar251;
          auVar312._4_4_ =
               (float)local_160._4_4_ * fVar228 +
               fVar276 * (float)local_480._4_4_ +
               (float)local_640._4_4_ * fVar336 + (float)local_460._4_4_ * fVar260;
          auVar312._8_4_ =
               fStack_158 * fVar302 +
               fVar279 * fStack_478 + fStack_638 * fVar245 + fStack_458 * fVar261;
          auVar312._12_4_ =
               fStack_154 * fVar301 +
               fVar281 * fStack_474 + fStack_634 * fVar337 + fStack_454 * fVar262;
          auVar312._16_4_ =
               fStack_150 * fVar303 +
               fVar284 * fStack_470 + fStack_630 * fVar247 + fStack_450 * fVar263;
          auVar312._20_4_ =
               fStack_14c * fVar229 +
               fVar286 * fStack_46c + fStack_62c * fVar248 + fStack_44c * fVar264;
          auVar312._24_4_ =
               fStack_148 * fVar189 +
               fVar288 * fStack_468 + fStack_628 * fVar249 + fStack_448 * fVar265;
          auVar312._28_4_ = fStack_444 + fStack_444 + fStack_624 + fStack_444;
          auVar345._0_4_ =
               fVar300 * fVar191 +
               fVar267 * (float)local_720._0_4_ + fVar305 * fVar243 + fVar338 * fVar251;
          auVar345._4_4_ =
               fVar228 * fVar208 +
               fVar276 * (float)local_720._4_4_ + fVar207 * fVar336 + fVar348 * fVar260;
          auVar345._8_4_ =
               fVar302 * fVar210 + fVar279 * fStack_718 + fVar209 * fVar245 + fVar349 * fVar261;
          auVar345._12_4_ =
               fVar301 * fVar212 + fVar281 * fStack_714 + fVar211 * fVar337 + fVar350 * fVar262;
          auVar345._16_4_ =
               fVar303 * fVar191 + fVar284 * fStack_710 + fVar213 * fVar247 + fVar338 * fVar263;
          auVar345._20_4_ =
               fVar229 * fVar208 + fVar286 * fStack_70c + fVar226 * fVar248 + fVar348 * fVar264;
          auVar345._24_4_ =
               fVar189 * fVar210 + fVar288 * fStack_708 + fVar227 * fVar249 + fVar349 * fVar265;
          auVar345._28_4_ = fStack_444 + fStack_444 + fVar329 + fStack_444;
          auVar258._8_4_ = 0x7fffffff;
          auVar258._0_8_ = 0x7fffffff7fffffff;
          auVar258._12_4_ = 0x7fffffff;
          auVar258._16_4_ = 0x7fffffff;
          auVar258._20_4_ = 0x7fffffff;
          auVar258._24_4_ = 0x7fffffff;
          auVar258._28_4_ = 0x7fffffff;
          auVar153 = vandps_avx(_local_4a0,auVar258);
          auVar30 = vandps_avx(auVar185,auVar258);
          auVar30 = vmaxps_avx(auVar153,auVar30);
          auVar129._4_4_ = fStack_4fc;
          auVar129._0_4_ = local_500;
          auVar129._8_4_ = fStack_4f8;
          auVar129._12_4_ = fStack_4f4;
          auVar129._16_4_ = fStack_4f0;
          auVar129._20_4_ = fStack_4ec;
          auVar129._24_4_ = fStack_4e8;
          auVar129._28_4_ = fStack_4e4;
          auVar153 = vandps_avx(auVar258,auVar129);
          auVar30 = vmaxps_avx(auVar30,auVar153);
          auVar30 = vcmpps_avx(auVar30,local_340,1);
          auVar31 = vblendvps_avx(_local_4a0,auVar28,auVar30);
          auVar158._0_4_ =
               fVar300 * (float)local_5c0._0_4_ +
               fVar267 * (float)local_100._0_4_ +
               fVar251 * (float)local_760._0_4_ + (float)local_120._0_4_ * fVar243;
          auVar158._4_4_ =
               fVar228 * (float)local_5c0._4_4_ +
               fVar276 * (float)local_100._4_4_ +
               fVar260 * (float)local_760._4_4_ + (float)local_120._4_4_ * fVar336;
          auVar158._8_4_ =
               fVar302 * fStack_5b8 +
               fVar279 * fStack_f8 + fVar261 * fStack_758 + fStack_118 * fVar245;
          auVar158._12_4_ =
               fVar301 * fStack_5b4 +
               fVar281 * fStack_f4 + fVar262 * fStack_754 + fStack_114 * fVar337;
          auVar158._16_4_ =
               fVar303 * fStack_5b0 +
               fVar284 * fStack_f0 + fVar263 * fStack_750 + fStack_110 * fVar247;
          auVar158._20_4_ =
               fVar229 * fStack_5ac +
               fVar286 * fStack_ec + fVar264 * fStack_74c + fStack_10c * fVar248;
          auVar158._24_4_ =
               fVar189 * fStack_5a8 +
               fVar288 * fStack_e8 + fVar265 * fStack_748 + fStack_108 * fVar249;
          auVar158._28_4_ = auVar153._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar32 = vblendvps_avx(auVar185,auVar29,auVar30);
          auVar153 = vandps_avx(auVar312,auVar258);
          auVar30 = vandps_avx(auVar345,auVar258);
          auVar33 = vmaxps_avx(auVar153,auVar30);
          auVar153 = vandps_avx(auVar158,auVar258);
          auVar153 = vmaxps_avx(auVar33,auVar153);
          local_6a0._0_4_ = auVar137._0_4_;
          local_6a0._4_4_ = auVar137._4_4_;
          fStack_698 = auVar137._8_4_;
          fStack_694 = auVar137._12_4_;
          auStack_690._0_4_ = auVar137._16_4_;
          auStack_690._4_4_ = auVar137._20_4_;
          fStack_688 = auVar137._24_4_;
          auVar30 = vcmpps_avx(auVar153,local_340,1);
          auVar153 = vblendvps_avx(auVar312,auVar28,auVar30);
          auVar159._0_4_ =
               (float)local_5c0._0_4_ * (float)local_6a0._0_4_ +
               (float)local_100._0_4_ * (float)local_660._0_4_ +
               (float)local_120._0_4_ * (float)local_740._0_4_ + fVar269;
          auVar159._4_4_ =
               (float)local_5c0._4_4_ * (float)local_6a0._4_4_ +
               (float)local_100._4_4_ * (float)local_660._4_4_ +
               (float)local_120._4_4_ * (float)local_740._4_4_ + fVar278;
          auVar159._8_4_ =
               fStack_5b8 * fStack_698 +
               fStack_f8 * fStack_658 + fStack_118 * (float)uStack_738 + fVar250;
          auVar159._12_4_ =
               fStack_5b4 * fStack_694 +
               fStack_f4 * fStack_654 + fStack_114 * uStack_738._4_4_ + fVar283;
          auVar159._16_4_ =
               fStack_5b0 * (float)auStack_690._0_4_ +
               fStack_f0 * (float)auStack_650._0_4_ +
               fStack_110 * (float)auStack_730._0_4_ + fVar285;
          auVar159._20_4_ =
               fStack_5ac * (float)auStack_690._4_4_ +
               fStack_ec * (float)auStack_650._4_4_ +
               fStack_10c * (float)auStack_730._4_4_ + fVar287;
          auVar159._24_4_ =
               fStack_5a8 * fStack_688 + fStack_e8 * fStack_648 + fStack_108 * fStack_728 + fVar266;
          auVar159._28_4_ = auVar33._28_4_ + fStack_4c4 + auVar26._28_4_ + 0.0;
          auVar26 = vblendvps_avx(auVar345,auVar29,auVar30);
          fVar171 = auVar31._0_4_;
          fVar172 = auVar31._4_4_;
          fVar190 = auVar31._8_4_;
          fVar269 = auVar31._12_4_;
          fVar278 = auVar31._16_4_;
          fVar250 = auVar31._20_4_;
          fVar283 = auVar31._24_4_;
          fVar285 = auVar31._28_4_;
          fVar265 = auVar153._0_4_;
          fVar276 = auVar153._4_4_;
          fVar281 = auVar153._8_4_;
          fVar286 = auVar153._12_4_;
          fVar300 = auVar153._16_4_;
          fVar302 = auVar153._20_4_;
          fVar303 = auVar153._24_4_;
          fVar329 = auVar32._0_4_;
          fVar336 = auVar32._4_4_;
          fVar337 = auVar32._8_4_;
          fVar248 = auVar32._12_4_;
          fVar251 = auVar32._16_4_;
          fVar261 = auVar32._20_4_;
          fVar263 = auVar32._24_4_;
          auVar325._0_4_ = fVar329 * fVar329 + fVar171 * fVar171;
          auVar325._4_4_ = fVar336 * fVar336 + fVar172 * fVar172;
          auVar325._8_4_ = fVar337 * fVar337 + fVar190 * fVar190;
          auVar325._12_4_ = fVar248 * fVar248 + fVar269 * fVar269;
          auVar325._16_4_ = fVar251 * fVar251 + fVar278 * fVar278;
          auVar325._20_4_ = fVar261 * fVar261 + fVar250 * fVar250;
          auVar325._24_4_ = fVar263 * fVar263 + fVar283 * fVar283;
          auVar325._28_4_ = fVar350 + auVar29._28_4_;
          auVar28 = vrsqrtps_avx(auVar325);
          fVar243 = auVar28._0_4_;
          fVar245 = auVar28._4_4_;
          auVar89._4_4_ = fVar245 * 1.5;
          auVar89._0_4_ = fVar243 * 1.5;
          fVar247 = auVar28._8_4_;
          auVar89._8_4_ = fVar247 * 1.5;
          fVar249 = auVar28._12_4_;
          auVar89._12_4_ = fVar249 * 1.5;
          fVar260 = auVar28._16_4_;
          auVar89._16_4_ = fVar260 * 1.5;
          fVar262 = auVar28._20_4_;
          auVar89._20_4_ = fVar262 * 1.5;
          fVar264 = auVar28._24_4_;
          auVar89._24_4_ = fVar264 * 1.5;
          auVar89._28_4_ = auVar345._28_4_;
          auVar90._4_4_ = fVar245 * fVar245 * fVar245 * auVar325._4_4_ * 0.5;
          auVar90._0_4_ = fVar243 * fVar243 * fVar243 * auVar325._0_4_ * 0.5;
          auVar90._8_4_ = fVar247 * fVar247 * fVar247 * auVar325._8_4_ * 0.5;
          auVar90._12_4_ = fVar249 * fVar249 * fVar249 * auVar325._12_4_ * 0.5;
          auVar90._16_4_ = fVar260 * fVar260 * fVar260 * auVar325._16_4_ * 0.5;
          auVar90._20_4_ = fVar262 * fVar262 * fVar262 * auVar325._20_4_ * 0.5;
          auVar90._24_4_ = fVar264 * fVar264 * fVar264 * auVar325._24_4_ * 0.5;
          auVar90._28_4_ = auVar325._28_4_;
          auVar29 = vsubps_avx(auVar89,auVar90);
          fVar189 = auVar29._0_4_;
          fVar304 = auVar29._4_4_;
          fVar164 = auVar29._8_4_;
          fVar166 = auVar29._12_4_;
          fVar168 = auVar29._16_4_;
          fVar169 = auVar29._20_4_;
          fVar170 = auVar29._24_4_;
          fVar243 = auVar26._0_4_;
          fVar245 = auVar26._4_4_;
          fVar247 = auVar26._8_4_;
          fVar249 = auVar26._12_4_;
          fVar260 = auVar26._16_4_;
          fVar262 = auVar26._20_4_;
          fVar264 = auVar26._24_4_;
          auVar298._0_4_ = fVar243 * fVar243 + fVar265 * fVar265;
          auVar298._4_4_ = fVar245 * fVar245 + fVar276 * fVar276;
          auVar298._8_4_ = fVar247 * fVar247 + fVar281 * fVar281;
          auVar298._12_4_ = fVar249 * fVar249 + fVar286 * fVar286;
          auVar298._16_4_ = fVar260 * fVar260 + fVar300 * fVar300;
          auVar298._20_4_ = fVar262 * fVar262 + fVar302 * fVar302;
          auVar298._24_4_ = fVar264 * fVar264 + fVar303 * fVar303;
          auVar298._28_4_ = auVar28._28_4_ + auVar153._28_4_;
          auVar153 = vrsqrtps_avx(auVar298);
          fVar267 = auVar153._0_4_;
          fVar279 = auVar153._4_4_;
          auVar91._4_4_ = fVar279 * 1.5;
          auVar91._0_4_ = fVar267 * 1.5;
          fVar284 = auVar153._8_4_;
          auVar91._8_4_ = fVar284 * 1.5;
          fVar288 = auVar153._12_4_;
          auVar91._12_4_ = fVar288 * 1.5;
          fVar228 = auVar153._16_4_;
          auVar91._16_4_ = fVar228 * 1.5;
          fVar301 = auVar153._20_4_;
          auVar91._20_4_ = fVar301 * 1.5;
          fVar229 = auVar153._24_4_;
          auVar91._24_4_ = fVar229 * 1.5;
          auVar91._28_4_ = auVar345._28_4_;
          auVar92._4_4_ = fVar279 * fVar279 * fVar279 * auVar298._4_4_ * 0.5;
          auVar92._0_4_ = fVar267 * fVar267 * fVar267 * auVar298._0_4_ * 0.5;
          auVar92._8_4_ = fVar284 * fVar284 * fVar284 * auVar298._8_4_ * 0.5;
          auVar92._12_4_ = fVar288 * fVar288 * fVar288 * auVar298._12_4_ * 0.5;
          auVar92._16_4_ = fVar228 * fVar228 * fVar228 * auVar298._16_4_ * 0.5;
          auVar92._20_4_ = fVar301 * fVar301 * fVar301 * auVar298._20_4_ * 0.5;
          auVar92._24_4_ = fVar229 * fVar229 * fVar229 * auVar298._24_4_ * 0.5;
          auVar92._28_4_ = auVar298._28_4_;
          auVar26 = vsubps_avx(auVar91,auVar92);
          fVar267 = auVar26._0_4_;
          fVar279 = auVar26._4_4_;
          fVar284 = auVar26._8_4_;
          fVar288 = auVar26._12_4_;
          fVar228 = auVar26._16_4_;
          fVar301 = auVar26._20_4_;
          fVar229 = auVar26._24_4_;
          fVar329 = (float)local_840._0_4_ * fVar189 * fVar329;
          fVar336 = (float)local_840._4_4_ * fVar304 * fVar336;
          auVar93._4_4_ = fVar336;
          auVar93._0_4_ = fVar329;
          fVar337 = fStack_838 * fVar164 * fVar337;
          auVar93._8_4_ = fVar337;
          fVar248 = fStack_834 * fVar166 * fVar248;
          auVar93._12_4_ = fVar248;
          fVar251 = fStack_830 * fVar168 * fVar251;
          auVar93._16_4_ = fVar251;
          fVar261 = fStack_82c * fVar169 * fVar261;
          auVar93._20_4_ = fVar261;
          fVar263 = fStack_828 * fVar170 * fVar263;
          auVar93._24_4_ = fVar263;
          auVar93._28_4_ = auVar153._28_4_;
          local_6a0._4_4_ = fVar336 + (float)local_860._4_4_;
          local_6a0._0_4_ = fVar329 + (float)local_860._0_4_;
          fStack_698 = fVar337 + fStack_858;
          fStack_694 = fVar248 + fStack_854;
          auStack_690._0_4_ = fVar251 + fStack_850;
          auStack_690._4_4_ = fVar261 + fStack_84c;
          fStack_688 = fVar263 + fStack_848;
          fStack_684 = auVar153._28_4_ + fStack_844;
          fVar329 = (float)local_840._0_4_ * fVar189 * -fVar171;
          fVar336 = (float)local_840._4_4_ * fVar304 * -fVar172;
          auVar94._4_4_ = fVar336;
          auVar94._0_4_ = fVar329;
          fVar337 = fStack_838 * fVar164 * -fVar190;
          auVar94._8_4_ = fVar337;
          fVar248 = fStack_834 * fVar166 * -fVar269;
          auVar94._12_4_ = fVar248;
          fVar251 = fStack_830 * fVar168 * -fVar278;
          auVar94._16_4_ = fVar251;
          fVar261 = fStack_82c * fVar169 * -fVar250;
          auVar94._20_4_ = fVar261;
          fVar263 = fStack_828 * fVar170 * -fVar283;
          auVar94._24_4_ = fVar263;
          auVar94._28_4_ = -fVar285;
          local_740._4_4_ = local_780._4_4_ + fVar336;
          local_740._0_4_ = (float)local_780._0_4_ + fVar329;
          uStack_738._0_4_ = local_780._8_4_ + fVar337;
          uStack_738._4_4_ = local_780._12_4_ + fVar248;
          auStack_730._0_4_ = local_780._16_4_ + fVar251;
          auStack_730._4_4_ = local_780._20_4_ + fVar261;
          fStack_728 = local_780._24_4_ + fVar263;
          fStack_724 = local_780._28_4_ + -fVar285;
          fVar329 = fVar189 * 0.0 * (float)local_840._0_4_;
          fVar336 = fVar304 * 0.0 * (float)local_840._4_4_;
          auVar95._4_4_ = fVar336;
          auVar95._0_4_ = fVar329;
          fVar337 = fVar164 * 0.0 * fStack_838;
          auVar95._8_4_ = fVar337;
          fVar248 = fVar166 * 0.0 * fStack_834;
          auVar95._12_4_ = fVar248;
          fVar251 = fVar168 * 0.0 * fStack_830;
          auVar95._16_4_ = fVar251;
          fVar261 = fVar169 * 0.0 * fStack_82c;
          auVar95._20_4_ = fVar261;
          fVar263 = fVar170 * 0.0 * fStack_828;
          auVar95._24_4_ = fVar263;
          auVar95._28_4_ = fVar285;
          auVar153 = vsubps_avx(_local_860,auVar93);
          auVar371._0_4_ = fVar329 + auVar159._0_4_;
          auVar371._4_4_ = fVar336 + auVar159._4_4_;
          auVar371._8_4_ = fVar337 + auVar159._8_4_;
          auVar371._12_4_ = fVar248 + auVar159._12_4_;
          auVar371._16_4_ = fVar251 + auVar159._16_4_;
          auVar371._20_4_ = fVar261 + auVar159._20_4_;
          auVar371._24_4_ = fVar263 + auVar159._24_4_;
          auVar371._28_4_ = fVar285 + auVar159._28_4_;
          fVar329 = (float)local_5e0._0_4_ * fVar267 * fVar243;
          fVar243 = (float)local_5e0._4_4_ * fVar279 * fVar245;
          auVar96._4_4_ = fVar243;
          auVar96._0_4_ = fVar329;
          fVar336 = fStack_5d8 * fVar284 * fVar247;
          auVar96._8_4_ = fVar336;
          fVar245 = fStack_5d4 * fVar288 * fVar249;
          auVar96._12_4_ = fVar245;
          fVar337 = fStack_5d0 * fVar228 * fVar260;
          auVar96._16_4_ = fVar337;
          fVar247 = fStack_5cc * fVar301 * fVar262;
          auVar96._20_4_ = fVar247;
          fVar248 = fStack_5c8 * fVar229 * fVar264;
          auVar96._24_4_ = fVar248;
          auVar96._28_4_ = fStack_844;
          auVar152 = vsubps_avx(local_780,auVar94);
          auVar355._0_4_ = local_680._0_4_ + fVar329;
          auVar355._4_4_ = local_680._4_4_ + fVar243;
          auVar355._8_4_ = local_680._8_4_ + fVar336;
          auVar355._12_4_ = local_680._12_4_ + fVar245;
          auVar355._16_4_ = local_680._16_4_ + fVar337;
          auVar355._20_4_ = local_680._20_4_ + fVar247;
          auVar355._24_4_ = local_680._24_4_ + fVar248;
          auVar355._28_4_ = local_680._28_4_ + fStack_844;
          fVar329 = fVar267 * -fVar265 * (float)local_5e0._0_4_;
          fVar243 = fVar279 * -fVar276 * (float)local_5e0._4_4_;
          auVar97._4_4_ = fVar243;
          auVar97._0_4_ = fVar329;
          fVar336 = fVar284 * -fVar281 * fStack_5d8;
          auVar97._8_4_ = fVar336;
          fVar245 = fVar288 * -fVar286 * fStack_5d4;
          auVar97._12_4_ = fVar245;
          fVar337 = fVar228 * -fVar300 * fStack_5d0;
          auVar97._16_4_ = fVar337;
          fVar247 = fVar301 * -fVar302 * fStack_5cc;
          auVar97._20_4_ = fVar247;
          fVar248 = fVar229 * -fVar303 * fStack_5c8;
          auVar97._24_4_ = fVar248;
          auVar97._28_4_ = fStack_824;
          auVar179 = vsubps_avx(auVar159,auVar95);
          auVar239._0_4_ = auVar257._0_4_ + fVar329;
          auVar239._4_4_ = auVar257._4_4_ + fVar243;
          auVar239._8_4_ = auVar257._8_4_ + fVar336;
          auVar239._12_4_ = auVar257._12_4_ + fVar245;
          auVar239._16_4_ = auVar257._16_4_ + fVar337;
          auVar239._20_4_ = auVar257._20_4_ + fVar247;
          auVar239._24_4_ = auVar257._24_4_ + fVar248;
          auVar239._28_4_ = auVar257._28_4_ + fStack_824;
          fVar329 = fVar267 * 0.0 * (float)local_5e0._0_4_;
          fVar243 = fVar279 * 0.0 * (float)local_5e0._4_4_;
          auVar98._4_4_ = fVar243;
          auVar98._0_4_ = fVar329;
          fVar336 = fVar284 * 0.0 * fStack_5d8;
          auVar98._8_4_ = fVar336;
          fVar245 = fVar288 * 0.0 * fStack_5d4;
          auVar98._12_4_ = fVar245;
          fVar337 = fVar228 * 0.0 * fStack_5d0;
          auVar98._16_4_ = fVar337;
          fVar247 = fVar301 * 0.0 * fStack_5cc;
          auVar98._20_4_ = fVar247;
          fVar248 = fVar229 * 0.0 * fStack_5c8;
          auVar98._24_4_ = fVar248;
          auVar98._28_4_ = auVar159._28_4_;
          auVar28 = vsubps_avx(local_680,auVar96);
          auVar131._4_4_ = fStack_4dc;
          auVar131._0_4_ = local_4e0;
          auVar131._8_4_ = fStack_4d8;
          auVar131._12_4_ = fStack_4d4;
          auVar131._16_4_ = fStack_4d0;
          auVar131._20_4_ = fStack_4cc;
          auVar131._24_4_ = fStack_4c8;
          auVar131._28_4_ = fStack_4c4;
          auVar313._0_4_ = local_4e0 + fVar329;
          auVar313._4_4_ = fStack_4dc + fVar243;
          auVar313._8_4_ = fStack_4d8 + fVar336;
          auVar313._12_4_ = fStack_4d4 + fVar245;
          auVar313._16_4_ = fStack_4d0 + fVar337;
          auVar313._20_4_ = fStack_4cc + fVar247;
          auVar313._24_4_ = fStack_4c8 + fVar248;
          auVar313._28_4_ = fStack_4c4 + auVar159._28_4_;
          auVar29 = vsubps_avx(auVar257,auVar97);
          auVar30 = vsubps_avx(auVar131,auVar98);
          auVar31 = vsubps_avx(auVar239,auVar152);
          auVar32 = vsubps_avx(auVar313,auVar179);
          auVar99._4_4_ = auVar179._4_4_ * auVar31._4_4_;
          auVar99._0_4_ = auVar179._0_4_ * auVar31._0_4_;
          auVar99._8_4_ = auVar179._8_4_ * auVar31._8_4_;
          auVar99._12_4_ = auVar179._12_4_ * auVar31._12_4_;
          auVar99._16_4_ = auVar179._16_4_ * auVar31._16_4_;
          auVar99._20_4_ = auVar179._20_4_ * auVar31._20_4_;
          auVar99._24_4_ = auVar179._24_4_ * auVar31._24_4_;
          auVar99._28_4_ = auVar345._28_4_;
          auVar100._4_4_ = auVar152._4_4_ * auVar32._4_4_;
          auVar100._0_4_ = auVar152._0_4_ * auVar32._0_4_;
          auVar100._8_4_ = auVar152._8_4_ * auVar32._8_4_;
          auVar100._12_4_ = auVar152._12_4_ * auVar32._12_4_;
          auVar100._16_4_ = auVar152._16_4_ * auVar32._16_4_;
          auVar100._20_4_ = auVar152._20_4_ * auVar32._20_4_;
          auVar100._24_4_ = auVar152._24_4_ * auVar32._24_4_;
          auVar100._28_4_ = fStack_4c4;
          auVar33 = vsubps_avx(auVar100,auVar99);
          auVar101._4_4_ = auVar153._4_4_ * auVar32._4_4_;
          auVar101._0_4_ = auVar153._0_4_ * auVar32._0_4_;
          auVar101._8_4_ = auVar153._8_4_ * auVar32._8_4_;
          auVar101._12_4_ = auVar153._12_4_ * auVar32._12_4_;
          auVar101._16_4_ = auVar153._16_4_ * auVar32._16_4_;
          auVar101._20_4_ = auVar153._20_4_ * auVar32._20_4_;
          auVar101._24_4_ = auVar153._24_4_ * auVar32._24_4_;
          auVar101._28_4_ = auVar32._28_4_;
          auVar32 = vsubps_avx(auVar355,auVar153);
          auVar102._4_4_ = auVar179._4_4_ * auVar32._4_4_;
          auVar102._0_4_ = auVar179._0_4_ * auVar32._0_4_;
          auVar102._8_4_ = auVar179._8_4_ * auVar32._8_4_;
          auVar102._12_4_ = auVar179._12_4_ * auVar32._12_4_;
          auVar102._16_4_ = auVar179._16_4_ * auVar32._16_4_;
          auVar102._20_4_ = auVar179._20_4_ * auVar32._20_4_;
          auVar102._24_4_ = auVar179._24_4_ * auVar32._24_4_;
          auVar102._28_4_ = auVar26._28_4_;
          auVar44 = vsubps_avx(auVar102,auVar101);
          auVar103._4_4_ = auVar152._4_4_ * auVar32._4_4_;
          auVar103._0_4_ = auVar152._0_4_ * auVar32._0_4_;
          auVar103._8_4_ = auVar152._8_4_ * auVar32._8_4_;
          auVar103._12_4_ = auVar152._12_4_ * auVar32._12_4_;
          auVar103._16_4_ = auVar152._16_4_ * auVar32._16_4_;
          auVar103._20_4_ = auVar152._20_4_ * auVar32._20_4_;
          auVar103._24_4_ = auVar152._24_4_ * auVar32._24_4_;
          auVar103._28_4_ = auVar26._28_4_;
          auVar104._4_4_ = auVar153._4_4_ * auVar31._4_4_;
          auVar104._0_4_ = auVar153._0_4_ * auVar31._0_4_;
          auVar104._8_4_ = auVar153._8_4_ * auVar31._8_4_;
          auVar104._12_4_ = auVar153._12_4_ * auVar31._12_4_;
          auVar104._16_4_ = auVar153._16_4_ * auVar31._16_4_;
          auVar104._20_4_ = auVar153._20_4_ * auVar31._20_4_;
          auVar104._24_4_ = auVar153._24_4_ * auVar31._24_4_;
          auVar104._28_4_ = auVar31._28_4_;
          auVar26 = vsubps_avx(auVar104,auVar103);
          auVar186._0_4_ = auVar33._0_4_ * 0.0 + auVar26._0_4_ + auVar44._0_4_ * 0.0;
          auVar186._4_4_ = auVar33._4_4_ * 0.0 + auVar26._4_4_ + auVar44._4_4_ * 0.0;
          auVar186._8_4_ = auVar33._8_4_ * 0.0 + auVar26._8_4_ + auVar44._8_4_ * 0.0;
          auVar186._12_4_ = auVar33._12_4_ * 0.0 + auVar26._12_4_ + auVar44._12_4_ * 0.0;
          auVar186._16_4_ = auVar33._16_4_ * 0.0 + auVar26._16_4_ + auVar44._16_4_ * 0.0;
          auVar186._20_4_ = auVar33._20_4_ * 0.0 + auVar26._20_4_ + auVar44._20_4_ * 0.0;
          auVar186._24_4_ = auVar33._24_4_ * 0.0 + auVar26._24_4_ + auVar44._24_4_ * 0.0;
          auVar186._28_4_ = auVar33._28_4_ + auVar26._28_4_ + auVar44._28_4_;
          auVar151 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,2);
          auVar26 = vblendvps_avx(auVar28,_local_6a0,auVar151);
          auVar225 = ZEXT3264(auVar26);
          auVar28 = vblendvps_avx(auVar29,_local_740,auVar151);
          auVar29 = vblendvps_avx(auVar30,auVar371,auVar151);
          auVar30 = vblendvps_avx(auVar153,auVar355,auVar151);
          auVar31 = vblendvps_avx(auVar152,auVar239,auVar151);
          auVar32 = vblendvps_avx(auVar179,auVar313,auVar151);
          auVar33 = vblendvps_avx(auVar355,auVar153,auVar151);
          auVar44 = vblendvps_avx(auVar239,auVar152,auVar151);
          auVar25 = vblendvps_avx(auVar313,auVar179,auVar151);
          auVar153 = vandps_avx(auVar27,_local_5a0);
          auVar33 = vsubps_avx(auVar33,auVar26);
          auVar180 = vsubps_avx(auVar44,auVar28);
          auVar182 = vsubps_avx(auVar25,auVar29);
          auVar25 = vsubps_avx(auVar28,auVar31);
          fVar329 = auVar180._0_4_;
          fVar227 = auVar29._0_4_;
          fVar249 = auVar180._4_4_;
          fVar287 = auVar29._4_4_;
          auVar105._4_4_ = fVar287 * fVar249;
          auVar105._0_4_ = fVar227 * fVar329;
          fVar265 = auVar180._8_4_;
          fVar266 = auVar29._8_4_;
          auVar105._8_4_ = fVar266 * fVar265;
          fVar288 = auVar180._12_4_;
          fVar268 = auVar29._12_4_;
          auVar105._12_4_ = fVar268 * fVar288;
          fVar189 = auVar180._16_4_;
          fVar277 = auVar29._16_4_;
          auVar105._16_4_ = fVar277 * fVar189;
          fVar171 = auVar180._20_4_;
          fVar280 = auVar29._20_4_;
          auVar105._20_4_ = fVar280 * fVar171;
          fVar285 = auVar180._24_4_;
          fVar282 = auVar29._24_4_;
          auVar105._24_4_ = fVar282 * fVar285;
          auVar105._28_4_ = auVar44._28_4_;
          fVar243 = auVar28._0_4_;
          fVar242 = auVar182._0_4_;
          fVar251 = auVar28._4_4_;
          fVar244 = auVar182._4_4_;
          auVar106._4_4_ = fVar244 * fVar251;
          auVar106._0_4_ = fVar242 * fVar243;
          fVar267 = auVar28._8_4_;
          fVar246 = auVar182._8_4_;
          auVar106._8_4_ = fVar246 * fVar267;
          fVar300 = auVar28._12_4_;
          fVar299 = auVar182._12_4_;
          auVar106._12_4_ = fVar299 * fVar300;
          fVar304 = auVar28._16_4_;
          fVar306 = auVar182._16_4_;
          auVar106._16_4_ = fVar306 * fVar304;
          fVar172 = auVar28._20_4_;
          fVar314 = auVar182._20_4_;
          auVar106._20_4_ = fVar314 * fVar172;
          fVar305 = auVar28._24_4_;
          fVar316 = auVar182._24_4_;
          uVar146 = auVar152._28_4_;
          auVar106._24_4_ = fVar316 * fVar305;
          auVar106._28_4_ = uVar146;
          auVar44 = vsubps_avx(auVar106,auVar105);
          fVar336 = auVar26._0_4_;
          fVar260 = auVar26._4_4_;
          auVar107._4_4_ = fVar244 * fVar260;
          auVar107._0_4_ = fVar242 * fVar336;
          fVar276 = auVar26._8_4_;
          auVar107._8_4_ = fVar246 * fVar276;
          fVar228 = auVar26._12_4_;
          auVar107._12_4_ = fVar299 * fVar228;
          fVar164 = auVar26._16_4_;
          auVar107._16_4_ = fVar306 * fVar164;
          fVar190 = auVar26._20_4_;
          auVar107._20_4_ = fVar314 * fVar190;
          fVar207 = auVar26._24_4_;
          auVar107._24_4_ = fVar316 * fVar207;
          auVar107._28_4_ = uVar146;
          fVar245 = auVar33._0_4_;
          fVar261 = auVar33._4_4_;
          auVar108._4_4_ = fVar287 * fVar261;
          auVar108._0_4_ = fVar227 * fVar245;
          fVar279 = auVar33._8_4_;
          auVar108._8_4_ = fVar266 * fVar279;
          fVar302 = auVar33._12_4_;
          auVar108._12_4_ = fVar268 * fVar302;
          fVar166 = auVar33._16_4_;
          auVar108._16_4_ = fVar277 * fVar166;
          fVar269 = auVar33._20_4_;
          auVar108._20_4_ = fVar280 * fVar269;
          fVar209 = auVar33._24_4_;
          auVar108._24_4_ = fVar282 * fVar209;
          auVar108._28_4_ = auVar355._28_4_;
          auVar152 = vsubps_avx(auVar108,auVar107);
          auVar109._4_4_ = fVar251 * fVar261;
          auVar109._0_4_ = fVar243 * fVar245;
          auVar109._8_4_ = fVar267 * fVar279;
          auVar109._12_4_ = fVar300 * fVar302;
          auVar109._16_4_ = fVar304 * fVar166;
          auVar109._20_4_ = fVar172 * fVar269;
          auVar109._24_4_ = fVar305 * fVar209;
          auVar109._28_4_ = uVar146;
          auVar110._4_4_ = fVar260 * fVar249;
          auVar110._0_4_ = fVar336 * fVar329;
          auVar110._8_4_ = fVar276 * fVar265;
          auVar110._12_4_ = fVar228 * fVar288;
          auVar110._16_4_ = fVar164 * fVar189;
          auVar110._20_4_ = fVar190 * fVar171;
          auVar110._24_4_ = fVar207 * fVar285;
          auVar110._28_4_ = auVar179._28_4_;
          auVar179 = vsubps_avx(auVar110,auVar109);
          auVar181 = vsubps_avx(auVar29,auVar32);
          fVar247 = auVar179._28_4_ + auVar152._28_4_;
          local_780._0_4_ = auVar179._0_4_ + auVar152._0_4_ * 0.0 + auVar44._0_4_ * 0.0;
          local_780._4_4_ = auVar179._4_4_ + auVar152._4_4_ * 0.0 + auVar44._4_4_ * 0.0;
          local_780._8_4_ = auVar179._8_4_ + auVar152._8_4_ * 0.0 + auVar44._8_4_ * 0.0;
          local_780._12_4_ = auVar179._12_4_ + auVar152._12_4_ * 0.0 + auVar44._12_4_ * 0.0;
          local_780._16_4_ = auVar179._16_4_ + auVar152._16_4_ * 0.0 + auVar44._16_4_ * 0.0;
          local_780._20_4_ = auVar179._20_4_ + auVar152._20_4_ * 0.0 + auVar44._20_4_ * 0.0;
          local_780._24_4_ = auVar179._24_4_ + auVar152._24_4_ * 0.0 + auVar44._24_4_ * 0.0;
          local_780._28_4_ = fVar247 + auVar44._28_4_;
          fVar337 = auVar25._0_4_;
          fVar262 = auVar25._4_4_;
          auVar111._4_4_ = auVar32._4_4_ * fVar262;
          auVar111._0_4_ = auVar32._0_4_ * fVar337;
          fVar281 = auVar25._8_4_;
          auVar111._8_4_ = auVar32._8_4_ * fVar281;
          fVar301 = auVar25._12_4_;
          auVar111._12_4_ = auVar32._12_4_ * fVar301;
          fVar168 = auVar25._16_4_;
          auVar111._16_4_ = auVar32._16_4_ * fVar168;
          fVar278 = auVar25._20_4_;
          auVar111._20_4_ = auVar32._20_4_ * fVar278;
          fVar211 = auVar25._24_4_;
          auVar111._24_4_ = auVar32._24_4_ * fVar211;
          auVar111._28_4_ = fVar247;
          fVar247 = auVar181._0_4_;
          fVar263 = auVar181._4_4_;
          auVar112._4_4_ = auVar31._4_4_ * fVar263;
          auVar112._0_4_ = auVar31._0_4_ * fVar247;
          fVar284 = auVar181._8_4_;
          auVar112._8_4_ = auVar31._8_4_ * fVar284;
          fVar303 = auVar181._12_4_;
          auVar112._12_4_ = auVar31._12_4_ * fVar303;
          fVar169 = auVar181._16_4_;
          auVar112._16_4_ = auVar31._16_4_ * fVar169;
          fVar250 = auVar181._20_4_;
          auVar112._20_4_ = auVar31._20_4_ * fVar250;
          fVar213 = auVar181._24_4_;
          auVar112._24_4_ = auVar31._24_4_ * fVar213;
          auVar112._28_4_ = auVar179._28_4_;
          auVar25 = vsubps_avx(auVar112,auVar111);
          auVar152 = vsubps_avx(auVar26,auVar30);
          fVar248 = auVar152._0_4_;
          fVar264 = auVar152._4_4_;
          auVar113._4_4_ = auVar32._4_4_ * fVar264;
          auVar113._0_4_ = auVar32._0_4_ * fVar248;
          fVar286 = auVar152._8_4_;
          auVar113._8_4_ = auVar32._8_4_ * fVar286;
          fVar229 = auVar152._12_4_;
          auVar113._12_4_ = auVar32._12_4_ * fVar229;
          fVar170 = auVar152._16_4_;
          auVar113._16_4_ = auVar32._16_4_ * fVar170;
          fVar283 = auVar152._20_4_;
          auVar113._20_4_ = auVar32._20_4_ * fVar283;
          fVar226 = auVar152._24_4_;
          auVar113._24_4_ = auVar32._24_4_ * fVar226;
          auVar113._28_4_ = auVar32._28_4_;
          auVar114._4_4_ = fVar263 * auVar30._4_4_;
          auVar114._0_4_ = fVar247 * auVar30._0_4_;
          auVar114._8_4_ = fVar284 * auVar30._8_4_;
          auVar114._12_4_ = fVar303 * auVar30._12_4_;
          auVar114._16_4_ = fVar169 * auVar30._16_4_;
          auVar114._20_4_ = fVar250 * auVar30._20_4_;
          auVar114._24_4_ = fVar213 * auVar30._24_4_;
          auVar114._28_4_ = auVar44._28_4_;
          auVar32 = vsubps_avx(auVar113,auVar114);
          auVar115._4_4_ = auVar31._4_4_ * fVar264;
          auVar115._0_4_ = auVar31._0_4_ * fVar248;
          auVar115._8_4_ = auVar31._8_4_ * fVar286;
          auVar115._12_4_ = auVar31._12_4_ * fVar229;
          auVar115._16_4_ = auVar31._16_4_ * fVar170;
          auVar115._20_4_ = auVar31._20_4_ * fVar283;
          auVar115._24_4_ = auVar31._24_4_ * fVar226;
          auVar115._28_4_ = auVar31._28_4_;
          auVar116._4_4_ = fVar262 * auVar30._4_4_;
          auVar116._0_4_ = fVar337 * auVar30._0_4_;
          auVar116._8_4_ = fVar281 * auVar30._8_4_;
          auVar116._12_4_ = fVar301 * auVar30._12_4_;
          auVar116._16_4_ = fVar168 * auVar30._16_4_;
          auVar116._20_4_ = fVar278 * auVar30._20_4_;
          auVar116._24_4_ = fVar211 * auVar30._24_4_;
          auVar116._28_4_ = auVar30._28_4_;
          auVar30 = vsubps_avx(auVar116,auVar115);
          auVar160._0_4_ = auVar25._0_4_ * 0.0 + auVar30._0_4_ + auVar32._0_4_ * 0.0;
          auVar160._4_4_ = auVar25._4_4_ * 0.0 + auVar30._4_4_ + auVar32._4_4_ * 0.0;
          auVar160._8_4_ = auVar25._8_4_ * 0.0 + auVar30._8_4_ + auVar32._8_4_ * 0.0;
          auVar160._12_4_ = auVar25._12_4_ * 0.0 + auVar30._12_4_ + auVar32._12_4_ * 0.0;
          auVar160._16_4_ = auVar25._16_4_ * 0.0 + auVar30._16_4_ + auVar32._16_4_ * 0.0;
          auVar160._20_4_ = auVar25._20_4_ * 0.0 + auVar30._20_4_ + auVar32._20_4_ * 0.0;
          auVar160._24_4_ = auVar25._24_4_ * 0.0 + auVar30._24_4_ + auVar32._24_4_ * 0.0;
          auVar160._28_4_ = auVar32._28_4_ + auVar30._28_4_ + auVar32._28_4_;
          auVar161 = ZEXT3264(auVar160);
          auVar30 = vmaxps_avx(local_780,auVar160);
          auVar30 = vcmpps_avx(auVar30,ZEXT432(0) << 0x20,2);
          auVar31 = auVar153 & auVar30;
          if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar31 >> 0x7f,0) == '\0') &&
                (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar31 >> 0xbf,0) == '\0') &&
              (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar31[0x1f]) {
LAB_00b49cfe:
            auVar315 = auVar182._4_12_;
            auVar188 = ZEXT3264(CONCAT824(uStack_508,
                                          CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
          }
          else {
            auVar31 = vandps_avx(auVar30,auVar153);
            auVar117._4_4_ = fVar263 * fVar249;
            auVar117._0_4_ = fVar247 * fVar329;
            auVar117._8_4_ = fVar284 * fVar265;
            auVar117._12_4_ = fVar303 * fVar288;
            auVar117._16_4_ = fVar169 * fVar189;
            auVar117._20_4_ = fVar250 * fVar171;
            auVar117._24_4_ = fVar213 * fVar285;
            auVar117._28_4_ = auVar153._28_4_;
            auVar118._4_4_ = fVar262 * fVar244;
            auVar118._0_4_ = fVar337 * fVar242;
            auVar118._8_4_ = fVar281 * fVar246;
            auVar118._12_4_ = fVar301 * fVar299;
            auVar118._16_4_ = fVar168 * fVar306;
            auVar118._20_4_ = fVar278 * fVar314;
            auVar118._24_4_ = fVar211 * fVar316;
            auVar118._28_4_ = auVar30._28_4_;
            auVar30 = vsubps_avx(auVar118,auVar117);
            auVar119._4_4_ = fVar264 * fVar244;
            auVar119._0_4_ = fVar248 * fVar242;
            auVar119._8_4_ = fVar286 * fVar246;
            auVar119._12_4_ = fVar229 * fVar299;
            auVar119._16_4_ = fVar170 * fVar306;
            auVar119._20_4_ = fVar283 * fVar314;
            auVar119._24_4_ = fVar226 * fVar316;
            auVar119._28_4_ = auVar182._28_4_;
            auVar120._4_4_ = fVar263 * fVar261;
            auVar120._0_4_ = fVar247 * fVar245;
            auVar120._8_4_ = fVar284 * fVar279;
            auVar120._12_4_ = fVar303 * fVar302;
            auVar120._16_4_ = fVar169 * fVar166;
            auVar120._20_4_ = fVar250 * fVar269;
            auVar120._24_4_ = fVar213 * fVar209;
            auVar120._28_4_ = auVar181._28_4_;
            auVar182 = vsubps_avx(auVar120,auVar119);
            auVar315 = auVar182._4_12_;
            auVar121._4_4_ = fVar262 * fVar261;
            auVar121._0_4_ = fVar337 * fVar245;
            auVar121._8_4_ = fVar281 * fVar279;
            auVar121._12_4_ = fVar301 * fVar302;
            auVar121._16_4_ = fVar168 * fVar166;
            auVar121._20_4_ = fVar278 * fVar269;
            auVar121._24_4_ = fVar211 * fVar209;
            auVar121._28_4_ = auVar33._28_4_;
            auVar122._4_4_ = fVar264 * fVar249;
            auVar122._0_4_ = fVar248 * fVar329;
            auVar122._8_4_ = fVar286 * fVar265;
            auVar122._12_4_ = fVar229 * fVar288;
            auVar122._16_4_ = fVar170 * fVar189;
            auVar122._20_4_ = fVar283 * fVar171;
            auVar122._24_4_ = fVar226 * fVar285;
            auVar122._28_4_ = auVar180._28_4_;
            auVar32 = vsubps_avx(auVar122,auVar121);
            auVar187._0_4_ = auVar30._0_4_ * 0.0 + auVar32._0_4_ + auVar182._0_4_ * 0.0;
            auVar187._4_4_ = auVar30._4_4_ * 0.0 + auVar32._4_4_ + auVar182._4_4_ * 0.0;
            auVar187._8_4_ = auVar30._8_4_ * 0.0 + auVar32._8_4_ + auVar182._8_4_ * 0.0;
            auVar187._12_4_ = auVar30._12_4_ * 0.0 + auVar32._12_4_ + auVar182._12_4_ * 0.0;
            auVar187._16_4_ = auVar30._16_4_ * 0.0 + auVar32._16_4_ + auVar182._16_4_ * 0.0;
            auVar187._20_4_ = auVar30._20_4_ * 0.0 + auVar32._20_4_ + auVar182._20_4_ * 0.0;
            auVar187._24_4_ = auVar30._24_4_ * 0.0 + auVar32._24_4_ + auVar182._24_4_ * 0.0;
            auVar187._28_4_ = auVar180._28_4_ + auVar32._28_4_ + auVar33._28_4_;
            auVar153 = vrcpps_avx(auVar187);
            fVar329 = auVar153._0_4_;
            fVar245 = auVar153._4_4_;
            auVar123._4_4_ = auVar187._4_4_ * fVar245;
            auVar123._0_4_ = auVar187._0_4_ * fVar329;
            fVar337 = auVar153._8_4_;
            auVar123._8_4_ = auVar187._8_4_ * fVar337;
            fVar247 = auVar153._12_4_;
            auVar123._12_4_ = auVar187._12_4_ * fVar247;
            fVar248 = auVar153._16_4_;
            auVar123._16_4_ = auVar187._16_4_ * fVar248;
            fVar249 = auVar153._20_4_;
            auVar123._20_4_ = auVar187._20_4_ * fVar249;
            fVar261 = auVar153._24_4_;
            auVar123._24_4_ = auVar187._24_4_ * fVar261;
            auVar123._28_4_ = auVar181._28_4_;
            auVar346._8_4_ = 0x3f800000;
            auVar346._0_8_ = 0x3f8000003f800000;
            auVar346._12_4_ = 0x3f800000;
            auVar346._16_4_ = 0x3f800000;
            auVar346._20_4_ = 0x3f800000;
            auVar346._24_4_ = 0x3f800000;
            auVar346._28_4_ = 0x3f800000;
            auVar153 = vsubps_avx(auVar346,auVar123);
            fVar329 = auVar153._0_4_ * fVar329 + fVar329;
            fVar245 = auVar153._4_4_ * fVar245 + fVar245;
            fVar337 = auVar153._8_4_ * fVar337 + fVar337;
            fVar247 = auVar153._12_4_ * fVar247 + fVar247;
            fVar248 = auVar153._16_4_ * fVar248 + fVar248;
            fVar249 = auVar153._20_4_ * fVar249 + fVar249;
            fVar261 = auVar153._24_4_ * fVar261 + fVar261;
            auVar124._4_4_ =
                 (fVar260 * auVar30._4_4_ + auVar182._4_4_ * fVar251 + auVar32._4_4_ * fVar287) *
                 fVar245;
            auVar124._0_4_ =
                 (fVar336 * auVar30._0_4_ + auVar182._0_4_ * fVar243 + auVar32._0_4_ * fVar227) *
                 fVar329;
            auVar124._8_4_ =
                 (fVar276 * auVar30._8_4_ + auVar182._8_4_ * fVar267 + auVar32._8_4_ * fVar266) *
                 fVar337;
            auVar124._12_4_ =
                 (fVar228 * auVar30._12_4_ + auVar182._12_4_ * fVar300 + auVar32._12_4_ * fVar268) *
                 fVar247;
            auVar124._16_4_ =
                 (fVar164 * auVar30._16_4_ + auVar182._16_4_ * fVar304 + auVar32._16_4_ * fVar277) *
                 fVar248;
            auVar124._20_4_ =
                 (fVar190 * auVar30._20_4_ + auVar182._20_4_ * fVar172 + auVar32._20_4_ * fVar280) *
                 fVar249;
            auVar124._24_4_ =
                 (fVar207 * auVar30._24_4_ + auVar182._24_4_ * fVar305 + auVar32._24_4_ * fVar282) *
                 fVar261;
            auVar124._28_4_ = auVar26._28_4_ + auVar28._28_4_ + auVar29._28_4_;
            auVar225 = ZEXT3264(auVar124);
            uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar240._4_4_ = uVar146;
            auVar240._0_4_ = uVar146;
            auVar240._8_4_ = uVar146;
            auVar240._12_4_ = uVar146;
            auVar240._16_4_ = uVar146;
            auVar240._20_4_ = uVar146;
            auVar240._24_4_ = uVar146;
            auVar240._28_4_ = uVar146;
            auVar153 = vcmpps_avx(local_360,auVar124,2);
            auVar26 = vcmpps_avx(auVar124,auVar240,2);
            auVar153 = vandps_avx(auVar153,auVar26);
            auVar28 = auVar31 & auVar153;
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar28 >> 0x7f,0) == '\0') &&
                  (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar28 >> 0xbf,0) == '\0') &&
                (auVar28 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar28[0x1f]) goto LAB_00b49cfe;
            auVar153 = vandps_avx(auVar31,auVar153);
            auVar28 = vcmpps_avx(ZEXT432(0) << 0x20,auVar187,4);
            auVar29 = auVar153 & auVar28;
            auVar188 = ZEXT3264(CONCAT824(uStack_508,
                                          CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0x7f,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0xbf,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar29[0x1f] < '\0') {
              auVar153 = vandps_avx(auVar28,auVar153);
              auVar188 = ZEXT3264(auVar153);
              auVar125._4_4_ = fVar245 * local_780._4_4_;
              auVar125._0_4_ = fVar329 * (float)local_780._0_4_;
              auVar125._8_4_ = fVar337 * local_780._8_4_;
              auVar125._12_4_ = fVar247 * local_780._12_4_;
              auVar125._16_4_ = fVar248 * local_780._16_4_;
              auVar125._20_4_ = fVar249 * local_780._20_4_;
              auVar125._24_4_ = fVar261 * local_780._24_4_;
              auVar125._28_4_ = auVar26._28_4_;
              auVar126._4_4_ = auVar160._4_4_ * fVar245;
              auVar126._0_4_ = auVar160._0_4_ * fVar329;
              auVar126._8_4_ = auVar160._8_4_ * fVar337;
              auVar126._12_4_ = auVar160._12_4_ * fVar247;
              auVar126._16_4_ = auVar160._16_4_ * fVar248;
              auVar126._20_4_ = auVar160._20_4_ * fVar249;
              auVar126._24_4_ = auVar160._24_4_ * fVar261;
              auVar126._28_4_ = auVar160._28_4_;
              auVar275._8_4_ = 0x3f800000;
              auVar275._0_8_ = 0x3f8000003f800000;
              auVar275._12_4_ = 0x3f800000;
              auVar275._16_4_ = 0x3f800000;
              auVar275._20_4_ = 0x3f800000;
              auVar275._24_4_ = 0x3f800000;
              auVar275._28_4_ = 0x3f800000;
              auVar153 = vsubps_avx(auVar275,auVar125);
              local_1a0 = vblendvps_avx(auVar153,auVar125,auVar151);
              auVar153 = vsubps_avx(auVar275,auVar126);
              _local_3a0 = vblendvps_avx(auVar153,auVar126,auVar151);
              auVar161 = ZEXT3264(_local_3a0);
              local_1c0 = auVar124;
            }
          }
          auVar326 = ZEXT3264(_local_640);
          auVar153 = auVar188._0_32_;
          auVar347 = ZEXT3264(auVar204);
          if ((((((((auVar153 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar153 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar153 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar153 >> 0x7f,0) == '\0') &&
                (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar153 >> 0xbf,0) == '\0') &&
              (auVar188 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar188[0x1f]) {
            auVar259 = ZEXT3264(auVar205);
          }
          else {
            auVar26 = vsubps_avx(_local_5e0,_local_840);
            auVar225 = ZEXT3264(local_1a0);
            local_840._0_4_ = (float)local_840._0_4_ + auVar26._0_4_ * local_1a0._0_4_;
            local_840._4_4_ = (float)local_840._4_4_ + auVar26._4_4_ * local_1a0._4_4_;
            fStack_838 = fStack_838 + auVar26._8_4_ * local_1a0._8_4_;
            fStack_834 = fStack_834 + auVar26._12_4_ * local_1a0._12_4_;
            fStack_830 = fStack_830 + auVar26._16_4_ * local_1a0._16_4_;
            fStack_82c = fStack_82c + auVar26._20_4_ * local_1a0._20_4_;
            fStack_828 = fStack_828 + auVar26._24_4_ * local_1a0._24_4_;
            fStack_824 = fStack_824 + auVar26._28_4_;
            fVar329 = *(float *)((long)local_6d8->ray_space + k * 4 + -0x10);
            auVar127._4_4_ = ((float)local_840._4_4_ + (float)local_840._4_4_) * fVar329;
            auVar127._0_4_ = ((float)local_840._0_4_ + (float)local_840._0_4_) * fVar329;
            auVar127._8_4_ = (fStack_838 + fStack_838) * fVar329;
            auVar127._12_4_ = (fStack_834 + fStack_834) * fVar329;
            auVar127._16_4_ = (fStack_830 + fStack_830) * fVar329;
            auVar127._20_4_ = (fStack_82c + fStack_82c) * fVar329;
            auVar127._24_4_ = (fStack_828 + fStack_828) * fVar329;
            auVar127._28_4_ = fStack_824 + fStack_824;
            auVar26 = vcmpps_avx(local_1c0,auVar127,6);
            auVar161 = ZEXT3264(auVar26);
            auVar28 = auVar153 & auVar26;
            auVar259 = ZEXT3264(auVar205);
            if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar28 >> 0x7f,0) != '\0') ||
                  (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar28 >> 0xbf,0) != '\0') ||
                (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar28[0x1f] < '\0') {
              local_240 = vandps_avx(auVar26,auVar153);
              auVar161 = ZEXT3264(local_240);
              auVar176._0_8_ =
                   CONCAT44((float)local_3a0._4_4_ + (float)local_3a0._4_4_ + -1.0,
                            (float)local_3a0._0_4_ + (float)local_3a0._0_4_ + -1.0);
              auVar176._8_4_ = (float)uStack_398 + (float)uStack_398 + -1.0;
              auVar176._12_4_ = uStack_398._4_4_ + uStack_398._4_4_ + -1.0;
              auVar178._16_4_ = (float)uStack_390 + (float)uStack_390 + -1.0;
              auVar178._0_16_ = auVar176;
              auVar178._20_4_ = uStack_390._4_4_ + uStack_390._4_4_ + -1.0;
              fStack_2c8 = (float)uStack_388 + (float)uStack_388 + -1.0;
              _local_2e0 = auVar178;
              fStack_2c4 = uStack_388._4_4_ + uStack_388._4_4_ + -1.0;
              auVar188 = ZEXT3264(_local_2e0);
              local_300 = local_1a0;
              local_2c0 = local_1c0;
              local_290 = local_6f0;
              uStack_288 = uStack_6e8;
              local_280 = local_700;
              uStack_278 = uStack_6f8;
              local_270 = local_5f0;
              uStack_268 = uStack_5e8;
              local_260 = local_600;
              uStack_258 = uStack_5f8;
              pGVar145 = (context->scene->geometries).items[local_7a8].ptr;
              _local_3a0 = _local_2e0;
              if ((pGVar145->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                pRVar139 = (RTCIntersectArguments *)0x0;
              }
              else {
                pRVar139 = context->args;
                if ((pRVar139->filter != (RTCFilterFunctionN)0x0) ||
                   (pRVar139 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar139 >> 8),1),
                   pGVar145->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_7a0._4_28_ = auVar257._4_28_;
                  local_7a0._0_4_ = (int)uVar144;
                  auVar196._0_4_ = (float)(int)local_2a0;
                  auVar196._4_12_ = auVar315;
                  auVar197 = vshufps_avx(auVar196,auVar196,0);
                  local_220[0] = (auVar197._0_4_ + local_1a0._0_4_ + 0.0) * (float)local_140._0_4_;
                  local_220[1] = (auVar197._4_4_ + local_1a0._4_4_ + 1.0) * (float)local_140._4_4_;
                  local_220[2] = (auVar197._8_4_ + local_1a0._8_4_ + 2.0) * fStack_138;
                  local_220[3] = (auVar197._12_4_ + local_1a0._12_4_ + 3.0) * fStack_134;
                  fStack_210 = (auVar197._0_4_ + local_1a0._16_4_ + 4.0) * fStack_130;
                  fStack_20c = (auVar197._4_4_ + local_1a0._20_4_ + 5.0) * fStack_12c;
                  fStack_208 = (auVar197._8_4_ + local_1a0._24_4_ + 6.0) * fStack_128;
                  fStack_204 = auVar197._12_4_ + (float)local_1a0._28_4_ + 7.0;
                  uStack_398 = auVar176._8_8_;
                  uStack_390 = auVar178._16_8_;
                  uStack_388 = local_2e0._24_8_;
                  local_200 = auVar176._0_8_;
                  uStack_1f8 = uStack_398;
                  uStack_1f0 = uStack_390;
                  uStack_1e8 = uStack_388;
                  auVar188 = ZEXT3264(local_1c0);
                  local_1e0 = local_1c0;
                  uVar146 = vmovmskps_avx(local_240);
                  uVar144 = CONCAT44((int)((ulong)pRVar139 >> 0x20),uVar146);
                  uVar142 = 0;
                  if (uVar144 != 0) {
                    for (; (uVar144 >> uVar142 & 1) == 0; uVar142 = uVar142 + 1) {
                    }
                  }
                  local_680._0_8_ = pGVar145;
                  _local_660 = auVar27;
                  local_29c = uVar21;
                  while (uVar144 != 0) {
                    local_780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_400 = local_220[uVar142];
                    local_3f0 = *(undefined4 *)((long)&local_200 + uVar142 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar142 * 4);
                    fVar162 = 1.0 - local_400;
                    fVar230 = local_400 * 3.0;
                    auVar197 = ZEXT416((uint)((fVar162 * -2.0 * local_400 + local_400 * local_400) *
                                             0.5));
                    auVar197 = vshufps_avx(auVar197,auVar197,0);
                    auVar216 = ZEXT416((uint)(((fVar162 + fVar162) * (fVar230 + 2.0) +
                                              fVar162 * fVar162 * -3.0) * 0.5));
                    auVar216 = vshufps_avx(auVar216,auVar216,0);
                    auVar217 = ZEXT416((uint)(((local_400 + local_400) * (fVar230 + -5.0) +
                                              local_400 * fVar230) * 0.5));
                    auVar217 = vshufps_avx(auVar217,auVar217,0);
                    local_6d0.context = context->user;
                    auVar218 = ZEXT416((uint)((local_400 * (fVar162 + fVar162) - fVar162 * fVar162)
                                             * 0.5));
                    auVar218 = vshufps_avx(auVar218,auVar218,0);
                    auVar198._0_4_ =
                         auVar218._0_4_ * (float)local_6f0._0_4_ +
                         auVar217._0_4_ * (float)local_700._0_4_ +
                         auVar197._0_4_ * (float)local_600._0_4_ +
                         auVar216._0_4_ * (float)local_5f0._0_4_;
                    auVar198._4_4_ =
                         auVar218._4_4_ * (float)local_6f0._4_4_ +
                         auVar217._4_4_ * (float)local_700._4_4_ +
                         auVar197._4_4_ * (float)local_600._4_4_ +
                         auVar216._4_4_ * (float)local_5f0._4_4_;
                    auVar198._8_4_ =
                         auVar218._8_4_ * (float)uStack_6e8 +
                         auVar217._8_4_ * (float)uStack_6f8 +
                         auVar197._8_4_ * (float)uStack_5f8 + auVar216._8_4_ * (float)uStack_5e8;
                    auVar198._12_4_ =
                         auVar218._12_4_ * uStack_6e8._4_4_ +
                         auVar217._12_4_ * uStack_6f8._4_4_ +
                         auVar197._12_4_ * uStack_5f8._4_4_ + auVar216._12_4_ * uStack_5e8._4_4_;
                    local_430 = (RTCHitN  [16])vshufps_avx(auVar198,auVar198,0);
                    local_420 = vshufps_avx(auVar198,auVar198,0x55);
                    auVar225 = ZEXT1664(local_420);
                    local_410 = vshufps_avx(auVar198,auVar198,0xaa);
                    local_3e0 = local_310._0_8_;
                    uStack_3d8 = local_310._8_8_;
                    local_3d0 = local_610;
                    vcmpps_avx(ZEXT1632(local_610),ZEXT1632(local_610),0xf);
                    uStack_3bc = (local_6d0.context)->instID[0];
                    local_3c0 = uStack_3bc;
                    uStack_3b8 = uStack_3bc;
                    uStack_3b4 = uStack_3bc;
                    uStack_3b0 = (local_6d0.context)->instPrimID[0];
                    uStack_3ac = uStack_3b0;
                    uStack_3a8 = uStack_3b0;
                    uStack_3a4 = uStack_3b0;
                    local_7c0 = *local_6e0;
                    local_6d0.valid = (int *)local_7c0;
                    local_6d0.geometryUserPtr = pGVar145->userPtr;
                    local_6d0.hit = local_430;
                    local_6d0.N = 4;
                    local_6d0.ray = (RTCRayN *)ray;
                    fStack_3fc = local_400;
                    fStack_3f8 = local_400;
                    fStack_3f4 = local_400;
                    uStack_3ec = local_3f0;
                    uStack_3e8 = local_3f0;
                    uStack_3e4 = local_3f0;
                    if (pGVar145->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar225 = ZEXT1664(local_420);
                      (*pGVar145->occlusionFilterN)(&local_6d0);
                    }
                    if (local_7c0 == (undefined1  [16])0x0) {
                      auVar197 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar197 = auVar197 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var24 = context->args->filter;
                      if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)(local_680._0_8_ + 0x3e) & 0x40) != 0)))) {
                        auVar225 = ZEXT1664(auVar225._0_16_);
                        (*p_Var24)(&local_6d0);
                      }
                      auVar216 = vpcmpeqd_avx(local_7c0,_DAT_01f45a50);
                      auVar197 = auVar216 ^ _DAT_01f46b70;
                      auVar199._8_4_ = 0xff800000;
                      auVar199._0_8_ = 0xff800000ff800000;
                      auVar199._12_4_ = 0xff800000;
                      auVar216 = vblendvps_avx(auVar199,*(undefined1 (*) [16])(local_6d0.ray + 0x80)
                                               ,auVar216);
                      *(undefined1 (*) [16])(local_6d0.ray + 0x80) = auVar216;
                    }
                    auVar161 = ZEXT1664(auVar197);
                    auVar177._8_8_ = 0x100000001;
                    auVar177._0_8_ = 0x100000001;
                    auVar188 = ZEXT1664(auVar177);
                    if ((auVar177 & auVar197) != (undefined1  [16])0x0) {
                      pRVar139 = (RTCIntersectArguments *)0x1;
                      goto LAB_00b49d21;
                    }
                    auVar161 = ZEXT464((uint)local_780._0_4_);
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_780._0_4_;
                    uVar144 = uVar144 ^ 1L << (uVar142 & 0x3f);
                    uVar142 = 0;
                    pGVar145 = (Geometry *)local_680._0_8_;
                    if (uVar144 != 0) {
                      for (; (uVar144 >> uVar142 & 1) == 0; uVar142 = uVar142 + 1) {
                      }
                    }
                  }
                  pRVar139 = (RTCIntersectArguments *)0x0;
LAB_00b49d21:
                  auVar326 = ZEXT3264(_local_640);
                  uVar144 = (ulong)(uint)local_7a0._0_4_;
                  fVar148 = (float)local_720._0_4_;
                  fVar163 = (float)local_720._4_4_;
                  fVar165 = fStack_718;
                  fVar167 = fStack_714;
                  fVar230 = fStack_710;
                  fVar162 = fStack_70c;
                  fVar241 = fStack_708;
                }
              }
              auVar347 = ZEXT3264(auVar204);
              auVar259 = ZEXT3264(auVar205);
              uVar144 = CONCAT71((int7)(uVar144 >> 8),(byte)uVar144 | (byte)pRVar139);
            }
          }
        }
      }
    }
    if ((uVar144 & 1) != 0) break;
    uVar146 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar157._4_4_ = uVar146;
    auVar157._0_4_ = uVar146;
    auVar157._8_4_ = uVar146;
    auVar157._12_4_ = uVar146;
    auVar157._16_4_ = uVar146;
    auVar157._20_4_ = uVar146;
    auVar157._24_4_ = uVar146;
    auVar157._28_4_ = uVar146;
    auVar153 = vcmpps_avx(local_80,auVar157,2);
    uVar140 = vmovmskps_avx(auVar153);
  }
  return uVar138 != 0;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }